

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_compute_forward(ggml_compute_params *params,ggml_tensor *tensor)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  size_t sVar33;
  size_t sVar34;
  size_t sVar35;
  bool bVar36;
  bool bVar37;
  int i_2;
  uint uVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  int iVar42;
  uint uVar43;
  ggml_type gVar44;
  long lVar45;
  undefined4 *puVar46;
  ggml_compute_params *pgVar47;
  int i_8;
  int iVar48;
  uint uVar49;
  ulong uVar50;
  long lVar51;
  ulong uVar52;
  int j_1;
  int iVar53;
  int iVar54;
  int iVar55;
  uint uVar56;
  undefined2 *puVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  void *pvVar61;
  ulong uVar62;
  ulong uVar63;
  int iVar64;
  int iVar65;
  ggml_tensor *pgVar66;
  undefined4 *puVar67;
  double *pdVar68;
  int np_4;
  int iVar69;
  uint uVar70;
  int iVar71;
  undefined2 *puVar72;
  void *pvVar73;
  void *pvVar74;
  ggml_tensor *pgVar75;
  int i00_1;
  uint uVar76;
  ulong uVar77;
  ggml_tensor *pgVar78;
  undefined1 (*pauVar79) [32];
  int j_2;
  uint uVar80;
  long lVar81;
  ulong uVar82;
  int np;
  uint uVar83;
  int iVar84;
  ggml_tensor *pgVar85;
  float *pfVar86;
  void *pvVar87;
  ulong unaff_R13;
  long lVar88;
  uint *puVar89;
  float *pfVar90;
  undefined4 uVar91;
  long lVar92;
  long lVar93;
  float *pfVar94;
  long lVar95;
  int i00;
  int iVar96;
  long lVar97;
  ggml_tensor *pgVar98;
  ulong uVar99;
  void *pvVar100;
  float fVar101;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined8 in_XMM0_Qa;
  undefined1 auVar103 [16];
  undefined1 auVar113 [32];
  undefined1 auVar104 [16];
  undefined1 auVar114 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar115 [32];
  double dVar102;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar118 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar121 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar155 [16];
  undefined1 auVar144 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar141 [32];
  undefined1 auVar122 [16];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar145 [32];
  undefined1 auVar128 [16];
  undefined1 auVar154 [64];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar202 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar172 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 in_ZMM6 [64];
  double dVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar198 [16];
  undefined1 auVar197 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar201 [64];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar206 [12];
  undefined1 auVar205 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar213 [16];
  undefined1 auVar221 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar222 [64];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar223 [64];
  undefined8 uVar225;
  undefined1 in_ZMM12 [64];
  undefined1 auVar224 [64];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar234;
  float fVar235;
  undefined1 auVar228 [16];
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar229 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar240;
  int i1_2;
  int i1_1;
  int i2;
  int i1;
  int i2_1;
  int i3;
  int i2_2;
  int i3_1;
  ggml_tensor *local_3f0;
  ggml_tensor *local_3e8;
  ulong local_3e0;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  ulong local_3c0;
  ulong local_3b8;
  long local_3b0;
  ulong local_3a8;
  long local_398;
  ulong local_390;
  ulong local_388;
  long local_380;
  long local_378;
  ulong local_370;
  void *local_368;
  long local_360;
  ulong local_358;
  long local_350;
  ulong local_348;
  int local_340;
  ulong local_318;
  long local_310;
  ulong local_308;
  ulong local_300;
  long local_2f8;
  long local_2e0;
  undefined1 auStack_2d8 [24];
  int local_2b0;
  undefined1 local_2a0 [32];
  int local_280;
  double local_240;
  long local_238;
  double local_230;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  uint local_208;
  int local_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  long local_100;
  undefined1 (*local_f8) [32];
  ulong local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  ulong local_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  auVar206 = in_ZMM9._4_12_;
  auVar163 = in_ZMM4._0_32_;
  auVar135 = in_ZMM6._0_32_;
  auVar164 = in_ZMM7._0_32_;
  uVar225 = in_ZMM12._8_8_;
  if (params == (ggml_compute_params *)0x0) {
LAB_0012f1c3:
    ggml_compute_forward_cold_150();
    pgVar66 = (ggml_tensor *)params;
    goto LAB_0012f1c8;
  }
  pgVar66 = (ggml_tensor *)params;
  switch(tensor->op) {
  case GGML_OP_DUP:
  case GGML_OP_CPY:
    ggml_compute_forward_dup(params,tensor->src0,tensor);
    break;
  case GGML_OP_ADD:
    goto switchD_001271cd_caseD_2;
  case GGML_OP_SUB:
    goto switchD_001271cd_caseD_3;
  case GGML_OP_MUL:
    goto switchD_001271cd_caseD_4;
  case GGML_OP_DIV:
    pgVar66 = tensor->src0;
    gVar44 = pgVar66->type;
    if (gVar44 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar38 = pgVar66->ne[2] * pgVar66->ne[1] * pgVar66->ne[3];
      if ((int)uVar38 < 1) {
        return;
      }
      uVar40 = pgVar66->ne[0];
      sVar6 = tensor->nb[1];
      pvVar61 = tensor->data;
      pvVar74 = pgVar66->data;
      sVar4 = pgVar66->nb[1];
      sVar5 = tensor->src1->nb[1];
      pvVar73 = tensor->src1->data;
      uVar99 = 0;
      do {
        if (0 < (int)uVar40) {
          uVar63 = 0;
          do {
            *(float *)((long)pvVar61 + uVar63 * 4) =
                 *(float *)((long)pvVar74 + uVar63 * 4) / *(float *)((long)pvVar73 + uVar63 * 4);
            uVar63 = uVar63 + 1;
          } while (uVar40 != uVar63);
        }
        uVar99 = uVar99 + 1;
        pvVar61 = (void *)((long)pvVar61 + sVar6);
        pvVar73 = (void *)((long)pvVar73 + sVar5);
        pvVar74 = (void *)((long)pvVar74 + sVar4);
      } while (uVar99 != uVar38);
      return;
    }
    if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_143();
  case GGML_OP_ABS:
    pgVar66 = tensor->src0;
    gVar44 = pgVar66->type;
    if (gVar44 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar38 = pgVar66->ne[2] * pgVar66->ne[1] * pgVar66->ne[3];
      if ((int)uVar38 < 1) {
        return;
      }
      uVar40 = pgVar66->ne[0];
      sVar6 = tensor->nb[1];
      pvVar61 = tensor->data;
      pvVar74 = pgVar66->data;
      sVar4 = pgVar66->nb[1];
      uVar99 = 0;
      auVar106._8_4_ = 0x7fffffff;
      auVar106._0_8_ = 0x7fffffff7fffffff;
      auVar106._12_4_ = 0x7fffffff;
      do {
        if (0 < (int)uVar40) {
          uVar63 = 0;
          do {
            auVar107 = vpand_avx(ZEXT416(*(uint *)((long)pvVar74 + uVar63 * 4)),auVar106);
            *(int *)((long)pvVar61 + uVar63 * 4) = auVar107._0_4_;
            uVar63 = uVar63 + 1;
          } while (uVar40 != uVar63);
        }
        uVar99 = uVar99 + 1;
        pvVar61 = (void *)((long)pvVar61 + sVar6);
        pvVar74 = (void *)((long)pvVar74 + sVar4);
      } while (uVar99 != uVar38);
      return;
    }
    if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_137();
switchD_001271cd_caseD_1d:
    pgVar66 = tensor->src0;
    gVar44 = pgVar66->type;
    if (gVar44 != GGML_TYPE_F32) {
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_13();
switchD_001271cd_caseD_6:
      pgVar66 = tensor->src0;
      gVar44 = pgVar66->type;
      if (gVar44 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar38 = pgVar66->ne[2] * pgVar66->ne[1] * pgVar66->ne[3];
        if ((int)uVar38 < 1) {
          return;
        }
        uVar40 = pgVar66->ne[0];
        sVar6 = tensor->nb[1];
        pvVar61 = tensor->data;
        pvVar74 = pgVar66->data;
        sVar4 = pgVar66->nb[1];
        uVar99 = 0;
        do {
          if (0 < (int)uVar40) {
            uVar63 = 0;
            do {
              fVar101 = *(float *)((long)pvVar74 + uVar63 * 4);
              *(float *)((long)pvVar61 + uVar63 * 4) = fVar101 * fVar101;
              uVar63 = uVar63 + 1;
            } while (uVar40 != uVar63);
          }
          uVar99 = uVar99 + 1;
          pvVar61 = (void *)((long)pvVar61 + sVar6);
          pvVar74 = (void *)((long)pvVar74 + sVar4);
        } while (uVar99 != uVar38);
        return;
      }
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_142();
switchD_001271cd_caseD_7:
      pgVar66 = tensor->src0;
      gVar44 = pgVar66->type;
      if (gVar44 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar38 = pgVar66->ne[2] * pgVar66->ne[1] * pgVar66->ne[3];
        if ((int)uVar38 < 1) {
          return;
        }
        uVar40 = pgVar66->ne[0];
        uVar99 = 0;
        do {
          if (0 < (int)uVar40) {
            sVar6 = tensor->nb[1];
            pvVar61 = tensor->data;
            sVar4 = pgVar66->nb[1];
            pvVar74 = pgVar66->data;
            uVar63 = 0;
            do {
              fVar101 = *(float *)((long)pvVar74 + uVar63 * 4 + sVar4 * uVar99);
              if (fVar101 < 0.0) {
                fVar101 = sqrtf(fVar101);
              }
              else {
                auVar107 = vsqrtss_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101));
                fVar101 = auVar107._0_4_;
              }
              *(float *)((long)pvVar61 + uVar63 * 4 + sVar6 * uVar99) = fVar101;
              uVar63 = uVar63 + 1;
            } while (uVar40 != uVar63);
          }
          uVar99 = uVar99 + 1;
        } while (uVar99 != uVar38);
        return;
      }
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_141();
switchD_001271cd_caseD_e:
      pgVar66 = tensor->src0;
      gVar44 = pgVar66->type;
      if (gVar44 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar38 = pgVar66->ne[2] * pgVar66->ne[1] * pgVar66->ne[3];
        if ((int)uVar38 < 1) {
          return;
        }
        uVar40 = pgVar66->ne[0];
        sVar6 = tensor->nb[1];
        pvVar61 = tensor->data;
        pvVar74 = pgVar66->data;
        sVar4 = pgVar66->nb[1];
        uVar99 = 0;
        do {
          if (0 < (int)uVar40) {
            uVar63 = 0;
            do {
              auVar107 = vcmpss_avx(ZEXT816(0) << 0x40,
                                    ZEXT416(*(uint *)((long)pvVar74 + uVar63 * 4)),1);
              auVar107 = vandps_avx(auVar107,SUB6416(ZEXT464(0x3f800000),0));
              *(int *)((long)pvVar61 + uVar63 * 4) = auVar107._0_4_;
              uVar63 = uVar63 + 1;
            } while (uVar40 != uVar63);
          }
          uVar99 = uVar99 + 1;
          pvVar61 = (void *)((long)pvVar61 + sVar6);
          pvVar74 = (void *)((long)pvVar74 + sVar4);
        } while (uVar99 != uVar38);
        return;
      }
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_134();
switchD_001271cd_caseD_f:
      pgVar66 = tensor->src0;
      gVar44 = pgVar66->type;
      if (gVar44 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar38 = pgVar66->ne[2] * pgVar66->ne[1] * pgVar66->ne[3];
        if ((int)uVar38 < 1) {
          return;
        }
        uVar40 = pgVar66->ne[0];
        sVar6 = tensor->nb[1];
        pvVar61 = tensor->data;
        pvVar74 = pgVar66->data;
        sVar4 = pgVar66->nb[1];
        uVar99 = 0;
        do {
          if (0 < (int)uVar40) {
            uVar63 = 0;
            do {
              auVar107 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar74 + uVar63 * 4)),
                                    ZEXT816(0) << 0x40);
              *(int *)((long)pvVar61 + uVar63 * 4) = auVar107._0_4_;
              uVar63 = uVar63 + 1;
            } while (uVar40 != uVar63);
          }
          uVar99 = uVar99 + 1;
          pvVar61 = (void *)((long)pvVar61 + sVar6);
          pvVar74 = (void *)((long)pvVar74 + sVar4);
        } while (uVar99 != uVar38);
        return;
      }
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_133();
switchD_001271cd_caseD_3:
      pgVar66 = tensor->src0;
      gVar44 = pgVar66->type;
      if (gVar44 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar38 = pgVar66->ne[2] * pgVar66->ne[1] * pgVar66->ne[3];
        if ((int)uVar38 < 1) {
          return;
        }
        uVar40 = pgVar66->ne[0];
        sVar6 = tensor->nb[1];
        pvVar61 = tensor->data;
        pvVar74 = pgVar66->data;
        sVar4 = pgVar66->nb[1];
        sVar5 = tensor->src1->nb[1];
        pvVar73 = tensor->src1->data;
        uVar99 = 0;
        do {
          if (0 < (int)uVar40) {
            uVar63 = 0;
            do {
              *(float *)((long)pvVar61 + uVar63 * 4) =
                   *(float *)((long)pvVar74 + uVar63 * 4) - *(float *)((long)pvVar73 + uVar63 * 4);
              uVar63 = uVar63 + 1;
            } while (uVar40 != uVar63);
          }
          uVar99 = uVar99 + 1;
          pvVar61 = (void *)((long)pvVar61 + sVar6);
          pvVar73 = (void *)((long)pvVar73 + sVar5);
          pvVar74 = (void *)((long)pvVar74 + sVar4);
        } while (uVar99 != uVar38);
        return;
      }
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_145();
switchD_001271cd_caseD_4:
      pgVar66 = tensor->src0;
      gVar44 = pgVar66->type;
      if (gVar44 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        uVar38 = pgVar66->ne[2] * pgVar66->ne[1] * pgVar66->ne[3];
        if ((int)uVar38 < 1) {
          return;
        }
        uVar40 = pgVar66->ne[0];
        sVar6 = tensor->nb[1];
        pvVar61 = tensor->data;
        pvVar74 = pgVar66->data;
        sVar4 = pgVar66->nb[1];
        sVar5 = tensor->src1->nb[1];
        pvVar73 = tensor->src1->data;
        uVar99 = 0;
        do {
          if (0 < (int)uVar40) {
            uVar63 = 0;
            do {
              *(float *)((long)pvVar61 + uVar63 * 4) =
                   *(float *)((long)pvVar74 + uVar63 * 4) * *(float *)((long)pvVar73 + uVar63 * 4);
              uVar63 = uVar63 + 1;
            } while (uVar40 != uVar63);
          }
          uVar99 = uVar99 + 1;
          pvVar61 = (void *)((long)pvVar61 + sVar6);
          pvVar73 = (void *)((long)pvVar73 + sVar5);
          pvVar74 = (void *)((long)pvVar74 + sVar4);
        } while (uVar99 != uVar38);
        return;
      }
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_144();
switchD_001271cd_caseD_9:
      pgVar66 = tensor->src0;
      gVar44 = pgVar66->type;
      if (gVar44 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        iVar41 = pgVar66->ne[3];
        if ((long)iVar41 < 1) {
          return;
        }
        sVar6 = pgVar66->nb[1];
        sVar4 = pgVar66->nb[2];
        sVar5 = pgVar66->nb[3];
        sVar1 = tensor->nb[1];
        sVar2 = tensor->nb[2];
        sVar3 = tensor->nb[3];
        uVar38 = pgVar66->ne[0];
        uVar40 = pgVar66->ne[2];
        uVar70 = pgVar66->ne[1];
        local_3e8 = (ggml_tensor *)0x0;
        local_3d0 = 0;
        do {
          if (0 < (int)uVar40) {
            uVar99 = 0;
            pgVar98 = local_3e8;
            do {
              if (0 < (int)uVar70) {
                pvVar61 = tensor->data;
                lVar95 = (long)pgVar66->data + (long)pgVar98;
                uVar63 = 0;
                do {
                  if ((int)uVar38 < 1) {
                    fVar101 = 0.0;
                  }
                  else {
                    fVar101 = 0.0;
                    uVar52 = 0;
                    do {
                      fVar101 = fVar101 + *(float *)(lVar95 + uVar52 * 4);
                      uVar52 = uVar52 + 1;
                    } while (uVar38 != uVar52);
                  }
                  *(float *)((long)pvVar61 + uVar63 * sVar1 + local_3d0 * sVar3 + uVar99 * sVar2) =
                       fVar101 / (float)(int)uVar38;
                  uVar63 = uVar63 + 1;
                  lVar95 = lVar95 + sVar6;
                } while (uVar63 != uVar70);
              }
              uVar99 = uVar99 + 1;
              pgVar98 = (ggml_tensor *)((long)pgVar98 + sVar4);
            } while (uVar99 != uVar40);
          }
          local_3d0 = local_3d0 + 1;
          local_3e8 = (ggml_tensor *)((long)local_3e8 + sVar5);
        } while (local_3d0 != iVar41);
        return;
      }
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_139();
switchD_001271cd_caseD_8:
      pgVar66 = tensor->src0;
      gVar44 = pgVar66->type;
      if (gVar44 == GGML_TYPE_F32) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        iVar41 = pgVar66->ne[3];
        if ((long)iVar41 < 1) {
          return;
        }
        sVar6 = pgVar66->nb[1];
        sVar4 = pgVar66->nb[2];
        sVar5 = pgVar66->nb[3];
        uVar38 = pgVar66->ne[2];
        uVar40 = pgVar66->ne[0];
        uVar70 = pgVar66->ne[1];
        lVar81 = 0;
        lVar95 = 0;
        do {
          if (0 < (int)uVar38) {
            uVar99 = 0;
            lVar93 = lVar81;
            do {
              if (0 < (int)uVar70) {
                pfVar86 = (float *)tensor->data;
                lVar88 = (long)pgVar66->data + lVar93;
                uVar63 = 0;
                do {
                  if ((int)uVar40 < 1) {
                    fVar101 = 0.0;
                  }
                  else {
                    fVar101 = 0.0;
                    uVar52 = 0;
                    do {
                      fVar101 = fVar101 + *(float *)(lVar88 + uVar52 * 4);
                      uVar52 = uVar52 + 1;
                    } while (uVar40 != uVar52);
                  }
                  *pfVar86 = fVar101;
                  uVar63 = uVar63 + 1;
                  lVar88 = lVar88 + sVar6;
                } while (uVar63 != uVar70);
              }
              uVar99 = uVar99 + 1;
              lVar93 = lVar93 + sVar4;
            } while (uVar99 != uVar38);
          }
          lVar95 = lVar95 + 1;
          lVar81 = lVar81 + sVar5;
        } while (lVar95 != iVar41);
        return;
      }
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_140();
switchD_001271cd_caseD_11:
      pgVar66 = tensor->src0;
      gVar44 = pgVar66->type;
      if (gVar44 == GGML_TYPE_F32) {
        if (pgVar66->nb[0] != 4) goto LAB_0012f209;
        sVar6 = pgVar66->nb[1];
        uVar38 = pgVar66->ne[0];
        if (sVar6 != (long)(int)uVar38 * 4) goto LAB_0012f209;
        iVar41 = pgVar66->ne[1];
        if ((pgVar66->nb[2] != sVar6 * (long)iVar41) ||
           (iVar71 = pgVar66->ne[2], pgVar66->nb[3] != pgVar66->nb[2] * (long)iVar71))
        goto LAB_0012f209;
        if (tensor->nb[0] != GGML_TYPE_SIZE[tensor->type]) goto LAB_0012f20e;
        uVar99 = tensor->nb[1];
        if (uVar99 != (tensor->nb[0] * (long)tensor->ne[0]) /
                      (ulong)(long)GGML_BLCK_SIZE[tensor->type]) goto LAB_0012f20e;
        if ((tensor->nb[2] != uVar99 * (long)tensor->ne[1]) ||
           (tensor->nb[3] != tensor->nb[2] * (long)tensor->ne[2])) goto LAB_0012f20e;
        if ((uVar38 == tensor->ne[0]) &&
           (((iVar41 == tensor->ne[1] && (iVar71 == tensor->ne[2])) &&
            (pgVar66->ne[3] == tensor->ne[3])))) {
          if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
            return;
          }
          iVar71 = iVar71 * iVar41 * pgVar66->ne[3];
          iVar41 = (iVar71 + params->nth + -1) / params->nth;
          lVar95 = (long)params->ith * (long)iVar41;
          iVar41 = iVar41 + (int)lVar95;
          if (iVar71 <= iVar41) {
            iVar41 = iVar71;
          }
          if (iVar41 <= (int)lVar95) {
            return;
          }
          pvVar61 = (void *)(uVar99 * lVar95 + (long)tensor->data);
          pvVar74 = (void *)(sVar6 * lVar95 + (long)pgVar66->data);
          do {
            if (0 < (int)uVar38) {
              uVar63 = 0;
              do {
                auVar107 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar74 + uVar63 * 4)),0);
                uVar91 = vpextrw_avx(auVar107,0);
                tensor = (ggml_tensor *)
                         (ulong)table_silu_f16[CONCAT44((int)((ulong)tensor >> 0x20),uVar91)];
                *(float *)((long)pvVar61 + uVar63 * 4) = table_f32_f16[(long)tensor];
                uVar63 = uVar63 + 1;
              } while (uVar38 != uVar63);
            }
            lVar95 = lVar95 + 1;
            pvVar61 = (void *)((long)pvVar61 + uVar99);
            pvVar74 = (void *)((long)pvVar74 + sVar6);
          } while (lVar95 != iVar41);
          return;
        }
        goto LAB_0012f22c;
      }
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_125();
switchD_001271cd_caseD_10:
      pgVar66 = tensor->src0;
      gVar44 = pgVar66->type;
      if (gVar44 == GGML_TYPE_F32) {
        if (pgVar66->nb[0] != 4) goto LAB_0012f213;
        sVar6 = pgVar66->nb[1];
        uVar38 = pgVar66->ne[0];
        if (sVar6 != (long)(int)uVar38 * 4) goto LAB_0012f213;
        iVar41 = pgVar66->ne[1];
        if ((pgVar66->nb[2] != sVar6 * (long)iVar41) ||
           (iVar71 = pgVar66->ne[2], pgVar66->nb[3] != pgVar66->nb[2] * (long)iVar71))
        goto LAB_0012f213;
        if (tensor->nb[0] != GGML_TYPE_SIZE[tensor->type]) goto LAB_0012f218;
        uVar99 = tensor->nb[1];
        if (uVar99 != (tensor->nb[0] * (long)tensor->ne[0]) /
                      (ulong)(long)GGML_BLCK_SIZE[tensor->type]) goto LAB_0012f218;
        if ((tensor->nb[2] != uVar99 * (long)tensor->ne[1]) ||
           (tensor->nb[3] != tensor->nb[2] * (long)tensor->ne[2])) goto LAB_0012f218;
        if ((uVar38 == tensor->ne[0]) &&
           (((iVar41 == tensor->ne[1] && (iVar71 == tensor->ne[2])) &&
            (pgVar66->ne[3] == tensor->ne[3])))) {
          if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
            return;
          }
          iVar71 = iVar71 * iVar41 * pgVar66->ne[3];
          iVar41 = (iVar71 + params->nth + -1) / params->nth;
          lVar95 = (long)params->ith * (long)iVar41;
          iVar41 = iVar41 + (int)lVar95;
          if (iVar71 <= iVar41) {
            iVar41 = iVar71;
          }
          if (iVar41 <= (int)lVar95) {
            return;
          }
          pvVar61 = (void *)(uVar99 * lVar95 + (long)tensor->data);
          pvVar74 = (void *)(sVar6 * lVar95 + (long)pgVar66->data);
          do {
            if (0 < (int)uVar38) {
              uVar63 = 0;
              do {
                auVar107 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar74 + uVar63 * 4)),0);
                uVar91 = vpextrw_avx(auVar107,0);
                tensor = (ggml_tensor *)
                         (ulong)table_gelu_f16[CONCAT44((int)((ulong)tensor >> 0x20),uVar91)];
                *(float *)((long)pvVar61 + uVar63 * 4) = table_f32_f16[(long)tensor];
                uVar63 = uVar63 + 1;
              } while (uVar38 != uVar63);
            }
            lVar95 = lVar95 + 1;
            pvVar61 = (void *)((long)pvVar61 + uVar99);
            pvVar74 = (void *)((long)pvVar74 + sVar6);
          } while (lVar95 != iVar41);
          return;
        }
        goto LAB_0012f231;
      }
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_129();
switchD_001271cd_caseD_14:
      local_3e8 = tensor->src0;
      if (GGML_TYPE_COUNT < local_3e8->type) {
        return;
      }
      pgVar98 = tensor->src1;
      pgVar78 = pgVar98;
      local_3f0 = tensor;
      switch(local_3e8->type) {
      case GGML_TYPE_Q4_0:
        uVar38 = local_3e8->ne[2];
        if (uVar38 != pgVar98->ne[2]) goto LAB_0012f385;
        uVar40 = local_3e8->ne[3];
        if (uVar40 != pgVar98->ne[3]) goto LAB_0012f38a;
        if (tensor->ne[2] != uVar38) goto LAB_0012f38f;
        if (tensor->ne[3] != uVar40) goto LAB_0012f394;
        pgVar66 = (ggml_tensor *)local_3e8->nb[0];
        iVar41 = (int)local_3e8->nb[1];
        iVar71 = (int)pgVar66;
        if (iVar41 != 0x14 && iVar71 != 0x14) goto LAB_0012f399;
        if ((int)tensor->nb[0] != 4) goto LAB_0012f39e;
        iVar48 = (int)tensor->nb[1];
        if (iVar48 < 4) goto LAB_0012f3a3;
        iVar53 = (int)tensor->nb[2];
        if (iVar53 < iVar48) goto LAB_0012f3a8;
        iVar48 = (int)tensor->nb[3];
        if (iVar48 < iVar53) goto LAB_0012f3ad;
        uVar70 = local_3e8->ne[1];
        if (tensor->ne[0] != uVar70) goto LAB_0012f3b2;
        uVar83 = pgVar98->ne[1];
        uVar99 = (ulong)uVar83;
        if (tensor->ne[1] == uVar83) {
          iVar54 = tensor->ne[2] * tensor->ne[3] * tensor->ne[1] * tensor->ne[0];
          iVar39 = params->ith;
          uVar56 = params->nth;
          if (params->type == GGML_TASK_FINALIZE) {
            if (iVar71 <= iVar41) {
              return;
            }
            pvVar61 = params->wdata;
            iVar41 = (int)(uVar56 + iVar54 + -1) / (int)uVar56;
            iVar39 = iVar39 * iVar41;
            iVar41 = iVar41 + iVar39;
            if (iVar54 <= iVar41) {
              iVar41 = iVar54;
            }
            lVar95 = (long)iVar39 * 4;
            pvVar74 = tensor->data;
            uVar38 = iVar41 - iVar39;
            if (uVar38 != 0 && iVar39 <= iVar41) {
              uVar99 = 0;
              do {
                *(undefined4 *)((long)pvVar74 + uVar99 * 4 + lVar95) =
                     *(undefined4 *)((long)pvVar61 + uVar99 * 4 + (long)iVar39 * 4);
                uVar99 = uVar99 + 1;
              } while (uVar38 != uVar99);
            }
            if ((int)uVar56 < 2) {
              return;
            }
            lVar81 = (long)pvVar61 + lVar95 + (long)iVar54 * 4 + 0x40;
            uVar99 = 1;
            do {
              if (0 < (int)uVar38) {
                uVar63 = 0;
                do {
                  *(float *)((long)pvVar74 + uVar63 * 4 + lVar95) =
                       *(float *)(lVar81 + uVar63 * 4) +
                       *(float *)((long)pvVar74 + uVar63 * 4 + lVar95);
                  uVar63 = uVar63 + 1;
                } while (uVar38 != uVar63);
              }
              uVar99 = uVar99 + 1;
              lVar81 = lVar81 + (long)iVar54 * 4 + 0x40;
            } while (uVar99 != uVar56);
            return;
          }
          iVar55 = pgVar98->ne[0];
          local_2e0._0_4_ = (int)pgVar98->nb[1];
          local_318._0_4_ = (int)pgVar98->nb[2];
          local_300._0_4_ = (int)pgVar98->nb[3];
          if (params->type != GGML_TASK_INIT) {
            local_2a0._0_4_ = (undefined4)local_3e8->nb[2];
            local_358._0_4_ = (int)local_3e8->nb[3];
            if (iVar41 < iVar71) {
              if ((int)uVar40 < 1) {
                return;
              }
              sVar6 = pgVar98->nb[0];
              iVar41 = (int)(uVar56 + iVar55 + -1) / (int)uVar56;
              iVar48 = iVar41 * iVar39;
              iVar41 = iVar41 + iVar48;
              if (iVar55 <= iVar41) {
                iVar41 = iVar55;
              }
              pvVar61 = params->wdata;
              iVar53 = iVar48 * iVar71;
              auVar109[8] = 0xf;
              auVar109._0_8_ = 0xf0f0f0f0f0f0f0f;
              auVar109[9] = 0xf;
              auVar109[10] = 0xf;
              auVar109[0xb] = 0xf;
              auVar109[0xc] = 0xf;
              auVar109[0xd] = 0xf;
              auVar109[0xe] = 0xf;
              auVar109[0xf] = 0xf;
              iVar55 = 0;
              auVar138._8_4_ = 0xfffffff8;
              auVar138._0_8_ = 0xfffffff8fffffff8;
              auVar138._12_4_ = 0xfffffff8;
              auVar138._16_4_ = 0xfffffff8;
              auVar138._20_4_ = 0xfffffff8;
              auVar138._24_4_ = 0xfffffff8;
              auVar138._28_4_ = 0xfffffff8;
              local_368 = (void *)0x0;
              do {
                if (0 < (int)uVar38) {
                  iVar69 = 0;
                  local_370 = 0;
                  iVar65 = iVar53;
                  do {
                    if (0 < (int)uVar83) {
                      lVar95 = (long)pvVar61 +
                               (long)iVar69 * 4 +
                               (long)iVar55 * 4 + (long)((iVar54 + 0x10) * iVar39) * 4;
                      local_3d8._0_4_ =
                           (int)local_370 * local_2a0._0_4_ + (int)local_368 * (int)local_358;
                      local_3b8 = 0;
                      do {
                        if (iVar48 < iVar41) {
                          pvVar74 = local_3e8->data;
                          pvVar73 = pgVar98->data;
                          lVar81 = (long)iVar48;
                          iVar96 = iVar65;
                          do {
                            if (0x1f < (int)uVar70) {
                              lVar88 = (long)pvVar74 + (long)iVar96 + 4;
                              local_3b0._0_4_ = (int)sVar6;
                              uVar91 = *(undefined4 *)
                                        ((long)pvVar73 +
                                        (long)((int)lVar81 * (int)local_3b0 +
                                              (int)local_3b8 * (int)local_2e0 +
                                              (int)local_370 * (int)local_318 +
                                              (int)local_368 * (int)local_300));
                              auVar167._4_4_ = uVar91;
                              auVar167._0_4_ = uVar91;
                              auVar167._8_4_ = uVar91;
                              auVar167._12_4_ = uVar91;
                              auVar167._16_4_ = uVar91;
                              auVar167._20_4_ = uVar91;
                              auVar167._24_4_ = uVar91;
                              auVar167._28_4_ = uVar91;
                              uVar63 = 0;
                              lVar93 = lVar95;
                              do {
                                fVar101 = *(float *)((long)pvVar74 +
                                                    uVar63 * 0x14 +
                                                    (long)((int)lVar81 * iVar71 + (int)local_3d8));
                                lVar97 = 0;
                                do {
                                  auVar180._8_8_ = 0;
                                  auVar180._0_8_ = *(ulong *)(lVar88 + lVar97);
                                  auVar107 = vpand_avx(auVar180,auVar109);
                                  auVar202 = vpsrlw_avx(auVar180,4);
                                  auVar202 = vpand_avx(auVar202,auVar109);
                                  auVar163 = vpmovzxbd_avx2(auVar107);
                                  auVar163 = vpaddd_avx2(auVar163,auVar138);
                                  auVar163 = vcvtdq2ps_avx(auVar163);
                                  auVar11._4_4_ = fVar101 * auVar163._4_4_;
                                  auVar11._0_4_ = fVar101 * auVar163._0_4_;
                                  auVar11._8_4_ = fVar101 * auVar163._8_4_;
                                  auVar11._12_4_ = fVar101 * auVar163._12_4_;
                                  auVar11._16_4_ = fVar101 * auVar163._16_4_;
                                  auVar11._20_4_ = fVar101 * auVar163._20_4_;
                                  auVar11._24_4_ = fVar101 * auVar163._24_4_;
                                  auVar11._28_4_ = auVar163._28_4_;
                                  auVar163 = vpmovzxbd_avx2(auVar202);
                                  auVar163 = vpaddd_avx2(auVar163,auVar138);
                                  auVar163 = vcvtdq2ps_avx(auVar163);
                                  auVar12._4_4_ = fVar101 * auVar163._4_4_;
                                  auVar12._0_4_ = fVar101 * auVar163._0_4_;
                                  auVar12._8_4_ = fVar101 * auVar163._8_4_;
                                  auVar12._12_4_ = fVar101 * auVar163._12_4_;
                                  auVar12._16_4_ = fVar101 * auVar163._16_4_;
                                  auVar12._20_4_ = fVar101 * auVar163._20_4_;
                                  auVar12._24_4_ = fVar101 * auVar163._24_4_;
                                  auVar12._28_4_ = auVar163._28_4_;
                                  auVar163 = *(undefined1 (*) [32])(lVar93 + lVar97 * 8);
                                  auVar135 = *(undefined1 (*) [32])(lVar93 + lVar97 * 8 + 0x20);
                                  auVar164 = vshufps_avx(auVar163,auVar135,0x88);
                                  auVar164 = vpermpd_avx2(auVar164,0xd8);
                                  auVar163 = vshufps_avx(auVar163,auVar135,0xdd);
                                  auVar163 = vpermpd_avx2(auVar163,0xd8);
                                  auVar107 = vfmadd231ps_fma(auVar164,auVar167,auVar11);
                                  auVar202 = vfmadd231ps_fma(auVar163,auVar167,auVar12);
                                  auVar163 = vunpckhps_avx(ZEXT1632(auVar107),ZEXT1632(auVar202));
                                  auVar135 = vunpcklps_avx(ZEXT1632(auVar107),ZEXT1632(auVar202));
                                  auVar164 = vperm2f128_avx(auVar135,auVar163,0x31);
                                  auVar163 = vperm2f128_avx(auVar135,auVar163,0x20);
                                  *(undefined1 (*) [32])(lVar93 + lVar97 * 8) = auVar163;
                                  *(undefined1 (*) [32])(lVar93 + lVar97 * 8 + 0x20) = auVar164;
                                  lVar97 = lVar97 + 8;
                                } while (lVar97 != 0x10);
                                uVar63 = uVar63 + 1;
                                lVar88 = lVar88 + 0x14;
                                lVar93 = lVar93 + 0x80;
                              } while (uVar63 != uVar70 >> 5);
                            }
                            lVar81 = lVar81 + 1;
                            iVar96 = iVar96 + iVar71;
                          } while (lVar81 != iVar41);
                        }
                        local_3b8 = local_3b8 + 1;
                        lVar95 = lVar95 + (long)(int)uVar70 * 4;
                      } while (local_3b8 != uVar99);
                    }
                    local_370 = local_370 + 1;
                    iVar65 = iVar65 + local_2a0._0_4_;
                    iVar69 = iVar69 + uVar70 * uVar83;
                  } while (local_370 != uVar38);
                }
                local_368 = (void *)((long)local_368 + 1);
                iVar53 = iVar53 + (int)local_358;
                iVar55 = iVar55 + uVar70 * uVar83 * uVar38;
              } while (local_368 != (void *)(ulong)uVar40);
              return;
            }
            iVar54 = uVar70 * uVar38;
            iVar55 = uVar40 * iVar54;
            iVar71 = (int)(iVar55 + uVar56 + -1) / (int)uVar56;
            iVar39 = iVar39 * iVar71;
            iVar71 = iVar71 + iVar39;
            if (iVar55 <= iVar71) {
              iVar71 = iVar55;
            }
            if (iVar71 <= iVar39) {
              return;
            }
            uVar40 = local_3e8->ne[0];
            pvVar61 = params->wdata;
            pvVar74 = local_3e8->data;
            pvVar73 = tensor->data;
            auVar117._8_8_ = 0xf000f000f000f;
            auVar117._0_8_ = 0xf000f000f000f;
            auVar117._16_8_ = 0xf000f000f000f;
            auVar117._24_8_ = 0xf000f000f000f;
            auVar149._8_8_ = 0xf000f000f000f00;
            auVar149._0_8_ = 0xf000f000f000f00;
            auVar149._16_8_ = 0xf000f000f000f00;
            auVar149._24_8_ = 0xf000f000f000f00;
            auVar169[8] = 0xf8;
            auVar169._0_8_ = 0xf8f8f8f8f8f8f8f8;
            auVar169[9] = 0xf8;
            auVar169[10] = 0xf8;
            auVar169[0xb] = 0xf8;
            auVar169[0xc] = 0xf8;
            auVar169[0xd] = 0xf8;
            auVar169[0xe] = 0xf8;
            auVar169[0xf] = 0xf8;
            auVar169[0x10] = 0xf8;
            auVar169[0x11] = 0xf8;
            auVar169[0x12] = 0xf8;
            auVar169[0x13] = 0xf8;
            auVar169[0x14] = 0xf8;
            auVar169[0x15] = 0xf8;
            auVar169[0x16] = 0xf8;
            auVar169[0x17] = 0xf8;
            auVar169[0x18] = 0xf8;
            auVar169[0x19] = 0xf8;
            auVar169[0x1a] = 0xf8;
            auVar169[0x1b] = 0xf8;
            auVar169[0x1c] = 0xf8;
            auVar169[0x1d] = 0xf8;
            auVar169[0x1e] = 0xf8;
            auVar169[0x1f] = 0xf8;
            do {
              iVar55 = iVar39 / iVar54;
              uVar63 = (long)iVar39 % (long)iVar54;
              uVar56 = (int)uVar63 >> 0x1f;
              if (0 < (int)uVar83) {
                iVar69 = (int)((long)((ulong)uVar56 << 0x20 | uVar63 & 0xffffffff) %
                              (long)(int)uVar70);
                iVar65 = (int)((long)((ulong)uVar56 << 0x20 | uVar63 & 0xffffffff) /
                              (long)(int)uVar70);
                lVar95 = (long)(iVar55 * (int)local_358 + iVar69 * iVar41 + iVar65 * local_2a0._0_4_
                               );
                uVar63 = 0;
                uVar52 = 0;
                do {
                  auVar107 = ZEXT816(0) << 0x40;
                  if (0x1f < (int)uVar40) {
                    lVar81 = (uVar63 >> 5) +
                             ((ulong)((long)(int)((iVar55 * uVar38 + iVar65) * uVar40 * uVar83) *
                                     0x14) >> 5) + 4;
                    lVar93 = 0;
                    do {
                      fVar101 = *(float *)((long)pvVar74 + lVar93 + lVar95) *
                                *(float *)((long)pvVar61 + lVar93 + lVar81 + -4);
                      auVar183._4_4_ = fVar101;
                      auVar183._0_4_ = fVar101;
                      auVar183._8_4_ = fVar101;
                      auVar183._12_4_ = fVar101;
                      auVar183._16_4_ = fVar101;
                      auVar183._20_4_ = fVar101;
                      auVar183._24_4_ = fVar101;
                      auVar183._28_4_ = fVar101;
                      auVar135 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                                 ((long)pvVar74 + lVar93 + lVar95 + 4));
                      auVar163 = vpand_avx2(auVar135,auVar117);
                      auVar135 = vpsllw_avx2(auVar135,4);
                      auVar135 = vpand_avx2(auVar135,auVar149);
                      auVar164 = vpmovzxbw_avx2(*(undefined1 (*) [16])
                                                 ((long)pvVar61 + lVar93 + lVar81));
                      auVar165 = vpor_avx2(auVar135,auVar163);
                      auVar163 = vpand_avx2(auVar164,auVar117);
                      auVar135 = vpsllw_avx2(auVar164,4);
                      auVar135 = vpand_avx2(auVar135,auVar149);
                      auVar135 = vpor_avx2(auVar135,auVar163);
                      auVar163 = vpaddb_avx2(auVar165,auVar169);
                      auVar135 = vpaddb_avx2(auVar135,auVar169);
                      auVar164 = vpmovsxbw_avx2(auVar163._0_16_);
                      auVar165 = vpmovsxbw_avx2(auVar135._0_16_);
                      auVar164 = vpmaddwd_avx2(auVar165,auVar164);
                      auVar163 = vpmovsxbw_avx2(auVar163._16_16_);
                      auVar135 = vpmovsxbw_avx2(auVar135._16_16_);
                      auVar163 = vpmaddwd_avx2(auVar163,auVar135);
                      auVar163 = vpaddd_avx2(auVar163,auVar164);
                      auVar163 = vcvtdq2ps_avx(auVar163);
                      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar183,auVar163);
                      lVar93 = lVar93 + 0x14;
                    } while ((ulong)(uVar40 >> 3 & 0xfffffffc) * 5 != lVar93);
                  }
                  auVar173._0_4_ = auVar107._0_4_ + 0.0;
                  auVar173._4_4_ = auVar107._4_4_ + 0.0;
                  auVar173._8_4_ = auVar107._8_4_ + 0.0;
                  auVar173._12_4_ = auVar107._12_4_ + 0.0;
                  auVar107 = vshufpd_avx(auVar173,auVar173,1);
                  auVar174._0_4_ = auVar173._0_4_ + auVar107._0_4_;
                  auVar174._4_4_ = auVar173._4_4_ + auVar107._4_4_;
                  auVar174._8_4_ = auVar173._8_4_ + auVar107._8_4_;
                  auVar174._12_4_ = auVar173._12_4_ + auVar107._12_4_;
                  auVar107 = vhaddps_avx(auVar174,auVar174);
                  *(int *)((long)pvVar73 +
                          uVar52 * (long)(int)uVar70 * 4 +
                          (long)(iVar55 * iVar48 + iVar69 * 4 + iVar65 * iVar53)) = auVar107._0_4_;
                  uVar52 = uVar52 + 1;
                  uVar63 = uVar63 + (long)(int)uVar40 * 0x14;
                } while (uVar52 != uVar99);
              }
              iVar39 = iVar39 + 1;
            } while (iVar39 != iVar71);
            return;
          }
          if (iVar71 <= iVar41) {
            if ((int)uVar40 < 1) {
              return;
            }
            pvVar61 = params->wdata;
            local_3c0 = 0;
            local_3a8 = 0;
            do {
              if (0 < (int)uVar38) {
                uVar52 = 0;
                uVar63 = local_3c0;
                do {
                  lVar95 = uVar63;
                  uVar50 = uVar99;
                  if (0 < (int)uVar83) {
                    do {
                      quantize_row_q4_0((float *)((long)pgVar98->data + lVar95),pvVar61,iVar55);
                      pvVar61 = (void *)((long)pvVar61 + ((ulong)((long)iVar55 * 0x14) >> 5));
                      lVar95 = lVar95 + (int)local_2e0;
                      uVar50 = uVar50 - 1;
                    } while (uVar50 != 0);
                  }
                  uVar52 = uVar52 + 1;
                  uVar63 = uVar63 + (long)(int)local_318;
                } while (uVar52 != uVar38);
              }
              local_3a8 = local_3a8 + 1;
              local_3c0 = local_3c0 + (long)(int)local_300;
            } while (local_3a8 != uVar40);
            return;
          }
          goto LAB_0012b283;
        }
        goto LAB_0012f3b7;
      case GGML_TYPE_Q4_1:
        goto switchD_00128152_caseD_1;
      default:
        goto switchD_00128152_caseD_2;
      case GGML_TYPE_F16:
        uVar38 = local_3e8->ne[2];
        if (uVar38 != pgVar98->ne[2]) goto LAB_0012f3bc;
        uVar40 = local_3e8->ne[3];
        if (uVar40 != pgVar98->ne[3]) goto LAB_0012f3c1;
        uVar70 = tensor->ne[2];
        pgVar66 = (ggml_tensor *)(ulong)uVar70;
        if (uVar70 != uVar38) goto LAB_0012f3c6;
        if (tensor->ne[3] != uVar40) goto LAB_0012f3cb;
        iVar41 = (int)local_3e8->nb[0];
        iVar71 = (int)local_3e8->nb[1];
        if ((local_3e8->nb[1] & 0xffffffff) != 2 && iVar41 != 2) goto LAB_0012f3d0;
        if ((int)tensor->nb[0] != 4) goto LAB_0012f3d5;
        iVar48 = (int)tensor->nb[1];
        if (iVar48 < 4) goto LAB_0012f3da;
        iVar53 = (int)tensor->nb[2];
        if (iVar53 < iVar48) goto LAB_0012f3df;
        iVar48 = (int)tensor->nb[3];
        if (iVar48 < iVar53) goto LAB_0012f3e4;
        uVar83 = local_3e8->ne[1];
        if (tensor->ne[0] != uVar83) goto LAB_0012f3e9;
        uVar56 = pgVar98->ne[1];
        pgVar75 = (ggml_tensor *)(ulong)uVar56;
        if (tensor->ne[1] == uVar56) {
          iVar39 = uVar70 * tensor->ne[3] * tensor->ne[1] * tensor->ne[0];
          uVar70 = params->ith;
          uVar43 = params->nth;
          if (params->type == GGML_TASK_FINALIZE) {
            if (iVar41 <= iVar71) {
              return;
            }
            pvVar61 = params->wdata;
            iVar41 = (int)(uVar43 + iVar39 + -1) / (int)uVar43;
            iVar71 = uVar70 * iVar41;
            iVar41 = iVar41 + iVar71;
            if (iVar39 <= iVar41) {
              iVar41 = iVar39;
            }
            if (iVar71 < iVar41) {
              pvVar74 = tensor->data;
              lVar95 = (long)iVar71;
              do {
                *(float *)((long)pvVar74 + lVar95 * 4) =
                     table_f32_f16[*(ushort *)((long)pvVar61 + lVar95 * 2)];
                lVar95 = lVar95 + 1;
              } while (iVar41 != lVar95);
            }
            if ((int)uVar43 < 2) {
              return;
            }
            lVar95 = (long)pvVar61 + (long)iVar39 * 2 + 0x20;
            uVar99 = 1;
            do {
              if (iVar71 < iVar41) {
                pvVar61 = tensor->data;
                lVar81 = (long)iVar71;
                do {
                  *(float *)((long)pvVar61 + lVar81 * 4) =
                       table_f32_f16[*(ushort *)(lVar95 + lVar81 * 2)] +
                       *(float *)((long)pvVar61 + lVar81 * 4);
                  lVar81 = lVar81 + 1;
                } while (iVar41 != lVar81);
              }
              uVar99 = uVar99 + 1;
              lVar95 = lVar95 + (long)iVar39 * 2 + 0x20;
            } while (uVar99 != uVar43);
            return;
          }
          uVar76 = pgVar98->ne[0];
          iVar54 = (int)pgVar98->nb[0];
          local_3c0._0_4_ = (int)pgVar98->nb[1];
          local_388._0_4_ = (int)pgVar98->nb[2];
          local_360._0_4_ = (int)pgVar98->nb[3];
          if (params->type != GGML_TASK_INIT) {
            local_350._0_4_ = (int)local_3e8->nb[3];
            local_2e0._0_4_ = (int)local_3e8->nb[2];
            if (iVar41 <= iVar71) {
              iVar54 = uVar83 * uVar38;
              iVar55 = uVar40 * iVar54;
              iVar39 = (int)(iVar55 + uVar43 + -1) / (int)uVar43;
              iVar41 = uVar70 * iVar39;
              iVar39 = iVar39 + iVar41;
              if (iVar55 <= iVar39) {
                iVar39 = iVar55;
              }
              if (iVar39 <= iVar41) {
                return;
              }
              uVar40 = local_3e8->ne[0];
              pvVar61 = params->wdata;
              pvVar74 = local_3e8->data;
              pvVar73 = tensor->data;
              uVar70 = uVar40 & 0xffffffe0;
              auVar107 = ZEXT816(0) << 0x40;
              do {
                iVar55 = iVar41 / iVar54;
                uVar99 = (ulong)(uint)((int)((long)iVar41 % (long)iVar54) >> 0x1f) << 0x20 |
                         (long)iVar41 % (long)iVar54 & 0xffffffffU;
                if (0 < (int)uVar56) {
                  iVar65 = (int)((long)uVar99 % (long)(int)uVar83);
                  iVar69 = (int)((long)uVar99 / (long)(int)uVar83);
                  lVar95 = (long)(iVar55 * (int)local_350 + iVar65 * iVar71 +
                                 iVar69 * (int)local_2e0) + (long)pvVar74;
                  pvVar87 = (void *)((long)pvVar61 +
                                    (long)(int)((iVar55 * uVar38 + iVar69) * uVar56 * uVar40) * 2);
                  pgVar66 = (ggml_tensor *)0x0;
                  do {
                    _local_1a0 = ZEXT1632(auVar107);
                    _local_1c0 = ZEXT1632(auVar107);
                    _local_1e0 = ZEXT1632(auVar107);
                    _local_200 = ZEXT1632(auVar107);
                    if ((int)uVar70 < 1) {
                      auVar148 = ZEXT1632(ZEXT816(0) << 0x40);
                    }
                    else {
                      uVar99 = 0;
                      lVar81 = lVar95;
                      pvVar100 = pvVar87;
                      do {
                        lVar93 = 0;
                        do {
                          auVar163 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar81 + lVar93));
                          auVar135 = vcvtph2ps_f16c(*(undefined1 (*) [16])((long)pvVar100 + lVar93))
                          ;
                          auVar202 = vfmadd213ps_fma(auVar135,auVar163,
                                                     *(undefined1 (*) [32])(local_200 + lVar93 * 2))
                          ;
                          *(undefined1 (*) [32])(local_200 + lVar93 * 2) = ZEXT1632(auVar202);
                          lVar93 = lVar93 + 0x10;
                        } while (lVar93 != 0x40);
                        uVar99 = uVar99 + 0x20;
                        pvVar100 = (void *)((long)pvVar100 + 0x40);
                        lVar81 = lVar81 + 0x40;
                      } while (uVar99 < uVar70);
                      auVar148._0_4_ =
                           (float)local_200._0_4_ + (float)local_1e0._0_4_ +
                           (float)local_1c0._0_4_ + (float)local_1a0._0_4_;
                      auVar148._4_4_ =
                           (float)local_200._4_4_ + (float)local_1e0._4_4_ +
                           (float)local_1c0._4_4_ + (float)local_1a0._4_4_;
                      auVar148._8_4_ = fStack_1f8 + fStack_1d8 + fStack_1b8 + fStack_198;
                      auVar148._12_4_ = fStack_1f4 + fStack_1d4 + fStack_1b4 + fStack_194;
                      auVar148._16_4_ = fStack_1f0 + fStack_1d0 + fStack_1b0 + fStack_190;
                      auVar148._20_4_ = fStack_1ec + fStack_1cc + fStack_1ac + fStack_18c;
                      auVar148._24_4_ = fStack_1e8 + fStack_1c8 + fStack_1a8 + fStack_188;
                      auVar148._28_4_ = fStack_1e4 + fStack_1c4 + fStack_1a4 + fStack_184;
                    }
                    auVar131._0_4_ = auVar148._0_4_ + auVar148._16_4_;
                    auVar131._4_4_ = auVar148._4_4_ + auVar148._20_4_;
                    auVar131._8_4_ = auVar148._8_4_ + auVar148._24_4_;
                    auVar131._12_4_ = auVar148._12_4_ + auVar148._28_4_;
                    auVar202 = vhaddps_avx(auVar131,auVar131);
                    auVar202 = vhaddps_avx(auVar202,auVar202);
                    fVar101 = auVar202._0_4_;
                    lVar81 = (long)(int)uVar70;
                    if (uVar70 != uVar40) {
                      do {
                        fVar101 = fVar101 + table_f32_f16[*(ushort *)(lVar95 + lVar81 * 2)] *
                                            table_f32_f16[*(ushort *)((long)pvVar87 + lVar81 * 2)];
                        lVar81 = lVar81 + 1;
                      } while (lVar81 < (int)uVar40);
                    }
                    *(float *)((long)pvVar73 +
                              (long)pgVar66 * (long)(int)uVar83 * 4 +
                              (long)(iVar55 * iVar48 + iVar65 * 4 + iVar69 * iVar53)) = fVar101;
                    pgVar66 = (ggml_tensor *)((long)&pgVar66->type + 1);
                    pvVar87 = (void *)((long)pvVar87 + (long)(int)uVar40 * 2);
                  } while (pgVar66 != pgVar75);
                }
                iVar41 = iVar41 + 1;
              } while (iVar41 != iVar39);
              return;
            }
            if ((int)uVar40 < 1) {
              return;
            }
            iVar71 = (int)(uVar43 + uVar76 + -1) / (int)uVar43;
            iVar48 = iVar71 * uVar70;
            uVar43 = iVar71 + iVar48;
            if ((int)uVar76 <= (int)uVar43) {
              uVar43 = uVar76;
            }
            uVar76 = uVar83 & 0xffffffe0;
            pvVar61 = params->wdata;
            local_340 = iVar48 * iVar41;
            iVar71 = 0;
            local_348 = 0;
            do {
              if (0 < (int)uVar38) {
                iVar55 = 0;
                local_390 = 0;
                iVar53 = local_340;
                do {
                  if (0 < (int)uVar56) {
                    lVar95 = (long)pvVar61 +
                             (long)iVar55 * 2 +
                             (long)iVar71 * 2 + (long)(int)((iVar39 + 0x10) * uVar70) * 2;
                    params = (ggml_compute_params *)0x0;
                    do {
                      if (iVar48 < (int)uVar43) {
                        lVar81 = (long)iVar48;
                        iVar69 = iVar53;
                        do {
                          if (0 < (int)uVar76) {
                            uVar91 = *(undefined4 *)
                                      ((long)pgVar98->data +
                                      (long)((int)lVar81 * iVar54 +
                                            (int)params * (int)local_3c0 +
                                            (int)local_390 * (int)local_388 +
                                            (int)local_348 * (int)local_360));
                            auVar116._4_4_ = uVar91;
                            auVar116._0_4_ = uVar91;
                            auVar116._8_4_ = uVar91;
                            auVar116._12_4_ = uVar91;
                            auVar116._16_4_ = uVar91;
                            auVar116._20_4_ = uVar91;
                            auVar116._24_4_ = uVar91;
                            auVar116._28_4_ = uVar91;
                            lVar88 = (long)iVar69 + (long)local_3e8->data;
                            uVar99 = 0;
                            lVar93 = lVar95;
                            do {
                              lVar97 = 0;
                              do {
                                auVar163 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar88 + lVar97));
                                auVar135 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar93 + lVar97));
                                auVar107 = vfmadd231ps_fma(auVar135,auVar116,auVar163);
                                auVar107 = vcvtps2ph_f16c(ZEXT1632(auVar107),0);
                                *(undefined1 (*) [16])(lVar93 + lVar97) = auVar107;
                                lVar97 = lVar97 + 0x10;
                              } while (lVar97 != 0x40);
                              uVar99 = uVar99 + 0x20;
                              lVar93 = lVar93 + 0x40;
                              lVar88 = lVar88 + 0x40;
                            } while (uVar99 < uVar76);
                          }
                          if (uVar76 != uVar83) {
                            ggml_compute_forward_cold_93();
                            goto LAB_0012f1c3;
                          }
                          lVar81 = lVar81 + 1;
                          iVar69 = iVar69 + iVar41;
                        } while (lVar81 != (int)uVar43);
                      }
                      params = (ggml_compute_params *)((long)&((ggml_tensor *)params)->type + 1);
                      lVar95 = lVar95 + (long)(int)uVar83 * 2;
                    } while ((ggml_tensor *)params != pgVar75);
                  }
                  local_390 = local_390 + 1;
                  iVar55 = iVar55 + uVar83 * uVar56;
                  iVar53 = iVar53 + (int)local_2e0;
                } while (local_390 != uVar38);
              }
              local_348 = local_348 + 1;
              iVar71 = iVar71 + uVar83 * uVar56 * uVar38;
              local_340 = local_340 + (int)local_350;
              if (local_348 == uVar40) {
                return;
              }
            } while( true );
          }
          pvVar61 = params->wdata;
          if (iVar71 < iVar41) goto LAB_0012b28f;
          if ((int)uVar40 < 1) {
            return;
          }
          local_3f0 = (ggml_tensor *)(long)(int)local_360;
          uVar99 = 0;
          iVar41 = 0;
          tensor = (ggml_tensor *)(ulong)uVar70;
          pgVar66 = (ggml_tensor *)0x0;
          do {
            local_3e8 = pgVar66;
            if (0 < (int)uVar38) {
              uVar63 = 0;
              pgVar66 = local_3e8;
              do {
                if (0 < (int)uVar56) {
                  pgVar85 = (ggml_tensor *)0x0;
                  pgVar78 = pgVar66;
                  do {
                    if (0 < (int)uVar76) {
                      puVar89 = (uint *)((long)pgVar98->data + (long)pgVar78);
                      tensor = (ggml_tensor *)((long)pvVar61 + (long)iVar41 * 2);
                      uVar52 = 0;
                      do {
                        auVar107 = vcvtps2ph_f16c(ZEXT416(*puVar89),0);
                        vpextrw_avx(auVar107,0);
                        uVar52 = uVar52 + 1;
                        puVar89 = (uint *)((long)puVar89 + (long)iVar54);
                      } while (uVar76 != uVar52);
                      iVar41 = iVar41 + (int)uVar52;
                    }
                    pgVar85 = (ggml_tensor *)((long)&pgVar85->type + 1);
                    pgVar78 = (ggml_tensor *)((long)pgVar78->ne + (long)(int)local_3c0 + -8);
                  } while (pgVar85 != pgVar75);
                }
                uVar63 = uVar63 + 1;
                pgVar66 = (ggml_tensor *)((long)pgVar66->ne + (long)(int)local_388 + -8);
              } while (uVar63 != uVar38);
            }
            uVar99 = uVar99 + 1;
            pgVar66 = (ggml_tensor *)((long)local_3f0->ne + (long)(local_3e8->ne + -4));
          } while (uVar99 != uVar40);
          if ((ulong)((long)iVar41 * 2) <= params->wsize) {
            return;
          }
          ggml_compute_forward_cold_92();
          goto switchD_00128152_caseD_6;
        }
        goto LAB_0012f3ee;
      case GGML_TYPE_F32:
switchD_00128152_caseD_6:
        iVar41 = tensor->ne[0];
        iVar71 = tensor->ne[1];
        iVar48 = tensor->ne[2];
        iVar55 = iVar71 * iVar41;
        iVar69 = iVar55 * iVar48 * tensor->ne[3];
        iVar53 = (int)local_3e8->nb[0];
        iVar39 = (int)local_3e8->nb[1];
        iVar54 = params->ith;
        uVar38 = params->nth;
        if (params->type == GGML_TASK_FINALIZE) {
          if (iVar53 <= iVar39) {
            return;
          }
          pvVar61 = params->wdata;
          iVar41 = (int)(uVar38 + iVar69 + -1) / (int)uVar38;
          iVar54 = iVar54 * iVar41;
          iVar41 = iVar41 + iVar54;
          if (iVar69 <= iVar41) {
            iVar41 = iVar69;
          }
          lVar95 = (long)iVar54 * 4;
          pvVar74 = local_3f0->data;
          uVar40 = iVar41 - iVar54;
          if (uVar40 != 0 && iVar54 <= iVar41) {
            uVar99 = 0;
            do {
              *(undefined4 *)((long)pvVar74 + uVar99 * 4 + lVar95) =
                   *(undefined4 *)((long)pvVar61 + uVar99 * 4 + (long)iVar54 * 4);
              uVar99 = uVar99 + 1;
            } while (uVar40 != uVar99);
          }
          if ((int)uVar38 < 2) {
            return;
          }
          lVar81 = (long)pvVar61 + lVar95 + (long)iVar69 * 4 + 0x40;
          uVar99 = 1;
          do {
            if (0 < (int)uVar40) {
              uVar63 = 0;
              do {
                *(float *)((long)pvVar74 + uVar63 * 4 + lVar95) =
                     *(float *)(lVar81 + uVar63 * 4) +
                     *(float *)((long)pvVar74 + uVar63 * 4 + lVar95);
                uVar63 = uVar63 + 1;
              } while (uVar40 != uVar63);
            }
            uVar99 = uVar99 + 1;
            lVar81 = lVar81 + (long)iVar69 * 4 + 0x40;
          } while (uVar99 != uVar38);
          return;
        }
        if (params->type != GGML_TASK_INIT) {
          uVar40 = local_3e8->ne[1];
          uVar70 = pgVar78->ne[1];
          local_368._0_4_ = (int)local_3e8->nb[3];
          iVar65 = (int)pgVar78->nb[1];
          local_2a0._0_4_ = (undefined4)local_3e8->nb[2];
          local_318._0_4_ = (int)pgVar78->nb[2];
          local_358._0_4_ = (int)pgVar78->nb[3];
          if (iVar39 < iVar53) {
            uVar83 = pgVar78->ne[3];
            if ((int)uVar83 < 1) {
              return;
            }
            iVar39 = pgVar98->ne[0];
            uVar56 = pgVar98->ne[2];
            sVar6 = pgVar98->nb[0];
            iVar96 = (int)(uVar38 + iVar39 + -1) / (int)uVar38;
            iVar64 = iVar96 * iVar54;
            iVar96 = iVar96 + iVar64;
            if (iVar39 <= iVar96) {
              iVar96 = iVar39;
            }
            pvVar61 = params->wdata;
            lVar81 = (long)((iVar69 + 0x10) * iVar54);
            uVar38 = uVar40 & 0xffffffe0;
            lVar93 = (long)(int)uVar38;
            lVar95 = (long)(int)uVar40;
            if ((long)(int)uVar40 < lVar93 + 1) {
              lVar95 = lVar93 + 1;
            }
            lVar88 = (lVar95 - lVar93) + -1;
            auVar175._8_8_ = lVar88;
            auVar175._0_8_ = lVar88;
            auVar175._16_8_ = lVar88;
            auVar175._24_8_ = lVar88;
            iVar39 = iVar64 * iVar53;
            iVar54 = 0;
            auVar135 = vpmovsxbq_avx2(ZEXT416(0x3020100));
            auVar164 = vpmovsxbq_avx2(ZEXT416(0x7060504));
            auVar166._8_8_ = 0x8000000000000000;
            auVar166._0_8_ = 0x8000000000000000;
            auVar166._16_8_ = 0x8000000000000000;
            auVar166._24_8_ = 0x8000000000000000;
            auVar163 = vpcmpeqd_avx2(auVar163,auVar163);
            local_308 = 0;
            do {
              if (0 < (int)uVar56) {
                iVar69 = 0;
                local_370 = 0;
                iVar42 = iVar39;
                do {
                  if (0 < (int)uVar70) {
                    lVar88 = (long)pvVar61 +
                             (long)iVar69 * 4 + (long)iVar54 * 4 + lVar93 * 4 + lVar81 * 4;
                    lVar97 = (long)pvVar61 + (long)iVar69 * 4 + (long)iVar54 * 4 + lVar81 * 4;
                    local_3b8 = 0;
                    do {
                      if (iVar64 < iVar96) {
                        lVar51 = (long)iVar64;
                        iVar84 = iVar42;
                        do {
                          local_3f0._0_4_ = (int)sVar6;
                          pvVar74 = local_3e8->data;
                          uVar91 = *(undefined4 *)
                                    ((long)pgVar98->data +
                                    (long)((int)lVar51 * (int)local_3f0 +
                                          (int)local_3b8 * iVar65 +
                                          (int)local_370 * (int)local_318 +
                                          (int)local_308 * (int)local_358));
                          auVar185._4_4_ = uVar91;
                          auVar185._0_4_ = uVar91;
                          auVar185._8_4_ = uVar91;
                          auVar185._12_4_ = uVar91;
                          auVar185._16_4_ = uVar91;
                          auVar185._20_4_ = uVar91;
                          auVar185._24_4_ = uVar91;
                          auVar185._28_4_ = uVar91;
                          if (0 < (int)uVar38) {
                            lVar60 = (long)pvVar74 + (long)iVar84;
                            uVar99 = 0;
                            lVar92 = lVar97;
                            do {
                              lVar45 = 0;
                              do {
                                auVar107 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar60 + lVar45),
                                                           auVar185,*(undefined1 (*) [32])
                                                                     (lVar92 + lVar45));
                                *(undefined1 (*) [32])(lVar92 + lVar45) = ZEXT1632(auVar107);
                                lVar45 = lVar45 + 0x20;
                              } while (lVar45 != 0x80);
                              uVar99 = uVar99 + 0x20;
                              lVar92 = lVar92 + 0x80;
                              lVar60 = lVar60 + 0x80;
                            } while (uVar99 < uVar38);
                          }
                          if (uVar38 != uVar40) {
                            auVar186._4_4_ = uVar91;
                            auVar186._0_4_ = uVar91;
                            auVar186._8_4_ = uVar91;
                            auVar186._12_4_ = uVar91;
                            auVar186._16_4_ = uVar91;
                            auVar186._20_4_ = uVar91;
                            auVar186._24_4_ = uVar91;
                            auVar186._28_4_ = uVar91;
                            uVar99 = 0;
                            do {
                              auVar191._8_8_ = uVar99;
                              auVar191._0_8_ = uVar99;
                              auVar191._16_8_ = uVar99;
                              auVar191._24_8_ = uVar99;
                              auVar200 = vpor_avx2(auVar191,auVar135);
                              auVar165 = vpor_avx2(auVar191,auVar164);
                              auVar165 = vpcmpgtq_avx2(auVar165 ^ auVar166,auVar175 ^ auVar166);
                              auVar200 = vpcmpgtq_avx2(auVar200 ^ auVar166,auVar175 ^ auVar166);
                              auVar165 = vpackssdw_avx2(auVar200,auVar165);
                              auVar107 = vpackssdw_avx(SUB3216(auVar165 ^ auVar163,0),
                                                       SUB3216(auVar165 ^ auVar163,0x10));
                              auVar107 = vpshufd_avx(auVar107,0xd8);
                              auVar165 = vpmovzxwd_avx2(auVar107);
                              auVar192 = vpslld_avx2(auVar165,0x1f);
                              auVar165 = vmaskmovps_avx(auVar192,*(undefined1 (*) [32])
                                                                  ((long)pvVar74 +
                                                                  uVar99 * 4 +
                                                                  (long)iVar84 + lVar93 * 4));
                              auVar200 = vmaskmovps_avx(auVar192,*(undefined1 (*) [32])
                                                                  (lVar88 + uVar99 * 4));
                              auVar107 = vfmadd231ps_fma(auVar200,auVar186,auVar165);
                              auVar165 = vmaskmovps_avx(auVar192,ZEXT1632(auVar107));
                              *(undefined1 (*) [32])(lVar88 + uVar99 * 4) = auVar165;
                              uVar99 = uVar99 + 8;
                            } while (((lVar95 - lVar93) + 7U & 0xfffffffffffffff8) != uVar99);
                          }
                          lVar51 = lVar51 + 1;
                          iVar84 = iVar84 + iVar53;
                        } while (lVar51 != iVar96);
                      }
                      local_3b8 = local_3b8 + 1;
                      lVar97 = lVar97 + (long)iVar41 * 4;
                      lVar88 = lVar88 + (long)iVar41 * 4;
                    } while (local_3b8 != uVar70);
                  }
                  local_370 = local_370 + 1;
                  iVar69 = iVar69 + iVar55;
                  iVar42 = iVar42 + local_2a0._0_4_;
                } while (local_370 != uVar56);
              }
              local_308 = local_308 + 1;
              iVar54 = iVar54 + iVar71 * iVar48 * iVar41;
              iVar39 = iVar39 + (int)local_368;
            } while (local_308 != uVar83);
            return;
          }
          iVar48 = local_3e8->ne[2] * uVar40;
          iVar71 = local_3e8->ne[3] * iVar48;
          iVar41 = (int)(iVar71 + uVar38 + -1) / (int)uVar38;
          iVar54 = iVar54 * iVar41;
          iVar41 = iVar41 + iVar54;
          if (iVar71 <= iVar41) {
            iVar41 = iVar71;
          }
          if (iVar41 <= iVar54) {
            return;
          }
          uVar38 = local_3e8->ne[0];
          sVar4 = local_3f0->nb[0];
          sVar6 = local_3f0->nb[1];
          sVar5 = local_3f0->nb[2];
          sVar1 = local_3f0->nb[3];
          uVar83 = uVar38 & 0xffffffe0;
          auVar107 = ZEXT816(0) << 0x40;
          do {
            if (0 < (int)uVar70) {
              iVar55 = iVar54 / iVar48;
              uVar99 = (ulong)(uint)((int)((long)iVar54 % (long)iVar48) >> 0x1f) << 0x20 |
                       (long)iVar54 % (long)iVar48 & 0xffffffffU;
              pvVar61 = local_3f0->data;
              iVar53 = (int)((long)uVar99 % (long)(int)uVar40);
              iVar71 = (int)((long)uVar99 / (long)(int)uVar40);
              lVar95 = (long)(iVar55 * (int)local_368 + iVar53 * iVar39 + iVar71 * local_2a0._0_4_)
                       + (long)local_3e8->data;
              pvVar74 = pgVar98->data;
              iVar69 = iVar55 * (int)local_358 + iVar71 * (int)local_318;
              uVar99 = 0;
              do {
                lVar81 = (long)iVar69 + (long)pvVar74;
                _local_1a0 = ZEXT1632(auVar107);
                _local_1c0 = ZEXT1632(auVar107);
                _local_1e0 = ZEXT1632(auVar107);
                _local_200 = ZEXT1632(auVar107);
                if ((int)uVar83 < 1) {
                  auVar147 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  uVar63 = 0;
                  lVar93 = lVar95;
                  lVar88 = lVar81;
                  do {
                    lVar97 = 0;
                    do {
                      auVar202 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar88 + lVar97),
                                                 *(undefined1 (*) [32])(lVar93 + lVar97),
                                                 *(undefined1 (*) [32])(local_200 + lVar97));
                      *(undefined1 (*) [32])(local_200 + lVar97) = ZEXT1632(auVar202);
                      lVar97 = lVar97 + 0x20;
                    } while (lVar97 != 0x80);
                    uVar63 = uVar63 + 0x20;
                    lVar88 = lVar88 + 0x80;
                    lVar93 = lVar93 + 0x80;
                  } while (uVar63 < uVar83);
                  auVar147._0_4_ =
                       (float)local_200._0_4_ + (float)local_1e0._0_4_ +
                       (float)local_1c0._0_4_ + (float)local_1a0._0_4_;
                  auVar147._4_4_ =
                       (float)local_200._4_4_ + (float)local_1e0._4_4_ +
                       (float)local_1c0._4_4_ + (float)local_1a0._4_4_;
                  auVar147._8_4_ = fStack_1f8 + fStack_1d8 + fStack_1b8 + fStack_198;
                  auVar147._12_4_ = fStack_1f4 + fStack_1d4 + fStack_1b4 + fStack_194;
                  auVar147._16_4_ = fStack_1f0 + fStack_1d0 + fStack_1b0 + fStack_190;
                  auVar147._20_4_ = fStack_1ec + fStack_1cc + fStack_1ac + fStack_18c;
                  auVar147._24_4_ = fStack_1e8 + fStack_1c8 + fStack_1a8 + fStack_188;
                  auVar147._28_4_ = fStack_1e4 + fStack_1c4 + fStack_1a4 + fStack_184;
                }
                auVar130._0_4_ = auVar147._0_4_ + auVar147._16_4_;
                auVar130._4_4_ = auVar147._4_4_ + auVar147._20_4_;
                auVar130._8_4_ = auVar147._8_4_ + auVar147._24_4_;
                auVar130._12_4_ = auVar147._12_4_ + auVar147._28_4_;
                auVar202 = vhaddps_avx(auVar130,auVar130);
                auVar202 = vhaddps_avx(auVar202,auVar202);
                fVar101 = auVar202._0_4_;
                lVar93 = (long)(int)uVar83;
                if (uVar83 != uVar38) {
                  do {
                    fVar101 = fVar101 + *(float *)(lVar95 + lVar93 * 4) *
                                        *(float *)(lVar81 + lVar93 * 4);
                    lVar93 = lVar93 + 1;
                  } while (lVar93 < (int)uVar38);
                }
                local_3b0._0_4_ = (int)sVar6;
                *(float *)((long)pvVar61 +
                          (long)((int)uVar99 * (int)local_3b0 +
                                iVar55 * (int)sVar1 + iVar53 * (int)sVar4 + iVar71 * (int)sVar5)) =
                     fVar101;
                uVar99 = uVar99 + 1;
                iVar69 = iVar69 + iVar65;
              } while (uVar99 != uVar70);
            }
            iVar54 = iVar54 + 1;
          } while (iVar54 != iVar41);
          return;
        }
        if (iVar53 <= iVar39) {
          return;
        }
LAB_0012b283:
        pvVar61 = params->wdata;
LAB_0012b28f:
        memset(pvVar61,0,params->wsize);
        return;
      }
    }
    if (pgVar66->nb[0] == 4) {
      uVar38 = pgVar66->ne[0];
      lVar95 = (long)(int)uVar38;
      if (pgVar66->nb[1] != lVar95 * 4) goto LAB_0012f1ff;
      iVar41 = pgVar66->ne[1];
      if ((pgVar66->nb[2] != pgVar66->nb[1] * (long)iVar41) ||
         (iVar71 = pgVar66->ne[2], pgVar66->nb[3] != pgVar66->nb[2] * (long)iVar71))
      goto LAB_0012f1ff;
      if (tensor->nb[0] != GGML_TYPE_SIZE[tensor->type]) goto LAB_0012f204;
      if (tensor->nb[1] !=
          (tensor->nb[0] * (long)tensor->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[tensor->type])
      goto LAB_0012f204;
      if ((tensor->nb[2] != tensor->nb[1] * (long)tensor->ne[1]) ||
         (tensor->nb[3] != tensor->nb[2] * (long)tensor->ne[2])) goto LAB_0012f204;
      if ((uVar38 == tensor->ne[0]) &&
         (((iVar41 == tensor->ne[1] && (iVar71 == tensor->ne[2])) &&
          (pgVar66->ne[3] == tensor->ne[3])))) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        iVar71 = iVar71 * iVar41 * pgVar66->ne[3];
        iVar41 = (iVar71 + params->nth + -1) / params->nth;
        lVar81 = (long)params->ith * (long)iVar41;
        iVar41 = iVar41 + (int)lVar81;
        if (iVar71 <= iVar41) {
          iVar41 = iVar71;
        }
        if (iVar41 <= (int)lVar81) {
          return;
        }
        uVar40 = uVar38 & 0xffffffe0;
        lVar93 = (long)(int)uVar40;
        if (lVar95 < lVar93 + 1) {
          lVar95 = lVar93 + 1;
        }
        lVar88 = (lVar95 - lVar93) + -1;
        auVar115._8_8_ = lVar88;
        auVar115._0_8_ = lVar88;
        auVar115._16_8_ = lVar88;
        auVar115._24_8_ = lVar88;
        auVar164 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar165 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar163 = vpcmpeqd_avx2(auVar135,auVar135);
        do {
          sVar6 = tensor->nb[1];
          pvVar61 = tensor->data;
          if ((int)uVar38 < 1) {
            dVar194 = 0.0;
          }
          else {
            lVar88 = sVar6 * lVar81;
            uVar99 = 0;
            auVar107 = ZEXT816(0xfff0000000000000);
            do {
              auVar197._0_8_ = (double)*(float *)((long)pvVar61 + uVar99 * 4 + lVar88);
              auVar197._8_8_ = uVar225;
              auVar107 = vmaxsd_avx(auVar107,auVar197);
              uVar99 = uVar99 + 1;
            } while (uVar38 != uVar99);
            in_ZMM8 = ZEXT1664(CONCAT124(auVar107._4_12_,(float)auVar107._0_8_));
            dVar194 = 0.0;
            uVar99 = 0;
            do {
              fVar101 = *(float *)((long)pvVar61 + uVar99 * 4 + lVar88);
              fVar234 = 0.0;
              if (-INFINITY < fVar101) {
                auVar202 = vcvtps2ph_f16c(ZEXT416((uint)(fVar101 - (float)auVar107._0_8_)),0);
                uVar91 = vpextrw_avx(auVar202,0);
                unaff_R13 = (ulong)table_exp_f16[CONCAT44((int)(unaff_R13 >> 0x20),uVar91)];
                fVar234 = table_f32_f16[unaff_R13];
                dVar194 = (double)fVar234 + dVar194;
              }
              *(float *)((long)pvVar61 + uVar99 * 4 + lVar88) = fVar234;
              uVar99 = uVar99 + 1;
            } while (uVar38 != uVar99);
          }
          fVar101 = (float)(1.0 / dVar194);
          if (0 < (int)uVar40) {
            pvVar74 = (void *)(sVar6 * lVar81 + (long)pvVar61);
            uVar99 = 0;
            do {
              lVar88 = 0;
              do {
                pfVar86 = (float *)((long)pvVar74 + lVar88);
                auVar201._0_4_ = fVar101 * *pfVar86;
                auVar201._4_4_ = fVar101 * pfVar86[1];
                auVar201._8_4_ = fVar101 * pfVar86[2];
                auVar201._12_4_ = fVar101 * pfVar86[3];
                auVar201._16_4_ = fVar101 * pfVar86[4];
                auVar201._20_4_ = fVar101 * pfVar86[5];
                auVar201._28_36_ = in_ZMM8._28_36_;
                auVar201._24_4_ = fVar101 * pfVar86[6];
                in_ZMM8 = ZEXT3264(auVar201._0_32_);
                *(undefined1 (*) [32])((long)pvVar74 + lVar88) = auVar201._0_32_;
                lVar88 = lVar88 + 0x20;
              } while (lVar88 != 0x80);
              uVar99 = uVar99 + 0x20;
              pvVar74 = (void *)((long)pvVar74 + 0x80);
              unaff_R13 = 0;
            } while (uVar99 < uVar40);
          }
          if (uVar40 != uVar38) {
            lVar88 = sVar6 * lVar81 + lVar93 * 4;
            uVar99 = 0;
            do {
              auVar199._8_8_ = uVar99;
              auVar199._0_8_ = uVar99;
              auVar199._16_8_ = uVar99;
              auVar199._24_8_ = uVar99;
              auVar200 = vpor_avx2(auVar199,auVar164);
              auVar135 = vpor_avx2(auVar199,auVar165);
              auVar208._8_8_ = 0x8000000000000000;
              auVar208._0_8_ = 0x8000000000000000;
              auVar208._16_8_ = 0x8000000000000000;
              auVar208._24_8_ = 0x8000000000000000;
              auVar135 = vpcmpgtq_avx2(auVar135 ^ auVar208,auVar208 ^ auVar115);
              auVar200 = vpcmpgtq_avx2(auVar200 ^ auVar208,auVar208 ^ auVar115);
              auVar135 = vpackssdw_avx2(auVar200,auVar135);
              auVar107 = vpackssdw_avx(SUB3216(auVar135 ^ auVar163,0),
                                       SUB3216(auVar135 ^ auVar163,0x10));
              auVar107 = vpshufd_avx(auVar107,0xd8);
              auVar135 = vpmovzxwd_avx2(auVar107);
              auVar200 = vpslld_avx2(auVar135,0x1f);
              in_ZMM8 = ZEXT3264(auVar200);
              auVar135 = vmaskmovps_avx(auVar200,*(undefined1 (*) [32])
                                                  ((long)pvVar61 + uVar99 * 4 + lVar88));
              auVar10._4_4_ = auVar135._4_4_ * fVar101;
              auVar10._0_4_ = auVar135._0_4_ * fVar101;
              auVar10._8_4_ = auVar135._8_4_ * fVar101;
              auVar10._12_4_ = auVar135._12_4_ * fVar101;
              auVar10._16_4_ = auVar135._16_4_ * fVar101;
              auVar10._20_4_ = auVar135._20_4_ * fVar101;
              auVar10._24_4_ = auVar135._24_4_ * fVar101;
              auVar10._28_4_ = auVar135._28_4_;
              auVar135 = vmaskmovps_avx(auVar200,auVar10);
              *(undefined1 (*) [32])((long)pvVar61 + uVar99 * 4 + lVar88) = auVar135;
              uVar99 = uVar99 + 8;
            } while (((lVar95 - lVar93) + 7U & 0xfffffffffffffff8) != uVar99);
          }
          lVar81 = lVar81 + 1;
        } while (lVar81 != iVar41);
        return;
      }
    }
    else {
LAB_0012f1ff:
      ggml_compute_forward_cold_14();
LAB_0012f204:
      ggml_compute_forward_cold_15();
LAB_0012f209:
      ggml_compute_forward_cold_126();
LAB_0012f20e:
      ggml_compute_forward_cold_127();
LAB_0012f213:
      ggml_compute_forward_cold_130();
LAB_0012f218:
      ggml_compute_forward_cold_131();
LAB_0012f21d:
      ggml_compute_forward_cold_30();
LAB_0012f222:
      ggml_compute_forward_cold_81();
    }
    ggml_compute_forward_cold_16();
LAB_0012f22c:
    ggml_compute_forward_cold_128();
LAB_0012f231:
    ggml_compute_forward_cold_132();
switchD_001271cd_caseD_23:
    ggml_compute_forward_cold_77();
switchD_001277d9_caseD_2:
    ggml_compute_forward_cold_18();
switchD_00128152_caseD_2:
    ggml_compute_forward_cold_83();
switchD_001278e8_caseD_6:
    ggml_compute_forward_cold_57();
LAB_0012f24a:
    ggml_compute_forward_cold_58();
LAB_0012f24f:
    ggml_compute_forward_cold_59();
LAB_0012f254:
    ggml_compute_forward_cold_60();
LAB_0012f259:
    ggml_compute_forward_cold_61();
LAB_0012f25e:
    ggml_compute_forward_cold_62();
LAB_0012f263:
    ggml_compute_forward_cold_63();
LAB_0012f268:
    ggml_compute_forward_cold_64();
LAB_0012f26d:
    ggml_compute_forward_cold_65();
LAB_0012f272:
    ggml_compute_forward_cold_66();
LAB_0012f277:
    ggml_compute_forward_cold_67();
LAB_0012f27c:
    ggml_compute_forward_cold_68();
LAB_0012f281:
    ggml_compute_forward_cold_69();
LAB_0012f286:
    ggml_compute_forward_cold_70();
LAB_0012f28b:
    ggml_compute_forward_cold_71();
LAB_0012f290:
    ggml_compute_forward_cold_72();
LAB_0012f295:
    ggml_compute_forward_cold_73();
LAB_0012f29a:
    ggml_compute_forward_cold_76();
LAB_0012f29f:
    ggml_compute_forward_cold_75();
LAB_0012f2a4:
    ggml_compute_forward_cold_74();
LAB_0012f2a9:
    ggml_compute_forward_cold_44();
LAB_0012f2ae:
    ggml_compute_forward_cold_45();
LAB_0012f2b3:
    ggml_compute_forward_cold_46();
LAB_0012f2b8:
    ggml_compute_forward_cold_47();
LAB_0012f2bd:
    ggml_compute_forward_cold_48();
LAB_0012f2c2:
    ggml_compute_forward_cold_49();
LAB_0012f2c7:
    ggml_compute_forward_cold_50();
LAB_0012f2cc:
    ggml_compute_forward_cold_51();
LAB_0012f2d1:
    ggml_compute_forward_cold_52();
LAB_0012f2d6:
    ggml_compute_forward_cold_55();
LAB_0012f2db:
    ggml_compute_forward_cold_54();
LAB_0012f2e0:
    ggml_compute_forward_cold_53();
LAB_0012f2e5:
    ggml_compute_forward_cold_25();
LAB_0012f2ea:
    ggml_compute_forward_cold_26();
LAB_0012f2ef:
    ggml_compute_forward_cold_27();
LAB_0012f2f4:
    ggml_compute_forward_cold_28();
LAB_0012f2f9:
    ggml_compute_forward_cold_29();
LAB_0012f2fe:
    ggml_compute_forward_cold_7();
LAB_0012f303:
    ggml_compute_forward_cold_8();
LAB_0012f308:
    ggml_compute_forward_cold_9();
LAB_0012f30d:
    ggml_compute_forward_cold_10();
LAB_0012f312:
    ggml_compute_forward_cold_11();
LAB_0012f317:
    ggml_compute_forward_cold_20();
LAB_0012f31c:
    ggml_compute_forward_cold_21();
LAB_0012f321:
    ggml_compute_forward_cold_22();
LAB_0012f326:
    ggml_compute_forward_cold_23();
LAB_0012f32b:
    ggml_compute_forward_cold_24();
LAB_0012f330:
    ggml_compute_forward_cold_2();
LAB_0012f335:
    ggml_compute_forward_cold_3();
LAB_0012f33a:
    ggml_compute_forward_cold_4();
LAB_0012f33f:
    ggml_compute_forward_cold_5();
LAB_0012f344:
    ggml_compute_forward_cold_6();
LAB_0012f349:
    ggml_compute_forward_cold_32();
LAB_0012f34e:
    ggml_compute_forward_cold_33();
LAB_0012f353:
    ggml_compute_forward_cold_34();
LAB_0012f358:
    ggml_compute_forward_cold_35();
LAB_0012f35d:
    ggml_compute_forward_cold_36();
LAB_0012f362:
    ggml_compute_forward_cold_37();
LAB_0012f367:
    ggml_compute_forward_cold_38();
LAB_0012f36c:
    ggml_compute_forward_cold_39();
LAB_0012f371:
    ggml_compute_forward_cold_40();
LAB_0012f376:
    ggml_compute_forward_cold_43();
LAB_0012f37b:
    ggml_compute_forward_cold_42();
LAB_0012f380:
    ggml_compute_forward_cold_41();
LAB_0012f385:
    ggml_compute_forward_cold_108();
LAB_0012f38a:
    ggml_compute_forward_cold_109();
LAB_0012f38f:
    ggml_compute_forward_cold_110();
LAB_0012f394:
    ggml_compute_forward_cold_111();
LAB_0012f399:
    ggml_compute_forward_cold_112();
LAB_0012f39e:
    ggml_compute_forward_cold_113();
LAB_0012f3a3:
    ggml_compute_forward_cold_118();
LAB_0012f3a8:
    ggml_compute_forward_cold_117();
LAB_0012f3ad:
    ggml_compute_forward_cold_116();
LAB_0012f3b2:
    ggml_compute_forward_cold_114();
LAB_0012f3b7:
    ggml_compute_forward_cold_115();
LAB_0012f3bc:
    ggml_compute_forward_cold_84();
LAB_0012f3c1:
    ggml_compute_forward_cold_85();
LAB_0012f3c6:
    ggml_compute_forward_cold_86();
LAB_0012f3cb:
    ggml_compute_forward_cold_87();
LAB_0012f3d0:
    ggml_compute_forward_cold_88();
LAB_0012f3d5:
    ggml_compute_forward_cold_89();
LAB_0012f3da:
    ggml_compute_forward_cold_96();
LAB_0012f3df:
    ggml_compute_forward_cold_95();
LAB_0012f3e4:
    ggml_compute_forward_cold_94();
LAB_0012f3e9:
    ggml_compute_forward_cold_90();
LAB_0012f3ee:
    ggml_compute_forward_cold_91();
LAB_0012f3f3:
    ggml_compute_forward_cold_97();
LAB_0012f3f8:
    ggml_compute_forward_cold_98();
LAB_0012f3fd:
    ggml_compute_forward_cold_99();
LAB_0012f402:
    ggml_compute_forward_cold_100();
LAB_0012f407:
    ggml_compute_forward_cold_101();
LAB_0012f40c:
    ggml_compute_forward_cold_102();
LAB_0012f411:
    ggml_compute_forward_cold_107();
LAB_0012f416:
    ggml_compute_forward_cold_106();
LAB_0012f41b:
    ggml_compute_forward_cold_105();
LAB_0012f420:
    ggml_compute_forward_cold_103();
    goto LAB_0012f425;
  case GGML_OP_SQR:
    goto switchD_001271cd_caseD_6;
  case GGML_OP_SQRT:
    goto switchD_001271cd_caseD_7;
  case GGML_OP_SUM:
    goto switchD_001271cd_caseD_8;
  case GGML_OP_MEAN:
    goto switchD_001271cd_caseD_9;
  case GGML_OP_REPEAT:
    goto switchD_001271cd_caseD_a;
  case GGML_OP_SGN:
    pgVar66 = tensor->src0;
    gVar44 = pgVar66->type;
    if (gVar44 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar38 = pgVar66->ne[2] * pgVar66->ne[1] * pgVar66->ne[3];
      if ((int)uVar38 < 1) {
        return;
      }
      uVar40 = pgVar66->ne[0];
      sVar6 = tensor->nb[1];
      pvVar61 = tensor->data;
      pvVar74 = pgVar66->data;
      sVar4 = pgVar66->nb[1];
      uVar99 = 0;
      auVar159._8_4_ = 0x3f800000;
      auVar159._0_8_ = 0x3f8000003f800000;
      auVar159._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar40) {
          uVar63 = 0;
          do {
            auVar202 = ZEXT416(*(uint *)((long)pvVar74 + uVar63 * 4));
            auVar107 = vcmpss_avx(auVar202,ZEXT816(0) << 0x40,1);
            auVar107 = vandps_avx(auVar107,SUB6416(ZEXT464(0xbf800000),0));
            auVar202 = vcmpss_avx(ZEXT816(0) << 0x40,auVar202,1);
            auVar107 = vblendvps_avx(auVar107,auVar159,auVar202);
            *(int *)((long)pvVar61 + uVar63 * 4) = auVar107._0_4_;
            uVar63 = uVar63 + 1;
          } while (uVar40 != uVar63);
        }
        uVar99 = uVar99 + 1;
        pvVar61 = (void *)((long)pvVar61 + sVar6);
        pvVar74 = (void *)((long)pvVar74 + sVar4);
      } while (uVar99 != uVar38);
      return;
    }
    if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_136();
  case GGML_OP_RMS_NORM:
    pgVar98 = tensor->src0;
    gVar44 = pgVar98->type;
    if (gVar44 == GGML_TYPE_F32) {
      uVar38 = pgVar98->ne[0];
      if (uVar38 != tensor->ne[0]) goto LAB_0012f1fa;
      iVar41 = pgVar98->ne[1];
      if (iVar41 != tensor->ne[1]) goto LAB_0012f1fa;
      uVar40 = pgVar98->ne[2];
      if (uVar40 != tensor->ne[2]) goto LAB_0012f1fa;
      uVar70 = pgVar98->ne[3];
      if (uVar70 != tensor->ne[3]) goto LAB_0012f1fa;
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      if (pgVar98->nb[0] == 4) {
        if ((int)uVar70 < 1) {
          return;
        }
        lVar97 = (long)(int)uVar38;
        sVar6 = pgVar98->nb[1];
        sVar4 = pgVar98->nb[2];
        sVar5 = tensor->nb[1];
        lVar93 = (long)params->nth;
        iVar71 = params->ith;
        lVar88 = (long)iVar71;
        uVar83 = uVar38 & 0xffffffe0;
        lVar81 = (long)(int)uVar83;
        lVar95 = lVar97;
        if (lVar97 < lVar81 + 1) {
          lVar95 = lVar81 + 1;
        }
        lVar51 = (lVar95 - lVar81) + -1;
        auVar114._8_8_ = lVar51;
        auVar114._0_8_ = lVar51;
        auVar114._16_8_ = lVar51;
        auVar114._24_8_ = lVar51;
        local_310 = sVar6 * lVar88;
        local_300 = sVar5 * lVar88;
        local_2f8 = local_300 + lVar81 * 4;
        auVar136._8_8_ = 0x8000000000000000;
        auVar136._0_8_ = 0x8000000000000000;
        auVar136._16_8_ = 0x8000000000000000;
        auVar136._24_8_ = 0x8000000000000000;
        sVar1 = pgVar98->nb[3];
        sVar2 = tensor->nb[2];
        sVar3 = tensor->nb[3];
        local_358 = 0;
        do {
          if (0 < (int)uVar40) {
            local_350 = local_2f8;
            local_318 = local_300;
            local_378 = local_310;
            local_348 = 0;
            do {
              if (iVar71 < iVar41) {
                lVar51 = local_350;
                lVar60 = local_378;
                uVar99 = local_318;
                lVar92 = lVar88;
                do {
                  if ((int)uVar38 < 1) {
                    dVar194 = 0.0;
                  }
                  else {
                    dVar194 = 0.0;
                    uVar63 = 0;
                    do {
                      fVar101 = *(float *)((long)pgVar98->data + uVar63 * 4 + lVar60);
                      dVar194 = dVar194 + (double)(fVar101 * fVar101);
                      uVar63 = uVar63 + 1;
                    } while (uVar38 != uVar63);
                  }
                  pvVar61 = tensor->data;
                  auVar163 = ZEXT1632(in_ZMM7._0_16_);
                  memcpy((void *)(lVar92 * sVar5 + local_348 * sVar2 + local_358 * sVar3 +
                                 (long)pvVar61),
                         (void *)((long)pgVar98->data +
                                 lVar92 * sVar6 + local_348 * sVar4 + local_358 * sVar1),lVar97 * 4)
                  ;
                  dVar194 = dVar194 / (double)(int)uVar38 + 9.999999747378752e-06;
                  if (dVar194 < 0.0) {
                    dVar194 = sqrt(dVar194);
                  }
                  else {
                    auVar105._8_8_ = 0;
                    auVar105._0_8_ = dVar194;
                    auVar107 = vsqrtsd_avx(auVar105,auVar105);
                    dVar194 = auVar107._0_8_;
                  }
                  auVar135 = vpmovsxbq_avx2(ZEXT416(0x3020100));
                  auVar164 = vpmovsxbq_avx2(ZEXT416(0x7060504));
                  auVar163 = vpcmpeqd_avx2(auVar163,auVar163);
                  in_ZMM7 = ZEXT3264(auVar163);
                  auVar152 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                  fVar101 = (float)(1.0 / dVar194);
                  if (0 < (int)uVar83) {
                    lVar45 = (long)pvVar61 + uVar99;
                    uVar63 = 0;
                    do {
                      lVar59 = 0;
                      do {
                        pfVar86 = (float *)(lVar45 + lVar59);
                        auVar150._0_4_ = fVar101 * *pfVar86;
                        auVar150._4_4_ = fVar101 * pfVar86[1];
                        auVar150._8_4_ = fVar101 * pfVar86[2];
                        auVar150._12_4_ = fVar101 * pfVar86[3];
                        auVar150._16_4_ = fVar101 * pfVar86[4];
                        auVar150._20_4_ = fVar101 * pfVar86[5];
                        auVar150._28_36_ = auVar152._28_36_;
                        auVar150._24_4_ = fVar101 * pfVar86[6];
                        auVar152 = ZEXT3264(auVar150._0_32_);
                        *(undefined1 (*) [32])(lVar45 + lVar59) = auVar150._0_32_;
                        lVar59 = lVar59 + 0x20;
                      } while (lVar59 != 0x80);
                      uVar63 = uVar63 + 0x20;
                      lVar45 = lVar45 + 0x80;
                    } while (uVar63 < uVar83);
                  }
                  if (uVar83 != uVar38) {
                    uVar63 = 0;
                    do {
                      auVar137._8_8_ = uVar63;
                      auVar137._0_8_ = uVar63;
                      auVar137._16_8_ = uVar63;
                      auVar137._24_8_ = uVar63;
                      auVar200 = vpor_avx2(auVar137,auVar135);
                      auVar165 = vpor_avx2(auVar137,auVar164);
                      auVar165 = vpcmpgtq_avx2(auVar165 ^ auVar136,auVar114 ^ auVar136);
                      auVar200 = vpcmpgtq_avx2(auVar200 ^ auVar136,auVar114 ^ auVar136);
                      auVar165 = vpackssdw_avx2(auVar200,auVar165);
                      auVar107 = vpackssdw_avx(SUB3216(auVar165 ^ auVar163,0),
                                               SUB3216(auVar165 ^ auVar163,0x10));
                      auVar107 = vpshufd_avx(auVar107,0xd8);
                      auVar165 = vpmovzxwd_avx2(auVar107);
                      auVar200 = vpslld_avx2(auVar165,0x1f);
                      auVar165 = vmaskmovps_avx(auVar200,*(undefined1 (*) [32])
                                                          ((long)pvVar61 + uVar63 * 4 + lVar51));
                      auVar9._4_4_ = auVar165._4_4_ * fVar101;
                      auVar9._0_4_ = auVar165._0_4_ * fVar101;
                      auVar9._8_4_ = auVar165._8_4_ * fVar101;
                      auVar9._12_4_ = auVar165._12_4_ * fVar101;
                      auVar9._16_4_ = auVar165._16_4_ * fVar101;
                      auVar9._20_4_ = auVar165._20_4_ * fVar101;
                      auVar9._24_4_ = auVar165._24_4_ * fVar101;
                      auVar9._28_4_ = auVar165._28_4_;
                      auVar165 = vmaskmovps_avx(auVar200,auVar9);
                      *(undefined1 (*) [32])((long)pvVar61 + uVar63 * 4 + lVar51) = auVar165;
                      uVar63 = uVar63 + 8;
                    } while (((lVar95 - lVar81) + 7U & 0xfffffffffffffff8) != uVar63);
                  }
                  lVar92 = lVar92 + lVar93;
                  lVar60 = lVar60 + sVar6 * lVar93;
                  uVar99 = uVar99 + sVar5 * lVar93;
                  lVar51 = lVar51 + sVar5 * lVar93;
                } while (lVar92 < iVar41);
              }
              local_348 = local_348 + 1;
              local_378 = local_378 + sVar4;
              local_318 = local_318 + sVar2;
              local_350 = local_350 + sVar2;
            } while (local_348 != uVar40);
          }
          local_358 = local_358 + 1;
          local_310 = local_310 + sVar1;
          local_300 = local_300 + sVar3;
          local_2f8 = local_2f8 + sVar3;
        } while (local_358 != uVar70);
        return;
      }
      goto LAB_0012f42f;
    }
    if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_119();
switchD_001271cd_caseD_2:
    pgVar98 = tensor->src0;
    gVar44 = pgVar98->type;
    if (gVar44 != GGML_TYPE_F32) {
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_146();
switchD_001271cd_caseD_22:
      pgVar98 = tensor->src1;
      switch(pgVar98->type) {
      case GGML_TYPE_Q4_0:
      case GGML_TYPE_Q4_1:
      case GGML_TYPE_I8:
      case GGML_TYPE_I16:
      case GGML_TYPE_I32:
      case GGML_TYPE_COUNT:
        goto switchD_001278e8_caseD_0;
      case GGML_TYPE_F16:
        pgVar78 = tensor->src0;
        uVar38 = pgVar78->ne[0];
        if (tensor->ne[0] != uVar38) goto LAB_0012f24a;
        iVar41 = pgVar78->ne[1];
        if (tensor->ne[1] != iVar41) goto LAB_0012f24f;
        if (tensor->ne[2] != pgVar78->ne[2]) goto LAB_0012f254;
        if ((int)pgVar78->nb[0] != 2) goto LAB_0012f259;
        if ((int)pgVar98->nb[0] != 2) goto LAB_0012f25e;
        pgVar66 = tensor->opt[0];
        if ((int)pgVar66->nb[0] != 4) goto LAB_0012f263;
        pgVar75 = tensor->opt[1];
        if ((int)pgVar75->nb[0] != 2) goto LAB_0012f268;
        pgVar85 = tensor->opt[2];
        if ((int)pgVar85->nb[0] != 4) goto LAB_0012f26d;
        if (pgVar98->ne[0] != uVar38) goto LAB_0012f272;
        uVar40 = pgVar98->ne[1];
        if (pgVar66->ne[0] != uVar40) goto LAB_0012f277;
        if (pgVar66->ne[1] != 1) goto LAB_0012f27c;
        uVar99 = (ulong)uVar40;
        if (pgVar75->ne[0] != uVar40) goto LAB_0012f281;
        if (pgVar75->ne[1] != uVar38) goto LAB_0012f286;
        if (pgVar85->ne[0] != uVar38) goto LAB_0012f28b;
        if (pgVar85->ne[1] != 1) goto LAB_0012f290;
        if ((int)tensor->nb[0] != 4) goto LAB_0012f295;
        iVar71 = (int)tensor->nb[1];
        if (iVar71 < 4) goto LAB_0012f29a;
        iVar48 = (int)tensor->nb[2];
        if (iVar48 < iVar71) goto LAB_0012f29f;
        iVar53 = (int)tensor->nb[3];
        if (iVar48 <= iVar53) {
          if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
            return;
          }
          iVar54 = pgVar78->ne[2] * iVar41;
          iVar69 = pgVar78->ne[3] * iVar54;
          iVar39 = (iVar69 + params->nth + -1) / params->nth;
          iVar55 = iVar39 * params->ith;
          iVar39 = iVar39 + iVar55;
          if (iVar69 <= iVar39) {
            iVar39 = iVar69;
          }
          if (iVar39 <= iVar55) {
            return;
          }
          sVar5 = pgVar78->nb[1];
          sVar1 = pgVar78->nb[2];
          sVar2 = pgVar78->nb[3];
          sVar6 = pgVar98->nb[1];
          sVar3 = pgVar98->nb[2];
          sVar33 = pgVar98->nb[3];
          lVar81 = ((long)(int)(uVar40 * 2) + 0x10) * (long)params->ith;
          pvVar61 = params->wdata;
          sVar4 = pgVar75->nb[1];
          uVar83 = uVar38 & 0xffffffe0;
          pvVar74 = pgVar66->data;
          uVar70 = uVar40 & 0xffffffe0;
          pvVar73 = tensor->data;
          pvVar87 = pgVar85->data;
          auVar107 = ZEXT816(0) << 0x40;
          sVar34 = pgVar75->nb[2];
          sVar35 = pgVar75->nb[3];
          lVar95 = (long)pvVar61 + (long)(int)uVar40 * 4 + lVar81 * 4;
          do {
            iVar96 = iVar55 / iVar54;
            uVar63 = (ulong)(uint)((int)((long)iVar55 % (long)iVar54) >> 0x1f) << 0x20 |
                     (long)iVar55 % (long)iVar54 & 0xffffffffU;
            iVar65 = (int)((long)uVar63 % (long)iVar41);
            iVar69 = (int)((long)uVar63 / (long)iVar41);
            auVar163 = ZEXT1632(auVar107);
            if (0 < (int)uVar40) {
              pvVar100 = pgVar98->data;
              iVar64 = iVar96 * (int)sVar33 + iVar69 * (int)sVar3;
              lVar93 = (long)(iVar96 * (int)sVar2 + iVar65 * (int)sVar5 + iVar69 * (int)sVar1) +
                       (long)pgVar78->data;
              uVar63 = 0;
              do {
                lVar88 = (long)iVar64 + (long)pvVar100;
                _local_1a0 = ZEXT1632(auVar107);
                _local_1c0 = ZEXT1632(auVar107);
                _local_1e0 = auVar163;
                _local_200 = auVar163;
                if ((int)uVar83 < 1) {
                  auVar132 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  uVar52 = 0;
                  lVar97 = lVar93;
                  lVar51 = lVar88;
                  do {
                    lVar60 = 0;
                    do {
                      auVar135 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar51 + lVar60));
                      auVar164 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar97 + lVar60));
                      auVar202 = vfmadd213ps_fma(auVar164,auVar135,
                                                 *(undefined1 (*) [32])(local_200 + lVar60 * 2));
                      *(undefined1 (*) [32])(local_200 + lVar60 * 2) = ZEXT1632(auVar202);
                      lVar60 = lVar60 + 0x10;
                    } while (lVar60 != 0x40);
                    uVar52 = uVar52 + 0x20;
                    lVar97 = lVar97 + 0x40;
                    lVar51 = lVar51 + 0x40;
                  } while (uVar52 < uVar83);
                  auVar132._0_4_ =
                       (float)local_200._0_4_ + (float)local_1e0._0_4_ +
                       (float)local_1c0._0_4_ + (float)local_1a0._0_4_;
                  auVar132._4_4_ =
                       (float)local_200._4_4_ + (float)local_1e0._4_4_ +
                       (float)local_1c0._4_4_ + (float)local_1a0._4_4_;
                  auVar132._8_4_ = fStack_1f8 + fStack_1d8 + fStack_1b8 + fStack_198;
                  auVar132._12_4_ = fStack_1f4 + fStack_1d4 + fStack_1b4 + fStack_194;
                  auVar132._16_4_ = fStack_1f0 + fStack_1d0 + fStack_1b0 + fStack_190;
                  auVar132._20_4_ = fStack_1ec + fStack_1cc + fStack_1ac + fStack_18c;
                  auVar132._24_4_ = fStack_1e8 + fStack_1c8 + fStack_1a8 + fStack_188;
                  auVar132._28_4_ = fStack_1e4 + fStack_1c4 + fStack_1a4 + fStack_184;
                }
                auVar119._0_4_ = auVar132._0_4_ + auVar132._16_4_;
                auVar119._4_4_ = auVar132._4_4_ + auVar132._20_4_;
                auVar119._8_4_ = auVar132._8_4_ + auVar132._24_4_;
                auVar119._12_4_ = auVar132._12_4_ + auVar132._28_4_;
                auVar202 = vhaddps_avx(auVar119,auVar119);
                auVar202 = vhaddps_avx(auVar202,auVar202);
                fVar101 = auVar202._0_4_;
                lVar97 = (long)(int)uVar83;
                if (uVar83 != uVar38) {
                  do {
                    fVar101 = fVar101 + table_f32_f16[*(ushort *)(lVar88 + lVar97 * 2)] *
                                        table_f32_f16[*(ushort *)(lVar93 + lVar97 * 2)];
                    lVar97 = lVar97 + 1;
                  } while (lVar97 < (int)uVar38);
                }
                *(float *)((long)pvVar61 + uVar63 * 4 + lVar81 * 4) = fVar101;
                uVar63 = uVar63 + 1;
                local_3d8._0_4_ = (int)sVar6;
                iVar64 = iVar64 + (int)local_3d8;
              } while (uVar63 != uVar99);
              uVar63 = 0;
              do {
                *(float *)((long)pvVar61 + uVar63 * 4 + lVar81 * 4) =
                     *(float *)((long)pvVar61 + uVar63 * 4 + lVar81 * 4) +
                     *(float *)((long)pvVar74 + uVar63 * 4);
                uVar63 = uVar63 + 1;
              } while (uVar99 != uVar63);
              uVar63 = 0;
              do {
                auVar202 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar61 + uVar63 * 4 + lVar81 * 4)
                                                 ),0);
                vpextrw_avx(auVar202,0);
                uVar63 = uVar63 + 1;
              } while (uVar99 != uVar63);
              uVar63 = 0;
              do {
                *(ggml_fp16_t *)(lVar95 + uVar63 * 2) =
                     table_gelu_f16[*(ushort *)(lVar95 + uVar63 * 2)];
                uVar63 = uVar63 + 1;
              } while (uVar99 != uVar63);
            }
            if (0 < (int)uVar38) {
              iVar65 = iVar96 * iVar53 + iVar65 * iVar71 + iVar69 * iVar48;
              pvVar100 = pgVar75->data;
              iVar69 = iVar96 * (int)sVar35 + iVar69 * (int)sVar34;
              uVar63 = 0;
              do {
                lVar93 = (long)iVar69 + (long)pvVar100;
                _local_1a0 = auVar163;
                _local_1c0 = auVar163;
                _local_1e0 = auVar163;
                _local_200 = auVar163;
                if ((int)uVar70 < 1) {
                  auVar133 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                }
                else {
                  uVar52 = 0;
                  lVar88 = lVar95;
                  lVar97 = lVar93;
                  do {
                    lVar51 = 0;
                    do {
                      auVar135 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar97 + lVar51));
                      auVar164 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar88 + lVar51));
                      auVar202 = vfmadd213ps_fma(auVar164,auVar135,
                                                 *(undefined1 (*) [32])(local_200 + lVar51 * 2));
                      *(undefined1 (*) [32])(local_200 + lVar51 * 2) = ZEXT1632(auVar202);
                      lVar51 = lVar51 + 0x10;
                    } while (lVar51 != 0x40);
                    uVar52 = uVar52 + 0x20;
                    lVar88 = lVar88 + 0x40;
                    lVar97 = lVar97 + 0x40;
                  } while (uVar52 < uVar70);
                  auVar133._0_4_ =
                       (float)local_200._0_4_ + (float)local_1e0._0_4_ +
                       (float)local_1c0._0_4_ + (float)local_1a0._0_4_;
                  auVar133._4_4_ =
                       (float)local_200._4_4_ + (float)local_1e0._4_4_ +
                       (float)local_1c0._4_4_ + (float)local_1a0._4_4_;
                  auVar133._8_4_ = fStack_1f8 + fStack_1d8 + fStack_1b8 + fStack_198;
                  auVar133._12_4_ = fStack_1f4 + fStack_1d4 + fStack_1b4 + fStack_194;
                  auVar133._16_4_ = fStack_1f0 + fStack_1d0 + fStack_1b0 + fStack_190;
                  auVar133._20_4_ = fStack_1ec + fStack_1cc + fStack_1ac + fStack_18c;
                  auVar133._24_4_ = fStack_1e8 + fStack_1c8 + fStack_1a8 + fStack_188;
                  auVar133._28_4_ = fStack_1e4 + fStack_1c4 + fStack_1a4 + fStack_184;
                }
                auVar120._0_4_ = auVar133._0_4_ + auVar133._16_4_;
                auVar120._4_4_ = auVar133._4_4_ + auVar133._20_4_;
                auVar120._8_4_ = auVar133._8_4_ + auVar133._24_4_;
                auVar120._12_4_ = auVar133._12_4_ + auVar133._28_4_;
                auVar202 = vhaddps_avx(auVar120,auVar120);
                auVar202 = vhaddps_avx(auVar202,auVar202);
                fVar101 = auVar202._0_4_;
                lVar88 = (long)(int)uVar70;
                if (uVar70 != uVar40) {
                  do {
                    fVar101 = fVar101 + table_f32_f16[*(ushort *)(lVar93 + lVar88 * 2)] *
                                        table_f32_f16[*(ushort *)(lVar95 + lVar88 * 2)];
                    lVar88 = lVar88 + 1;
                  } while (lVar88 < (int)uVar40);
                }
                *(float *)((long)pvVar73 + (long)(iVar65 + (int)uVar63 * 4)) = fVar101;
                uVar63 = uVar63 + 1;
                local_3b0._0_4_ = (int)sVar4;
                iVar69 = iVar69 + (int)local_3b0;
              } while (uVar63 != uVar38);
              uVar63 = 0;
              do {
                *(float *)((long)pvVar73 + uVar63 * 4 + (long)iVar65) =
                     *(float *)((long)pvVar73 + uVar63 * 4 + (long)iVar65) +
                     *(float *)((long)pvVar87 + uVar63 * 4);
                uVar63 = uVar63 + 1;
              } while (uVar38 != uVar63);
            }
            iVar55 = iVar55 + 1;
          } while (iVar55 != iVar39);
          return;
        }
        break;
      case GGML_TYPE_F32:
        goto switchD_001278e8_caseD_6;
      default:
        goto switchD_001271cd_caseD_17;
      }
      goto LAB_0012f2a4;
    }
    pgVar66 = tensor->src1;
    uVar38 = pgVar98->ne[0];
    if (((((uVar38 != pgVar66->ne[0]) || (iVar41 = pgVar98->ne[1], iVar41 != pgVar66->ne[1])) ||
         (iVar71 = pgVar98->ne[2], iVar71 != pgVar66->ne[2])) ||
        ((iVar48 = pgVar98->ne[3], iVar48 != pgVar66->ne[3] || (uVar38 != tensor->ne[0])))) ||
       ((iVar41 != tensor->ne[1] || ((iVar71 != tensor->ne[2] || (iVar48 != tensor->ne[3])))))) {
LAB_0012f1c8:
      ggml_compute_forward_cold_147();
switchD_001278e8_caseD_0:
      ggml_compute_forward_cold_56();
switchD_00127288_caseD_0:
      ggml_compute_forward_cold_12();
      goto switchD_001275d0_caseD_0;
    }
    if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
      return;
    }
    if (tensor->nb[0] == 4) {
      if (pgVar98->nb[0] == 4) {
        iVar53 = params->ith;
        lVar95 = (long)iVar53;
        iVar39 = params->nth;
        lVar81 = (long)iVar39;
        iVar48 = iVar71 * iVar41 * iVar48;
        sVar6 = pgVar98->nb[1];
        sVar4 = pgVar66->nb[0];
        sVar5 = pgVar66->nb[1];
        sVar1 = tensor->nb[1];
        if (sVar4 != 4) {
          if (iVar48 <= iVar53) {
            return;
          }
          pvVar61 = (void *)(sVar1 * lVar95 + (long)tensor->data);
          pvVar74 = (void *)(sVar6 * lVar95 + (long)pgVar98->data);
          lVar93 = sVar5 * lVar95;
          do {
            if (0 < (int)uVar38) {
              pfVar86 = (float *)((long)pgVar66->data + lVar93);
              uVar99 = 0;
              do {
                *(float *)((long)pvVar61 + uVar99 * 4) =
                     *(float *)((long)pvVar74 + uVar99 * 4) + *pfVar86;
                uVar99 = uVar99 + 1;
                pfVar86 = (float *)((long)pfVar86 + sVar4);
              } while (uVar38 != uVar99);
            }
            lVar95 = lVar95 + lVar81;
            pvVar61 = (void *)((long)pvVar61 + sVar1 * lVar81);
            pvVar74 = (void *)((long)pvVar74 + sVar6 * lVar81);
            lVar93 = lVar93 + sVar5 * lVar81;
          } while (lVar95 < iVar48);
          return;
        }
        iVar71 = (iVar48 / iVar39) * iVar53;
        iVar41 = (iVar53 + 1) * (iVar48 / iVar39);
        if (iVar53 == iVar39 + -1) {
          iVar41 = iVar48;
        }
        if (iVar41 <= iVar71) {
          return;
        }
        lVar95 = (long)iVar71;
        pvVar61 = (void *)(sVar1 * lVar95 + (long)tensor->data);
        pvVar74 = (void *)(sVar5 * lVar95 + (long)pgVar66->data);
        pvVar73 = (void *)(sVar6 * lVar95 + (long)pgVar98->data);
        do {
          if (0 < (int)uVar38) {
            uVar99 = 0;
            do {
              *(float *)((long)pvVar61 + uVar99 * 4) =
                   *(float *)((long)pvVar73 + uVar99 * 4) + *(float *)((long)pvVar74 + uVar99 * 4);
              uVar99 = uVar99 + 1;
            } while (uVar38 != uVar99);
          }
          lVar95 = lVar95 + 1;
          pvVar61 = (void *)((long)pvVar61 + sVar1);
          pvVar74 = (void *)((long)pvVar74 + sVar5);
          pvVar73 = (void *)((long)pvVar73 + sVar6);
        } while (lVar95 != iVar41);
        return;
      }
      goto LAB_0012f439;
    }
    goto LAB_0012f434;
  case GGML_OP_NEG:
switchD_001271cd_caseD_d:
    pgVar66 = tensor->src0;
    gVar44 = pgVar66->type;
    if (gVar44 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar38 = pgVar66->ne[2] * pgVar66->ne[1] * pgVar66->ne[3];
      if ((int)uVar38 < 1) {
        return;
      }
      uVar40 = pgVar66->ne[0];
      sVar6 = tensor->nb[1];
      pvVar61 = tensor->data;
      pvVar74 = pgVar66->data;
      sVar4 = pgVar66->nb[1];
      uVar99 = 0;
      do {
        if (0 < (int)uVar40) {
          uVar63 = 0;
          do {
            *(uint *)((long)pvVar61 + uVar63 * 4) =
                 *(uint *)((long)pvVar74 + uVar63 * 4) ^ 0x80000000;
            uVar63 = uVar63 + 1;
          } while (uVar40 != uVar63);
        }
        uVar99 = uVar99 + 1;
        pvVar61 = (void *)((long)pvVar61 + sVar6);
        pvVar74 = (void *)((long)pvVar74 + sVar4);
      } while (uVar99 != uVar38);
      return;
    }
    if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_135();
  case GGML_OP_ROPE:
    pgVar98 = tensor->src0;
    if (GGML_TYPE_COUNT < pgVar98->type) {
      return;
    }
    switch(pgVar98->type) {
    default:
      goto switchD_00127288_caseD_0;
    case GGML_TYPE_F16:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (iVar41 = pgVar98->ne[3], 0 < (long)iVar41)) {
        iVar71 = pgVar98->ne[2];
        uVar38 = pgVar98->ne[1];
        sVar6 = pgVar98->nb[3];
        lVar95 = (long)(int)pgVar98->nb[2];
        sVar4 = pgVar98->nb[1];
        piVar7 = (int *)tensor->src1->data;
        iVar48 = piVar7[1];
        iVar53 = piVar7[2];
        iVar39 = iVar53;
        if (iVar53 != 0) {
          iVar39 = *piVar7;
        }
        local_388 = 0;
        iVar54 = *piVar7;
        if (iVar53 != 0) {
          iVar54 = 0;
        }
        sVar5 = pgVar98->nb[0];
        lVar81 = iVar39 * lVar95 + 2;
        do {
          local_2e0 = (long)iVar39;
          local_398 = lVar81;
          if (iVar39 < iVar71) {
            do {
              if (0 < (int)uVar38) {
                local_3c8 = local_398;
                uVar99 = 0;
                do {
                  if (0 < iVar48) {
                    iVar53 = 0;
                    lVar88 = 0;
                    lVar93 = local_3c8;
                    do {
                      dVar194 = pow(10000.0,(double)iVar53 / (double)iVar48);
                      dVar194 = dVar194 * (double)(iVar54 + (int)local_2e0);
                      dVar102 = cos(dVar194);
                      auVar224._0_8_ = sin(dVar194);
                      auVar224._8_56_ = extraout_var;
                      auVar118._0_8_ =
                           (double)table_f32_f16[*(ushort *)((long)pgVar98->data + lVar93 + -2)];
                      auVar118._8_8_ = in_ZMM5._8_8_;
                      auVar178._8_8_ = 0;
                      auVar178._0_8_ = dVar102;
                      auVar170._8_8_ = 0;
                      auVar170._0_8_ =
                           auVar224._0_8_ *
                           (double)table_f32_f16[*(ushort *)((long)pgVar98->data + lVar93)];
                      auVar107 = vfmsub231sd_fma(auVar170,auVar118,auVar178);
                      auVar171._0_4_ = (float)auVar107._0_8_;
                      auVar171._4_12_ = auVar107._4_12_;
                      auVar107 = vcvtps2ph_f16c(auVar171,0);
                      vpextrw_avx(auVar107,0);
                      auVar156._8_8_ = 0;
                      auVar156._0_8_ =
                           dVar102 * (double)table_f32_f16
                                             [*(ushort *)((long)pgVar98->data + lVar93)];
                      auVar107 = vfmadd231sd_fma(auVar156,auVar118,auVar224._0_16_);
                      auVar157._0_4_ = (float)auVar107._0_8_;
                      auVar157._4_12_ = auVar107._4_12_;
                      auVar107 = vcvtps2ph_f16c(auVar157,0);
                      vpextrw_avx(auVar107,0);
                      lVar88 = lVar88 + 2;
                      lVar93 = lVar93 + (long)(int)sVar5 * 2;
                      iVar53 = iVar53 + -2;
                    } while (lVar88 < iVar48);
                  }
                  uVar99 = uVar99 + 1;
                  local_3c8 = local_3c8 + (int)sVar4;
                } while (uVar99 != uVar38);
              }
              lVar93 = local_2e0 + 1;
              local_398 = local_398 + lVar95;
              local_2e0 = lVar93;
            } while (lVar93 != iVar71);
          }
          local_388 = local_388 + 1;
          lVar81 = lVar81 + (int)sVar6;
        } while (local_388 != (long)iVar41);
      }
      break;
    case GGML_TYPE_F32:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (iVar41 = pgVar98->ne[3], 0 < (long)iVar41)) {
        iVar71 = pgVar98->ne[2];
        uVar38 = pgVar98->ne[1];
        sVar6 = pgVar98->nb[3];
        lVar95 = (long)(int)pgVar98->nb[2];
        sVar4 = pgVar98->nb[1];
        sVar5 = pgVar98->nb[0];
        piVar7 = (int *)tensor->src1->data;
        iVar48 = piVar7[1];
        iVar53 = piVar7[2];
        iVar39 = iVar53;
        if (iVar53 != 0) {
          iVar39 = *piVar7;
        }
        local_388 = 0;
        iVar54 = *piVar7;
        if (iVar53 != 0) {
          iVar54 = 0;
        }
        lVar81 = iVar39 * lVar95 + 4;
        do {
          local_2e0 = (long)iVar39;
          local_398 = lVar81;
          if (iVar39 < iVar71) {
            do {
              if (0 < (int)uVar38) {
                local_3c8 = local_398;
                uVar99 = 0;
                do {
                  if (0 < iVar48) {
                    iVar53 = 0;
                    lVar88 = 0;
                    lVar93 = local_3c8;
                    do {
                      dVar194 = pow(10000.0,(double)iVar53 / (double)iVar48);
                      dVar194 = dVar194 * (double)(iVar54 + (int)local_2e0);
                      dVar102 = cos(dVar194);
                      auVar205._0_8_ = sin(dVar194);
                      auVar205._8_56_ = extraout_var_00;
                      pvVar61 = tensor->data;
                      auVar121._0_8_ = (double)*(float *)((long)pgVar98->data + lVar93 + -4);
                      auVar121._8_8_ = in_ZMM5._8_8_;
                      dVar194 = (double)*(float *)((long)pgVar98->data + lVar93);
                      auVar179._8_8_ = 0;
                      auVar179._0_8_ = dVar102;
                      auVar172._8_8_ = 0;
                      auVar172._0_8_ = auVar205._0_8_ * dVar194;
                      auVar107 = vfmsub231sd_fma(auVar172,auVar121,auVar179);
                      *(float *)((long)pvVar61 + lVar93 + -4) = (float)auVar107._0_8_;
                      auVar160._8_8_ = 0;
                      auVar160._0_8_ = dVar102 * dVar194;
                      auVar107 = vfmadd231sd_fma(auVar160,auVar121,auVar205._0_16_);
                      *(float *)((long)pvVar61 + lVar93) = (float)auVar107._0_8_;
                      lVar88 = lVar88 + 2;
                      lVar93 = lVar93 + (long)(int)sVar5 * 2;
                      iVar53 = iVar53 + -2;
                    } while (lVar88 < iVar48);
                  }
                  uVar99 = uVar99 + 1;
                  local_3c8 = local_3c8 + (int)sVar4;
                } while (uVar99 != uVar38);
              }
              lVar93 = local_2e0 + 1;
              local_398 = local_398 + lVar95;
              local_2e0 = lVar93;
            } while (lVar93 != iVar71);
          }
          local_388 = local_388 + 1;
          lVar81 = lVar81 + (int)sVar6;
        } while (local_388 != (long)iVar41);
      }
    }
    break;
  case GGML_OP_STEP:
    goto switchD_001271cd_caseD_e;
  case GGML_OP_RELU:
    goto switchD_001271cd_caseD_f;
  case GGML_OP_GELU:
    goto switchD_001271cd_caseD_10;
  case GGML_OP_SILU:
    goto switchD_001271cd_caseD_11;
  case GGML_OP_NORM:
    pgVar98 = tensor->src0;
    gVar44 = pgVar98->type;
    if (gVar44 != GGML_TYPE_F32) {
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_122();
      goto switchD_001271cd_caseD_15;
    }
    uVar38 = pgVar98->ne[0];
    if (uVar38 != tensor->ne[0]) goto LAB_0012f1e6;
    iVar41 = pgVar98->ne[1];
    pgVar66 = (ggml_tensor *)(long)iVar41;
    if (iVar41 != tensor->ne[1]) goto LAB_0012f1e6;
    uVar40 = pgVar98->ne[2];
    if (uVar40 != tensor->ne[2]) goto LAB_0012f1e6;
    uVar70 = pgVar98->ne[3];
    if (uVar70 != tensor->ne[3]) goto LAB_0012f1e6;
    if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
      return;
    }
    if (pgVar98->nb[0] == 4) {
      if ((int)uVar70 < 1) {
        return;
      }
      sVar6 = pgVar98->nb[1];
      sVar4 = pgVar98->nb[2];
      sVar5 = pgVar98->nb[3];
      sVar1 = tensor->nb[1];
      sVar2 = tensor->nb[2];
      lVar93 = (long)params->nth;
      iVar71 = params->ith;
      lVar81 = (long)iVar71;
      uVar83 = uVar38 & 0xffffffe0;
      lVar88 = (long)(int)uVar83;
      lVar95 = (long)(int)uVar38;
      if ((long)(int)uVar38 < lVar88 + 1) {
        lVar95 = lVar88 + 1;
      }
      lVar97 = (lVar95 - lVar88) + -1;
      auVar113._8_8_ = lVar97;
      auVar113._0_8_ = lVar97;
      auVar113._16_8_ = lVar97;
      auVar113._24_8_ = lVar97;
      local_350 = sVar6 * lVar81;
      local_360 = sVar1 * lVar81;
      auVar163 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar152 = ZEXT3264(auVar163);
      auVar163 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar205 = ZEXT3264(auVar163);
      auVar207._8_8_ = 0x8000000000000000;
      auVar207._0_8_ = 0x8000000000000000;
      auVar207._16_8_ = 0x8000000000000000;
      auVar207._24_8_ = 0x8000000000000000;
      auVar163 = vpcmpeqd_avx2(in_ZMM12._0_32_,in_ZMM12._0_32_);
      auVar224 = ZEXT3264(auVar163);
      sVar3 = tensor->nb[3];
      local_318 = 0;
      do {
        if (0 < (int)uVar40) {
          lVar97 = local_318 * sVar3;
          local_380 = local_360;
          local_370 = local_350;
          local_388 = 0;
          do {
            if (iVar71 < iVar41) {
              lVar92 = local_388 * sVar2;
              uVar99 = local_370;
              lVar51 = local_380;
              lVar60 = lVar81;
              do {
                if ((int)uVar38 < 1) {
                  lVar45 = (long)tensor->data + lVar92 + lVar97 + lVar60 * sVar1;
                  auVar150 = ZEXT864(0) << 0x40;
                }
                else {
                  pvVar61 = pgVar98->data;
                  dVar194 = 0.0;
                  uVar63 = 0;
                  do {
                    dVar194 = dVar194 + (double)*(float *)((long)pvVar61 + uVar63 * 4 + uVar99);
                    uVar63 = uVar63 + 1;
                  } while (uVar38 != uVar63);
                  pvVar74 = tensor->data;
                  lVar45 = lVar60 * sVar1 + lVar92 + lVar97 + (long)pvVar74;
                  auVar150 = ZEXT1664(ZEXT816(0));
                  uVar63 = 0;
                  do {
                    dVar102 = (double)*(float *)((long)pvVar61 + uVar63 * 4 + uVar99) -
                              dVar194 / (double)(int)uVar38;
                    *(float *)((long)pvVar74 + uVar63 * 4 + lVar51) = (float)dVar102;
                    auVar158._8_8_ = 0;
                    auVar158._0_8_ = dVar102;
                    auVar107 = vfmadd231sd_fma(auVar150._0_16_,auVar158,auVar158);
                    auVar150 = ZEXT1664(auVar107);
                    uVar63 = uVar63 + 1;
                  } while (uVar38 != uVar63);
                }
                dVar194 = auVar150._0_8_ / (double)(int)uVar38 + 9.999999747378752e-06;
                auVar104._8_8_ = 0;
                auVar104._0_8_ = dVar194;
                if (dVar194 < 0.0) {
                  auVar150 = ZEXT1664(auVar150._0_16_);
                  auVar163 = ZEXT1632(auVar224._0_16_);
                  dVar194 = sqrt(dVar194);
                  auVar163 = vpcmpeqd_avx2(auVar163,auVar163);
                  auVar224 = ZEXT3264(auVar163);
                  auVar163 = vpmovsxbq_avx2(ZEXT416(0x7060504));
                  auVar205 = ZEXT3264(auVar163);
                  auVar163 = vpmovsxbq_avx2(ZEXT416(0x3020100));
                  auVar152 = ZEXT3264(auVar163);
                }
                else {
                  auVar107 = vsqrtsd_avx(auVar104,auVar104);
                  dVar194 = auVar107._0_8_;
                }
                fVar101 = (float)(1.0 / dVar194);
                if (0 < (int)uVar83) {
                  uVar63 = 0;
                  lVar59 = lVar45;
                  do {
                    lVar58 = 0;
                    do {
                      pfVar86 = (float *)(lVar59 + lVar58);
                      auVar151._0_4_ = fVar101 * *pfVar86;
                      auVar151._4_4_ = fVar101 * pfVar86[1];
                      auVar151._8_4_ = fVar101 * pfVar86[2];
                      auVar151._12_4_ = fVar101 * pfVar86[3];
                      auVar151._16_4_ = fVar101 * pfVar86[4];
                      auVar151._20_4_ = fVar101 * pfVar86[5];
                      auVar151._28_36_ = auVar150._28_36_;
                      auVar151._24_4_ = fVar101 * pfVar86[6];
                      auVar150 = ZEXT3264(auVar151._0_32_);
                      *(undefined1 (*) [32])(lVar59 + lVar58) = auVar151._0_32_;
                      lVar58 = lVar58 + 0x20;
                    } while (lVar58 != 0x80);
                    uVar63 = uVar63 + 0x20;
                    lVar59 = lVar59 + 0x80;
                  } while (uVar63 < uVar83);
                }
                if (uVar83 != uVar38) {
                  lVar45 = lVar45 + lVar88 * 4;
                  uVar63 = 0;
                  do {
                    auVar134._8_8_ = uVar63;
                    auVar134._0_8_ = uVar63;
                    auVar134._16_8_ = uVar63;
                    auVar134._24_8_ = uVar63;
                    auVar135 = vpor_avx2(auVar152._0_32_,auVar134);
                    auVar163 = vpor_avx2(auVar205._0_32_,auVar134);
                    auVar163 = vpcmpgtq_avx2(auVar207 ^ auVar163,auVar207 ^ auVar113);
                    auVar135 = vpcmpgtq_avx2(auVar207 ^ auVar135,auVar207 ^ auVar113);
                    auVar163 = vpackssdw_avx2(auVar135,auVar163);
                    auVar163 = auVar224._0_32_ ^ auVar163;
                    auVar107 = vpackssdw_avx(auVar163._0_16_,auVar163._16_16_);
                    auVar107 = vpshufd_avx(auVar107,0xd8);
                    auVar163 = vpmovzxwd_avx2(auVar107);
                    auVar135 = vpslld_avx2(auVar163,0x1f);
                    auVar163 = vmaskmovps_avx(auVar135,*(undefined1 (*) [32])(lVar45 + uVar63 * 4));
                    auVar8._4_4_ = auVar163._4_4_ * fVar101;
                    auVar8._0_4_ = auVar163._0_4_ * fVar101;
                    auVar8._8_4_ = auVar163._8_4_ * fVar101;
                    auVar8._12_4_ = auVar163._12_4_ * fVar101;
                    auVar8._16_4_ = auVar163._16_4_ * fVar101;
                    auVar8._20_4_ = auVar163._20_4_ * fVar101;
                    auVar8._24_4_ = auVar163._24_4_ * fVar101;
                    auVar8._28_4_ = auVar163._28_4_;
                    auVar163 = vmaskmovps_avx(auVar135,auVar8);
                    *(undefined1 (*) [32])(lVar45 + uVar63 * 4) = auVar163;
                    uVar63 = uVar63 + 8;
                  } while (((lVar95 - lVar88) + 7U & 0xfffffffffffffff8) != uVar63);
                }
                lVar60 = lVar60 + lVar93;
                uVar99 = uVar99 + sVar6 * lVar93;
                lVar51 = lVar51 + sVar1 * lVar93;
              } while (lVar60 < (long)pgVar66);
            }
            local_388 = local_388 + 1;
            local_370 = local_370 + sVar4;
            local_380 = local_380 + sVar2;
          } while (local_388 != uVar40);
        }
        local_318 = local_318 + 1;
        local_350 = local_350 + sVar5;
        local_360 = local_360 + sVar3;
      } while (local_318 != uVar70);
      return;
    }
    goto LAB_0012f42a;
  case GGML_OP_MUL_MAT:
    goto switchD_001271cd_caseD_14;
  case GGML_OP_SCALE:
switchD_001271cd_caseD_15:
    pgVar66 = tensor->src0;
    gVar44 = pgVar66->type;
    if (gVar44 != GGML_TYPE_F32) {
      if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
        return;
      }
      ggml_compute_forward_cold_78();
      goto switchD_001271cd_caseD_d;
    }
    if (pgVar66->nb[0] != 4) goto LAB_0012f1eb;
    uVar38 = pgVar66->ne[0];
    lVar95 = (long)(int)uVar38;
    if (pgVar66->nb[1] != lVar95 * 4) goto LAB_0012f1eb;
    iVar41 = pgVar66->ne[1];
    if ((pgVar66->nb[2] != pgVar66->nb[1] * (long)iVar41) ||
       (iVar71 = pgVar66->ne[2], pgVar66->nb[3] != pgVar66->nb[2] * (long)iVar71))
    goto LAB_0012f1eb;
    if (tensor->nb[0] != GGML_TYPE_SIZE[tensor->type]) goto LAB_0012f1f0;
    if (tensor->nb[1] !=
        (tensor->nb[0] * (long)tensor->ne[0]) / (ulong)(long)GGML_BLCK_SIZE[tensor->type])
    goto LAB_0012f1f0;
    if ((tensor->nb[2] != tensor->nb[1] * (long)tensor->ne[1]) ||
       (tensor->nb[3] != tensor->nb[2] * (long)tensor->ne[2])) goto LAB_0012f1f0;
    if ((uVar38 == tensor->ne[0]) &&
       (((iVar41 == tensor->ne[1] && (iVar71 == tensor->ne[2])) && (pgVar66->ne[3] == tensor->ne[3])
        ))) {
      pgVar98 = tensor->src1;
      if ((((pgVar98->ne[0] == 1) && (pgVar98->ne[1] == 1)) && (pgVar98->ne[2] == 1)) &&
         (pgVar98->ne[3] == 1)) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        iVar71 = iVar71 * iVar41 * pgVar66->ne[3];
        iVar41 = (iVar71 + params->nth + -1) / params->nth;
        lVar81 = (long)params->ith * (long)iVar41;
        iVar41 = iVar41 + (int)lVar81;
        if (iVar71 <= iVar41) {
          iVar41 = iVar71;
        }
        if (iVar41 <= (int)lVar81) {
          return;
        }
        fVar101 = *pgVar98->data;
        uVar40 = uVar38 & 0xffffffe0;
        lVar93 = (long)(int)uVar40;
        if (lVar95 < lVar93 + 1) {
          lVar95 = lVar93 + 1;
        }
        lVar88 = (lVar95 - lVar93) + -1;
        auVar192._8_8_ = lVar88;
        auVar192._0_8_ = lVar88;
        auVar192._16_8_ = lVar88;
        auVar192._24_8_ = lVar88;
        auVar135 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar164 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar200._8_8_ = 0x8000000000000000;
        auVar200._0_8_ = 0x8000000000000000;
        auVar200._16_8_ = 0x8000000000000000;
        auVar200._24_8_ = 0x8000000000000000;
        auVar163 = vpcmpeqd_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
        do {
          sVar6 = tensor->nb[1];
          pvVar61 = tensor->data;
          if (0 < (int)uVar40) {
            pvVar74 = (void *)(sVar6 * lVar81 + (long)pvVar61);
            uVar99 = 0;
            do {
              lVar88 = 0;
              do {
                pfVar86 = (float *)((long)pvVar74 + lVar88);
                auVar152._0_4_ = fVar101 * *pfVar86;
                auVar152._4_4_ = fVar101 * pfVar86[1];
                auVar152._8_4_ = fVar101 * pfVar86[2];
                auVar152._12_4_ = fVar101 * pfVar86[3];
                auVar152._16_4_ = fVar101 * pfVar86[4];
                auVar152._20_4_ = fVar101 * pfVar86[5];
                auVar152._28_36_ = in_ZMM6._28_36_;
                auVar152._24_4_ = fVar101 * pfVar86[6];
                in_ZMM6 = ZEXT3264(auVar152._0_32_);
                *(undefined1 (*) [32])((long)pvVar74 + lVar88) = auVar152._0_32_;
                lVar88 = lVar88 + 0x20;
              } while (lVar88 != 0x80);
              uVar99 = uVar99 + 0x20;
              pvVar74 = (void *)((long)pvVar74 + 0x80);
            } while (uVar99 < uVar40);
          }
          if (uVar40 != uVar38) {
            lVar88 = sVar6 * lVar81 + lVar93 * 4;
            uVar99 = 0;
            do {
              auVar190._8_8_ = uVar99;
              auVar190._0_8_ = uVar99;
              auVar190._16_8_ = uVar99;
              auVar190._24_8_ = uVar99;
              auVar220 = vpor_avx2(auVar190,auVar135);
              auVar165 = vpor_avx2(auVar190,auVar164);
              auVar165 = vpcmpgtq_avx2(auVar165 ^ auVar200,auVar192 ^ auVar200);
              auVar220 = vpcmpgtq_avx2(auVar220 ^ auVar200,auVar192 ^ auVar200);
              auVar165 = vpackssdw_avx2(auVar220,auVar165);
              auVar107 = vpackssdw_avx(SUB3216(auVar165 ^ auVar163,0),
                                       SUB3216(auVar165 ^ auVar163,0x10));
              auVar107 = vpshufd_avx(auVar107,0xd8);
              auVar165 = vpmovzxwd_avx2(auVar107);
              auVar190 = vpslld_avx2(auVar165,0x1f);
              in_ZMM6 = ZEXT3264(auVar190);
              auVar165 = vmaskmovps_avx(auVar190,*(undefined1 (*) [32])
                                                  ((long)pvVar61 + uVar99 * 4 + lVar88));
              auVar220._4_4_ = fVar101 * auVar165._4_4_;
              auVar220._0_4_ = fVar101 * auVar165._0_4_;
              auVar220._8_4_ = fVar101 * auVar165._8_4_;
              auVar220._12_4_ = fVar101 * auVar165._12_4_;
              auVar220._16_4_ = fVar101 * auVar165._16_4_;
              auVar220._20_4_ = fVar101 * auVar165._20_4_;
              auVar220._24_4_ = fVar101 * auVar165._24_4_;
              auVar220._28_4_ = auVar165._28_4_;
              auVar165 = vmaskmovps_avx(auVar190,auVar220);
              *(undefined1 (*) [32])((long)pvVar61 + uVar99 * 4 + lVar88) = auVar165;
              uVar99 = uVar99 + 8;
            } while (((lVar95 - lVar93) + 7U & 0xfffffffffffffff8) != uVar99);
          }
          lVar81 = lVar81 + 1;
        } while (lVar81 != iVar41);
        return;
      }
      goto LAB_0012f1f5;
    }
    goto LAB_0012f222;
  case GGML_OP_GET_ROWS:
    pgVar98 = tensor->src0;
    if (GGML_TYPE_COUNT < pgVar98->type) {
      return;
    }
    pgVar78 = tensor->src1;
    switch(pgVar98->type) {
    case GGML_TYPE_Q4_0:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (uVar38 = pgVar78->ne[1] * pgVar78->ne[0] * pgVar78->ne[2] * pgVar78->ne[3],
         0 < (int)uVar38)) {
        iVar41 = pgVar98->ne[0];
        uVar99 = 0;
        do {
          dequantize_row_q4_0((void *)((long)*(int *)((long)pgVar78->data + uVar99 * 4) *
                                       pgVar98->nb[1] + (long)pgVar98->data),
                              (float *)(tensor->nb[1] * uVar99 + (long)tensor->data),iVar41);
          uVar99 = uVar99 + 1;
        } while (uVar38 != uVar99);
      }
      break;
    case GGML_TYPE_Q4_1:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (uVar38 = pgVar78->ne[1] * pgVar78->ne[0] * pgVar78->ne[2] * pgVar78->ne[3],
         0 < (int)uVar38)) {
        iVar41 = pgVar98->ne[0];
        uVar99 = 0;
        do {
          dequantize_row_q4_1((void *)((long)*(int *)((long)pgVar78->data + uVar99 * 4) *
                                       pgVar98->nb[1] + (long)pgVar98->data),
                              (float *)(tensor->nb[1] * uVar99 + (long)tensor->data),iVar41);
          uVar99 = uVar99 + 1;
        } while (uVar38 != uVar99);
      }
      break;
    default:
      goto switchD_001277d9_caseD_2;
    case GGML_TYPE_F16:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (uVar38 = pgVar78->ne[1] * pgVar78->ne[0] * pgVar78->ne[2] * pgVar78->ne[3],
         0 < (int)uVar38)) {
        uVar40 = pgVar98->ne[0];
        pvVar61 = pgVar78->data;
        uVar99 = 0;
        do {
          if (0 < (int)uVar40) {
            iVar41 = *(int *)((long)pvVar61 + uVar99 * 4);
            sVar6 = pgVar98->nb[1];
            pvVar74 = pgVar98->data;
            sVar4 = tensor->nb[1];
            pvVar73 = tensor->data;
            uVar63 = 0;
            do {
              *(float *)((long)pvVar73 + uVar63 * 4 + sVar4 * uVar99) =
                   table_f32_f16[*(ushort *)((long)pvVar74 + uVar63 * 2 + (long)iVar41 * sVar6)];
              uVar63 = uVar63 + 1;
            } while (uVar40 != uVar63);
          }
          uVar99 = uVar99 + 1;
        } while (uVar99 != uVar38);
      }
      break;
    case GGML_TYPE_F32:
      if (((params->type & ~GGML_TASK_FINALIZE) != GGML_TASK_INIT) &&
         (uVar38 = pgVar78->ne[1] * pgVar78->ne[0] * pgVar78->ne[2] * pgVar78->ne[3],
         0 < (int)uVar38)) {
        uVar40 = pgVar98->ne[0];
        pvVar61 = pgVar78->data;
        sVar6 = tensor->nb[1];
        pvVar74 = tensor->data;
        pvVar73 = pgVar98->data;
        sVar4 = pgVar98->nb[1];
        uVar99 = 0;
        do {
          if (0 < (int)uVar40) {
            iVar41 = *(int *)((long)pvVar61 + uVar99 * 4);
            uVar63 = 0;
            do {
              *(undefined4 *)((long)pvVar74 + uVar63 * 4) =
                   *(undefined4 *)((long)pvVar73 + uVar63 * 4 + (long)iVar41 * sVar4);
              uVar63 = uVar63 + 1;
            } while (uVar40 != uVar63);
          }
          uVar99 = uVar99 + 1;
          pvVar74 = (void *)((long)pvVar74 + sVar6);
        } while (uVar99 != uVar38);
      }
    }
    break;
  case GGML_OP_DIAG_MASK_INF:
    pgVar66 = tensor->src0;
    gVar44 = pgVar66->type;
    if (gVar44 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar38 = pgVar66->ne[1];
      uVar99 = (long)(int)(pgVar66->ne[2] * uVar38 * pgVar66->ne[3]) / (long)(int)uVar38;
      if ((int)uVar99 < 1) {
        return;
      }
      iVar41 = pgVar66->ne[0];
      iVar71 = *tensor->src1->data;
      uVar63 = 0;
      do {
        if (0 < (int)uVar38) {
          uVar52 = 0;
          do {
            if (iVar71 < iVar41) {
              lVar95 = (long)iVar71;
              do {
                if ((long)(uVar52 + (long)iVar71) < lVar95) {
                  *(undefined4 *)
                   ((long)tensor->data +
                   tensor->nb[0] * lVar95 + tensor->nb[1] * uVar52 + tensor->nb[2] * uVar63) =
                       0xff800000;
                }
                lVar95 = lVar95 + 1;
              } while (iVar41 != lVar95);
            }
            uVar52 = uVar52 + 1;
          } while (uVar52 != uVar38);
        }
        uVar63 = uVar63 + 1;
      } while (uVar63 != (uVar99 & 0xffffffff));
      return;
    }
    if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_17();
switchD_001271cd_caseD_a:
    pgVar66 = tensor->src0;
    gVar44 = pgVar66->type;
    if (gVar44 == GGML_TYPE_F32) {
      if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
        return;
      }
      uVar38 = pgVar66->ne[1];
      uVar99 = (long)tensor->ne[1] / (long)(int)uVar38;
      if ((int)uVar99 < 1) {
        return;
      }
      uVar40 = pgVar66->ne[0];
      uVar63 = (long)tensor->ne[0] / (long)(int)uVar40;
      uVar70 = 0;
      local_3e0 = 0;
      do {
        if (0 < (int)uVar63) {
          lVar95 = 0;
          uVar52 = 0;
          do {
            if (0 < (int)uVar38) {
              sVar6 = tensor->nb[1];
              sVar4 = pgVar66->nb[1];
              pvVar61 = pgVar66->data;
              lVar81 = uVar70 * sVar6 + tensor->nb[0] * lVar95 + (long)tensor->data;
              uVar50 = 0;
              do {
                if (0 < (int)uVar40) {
                  uVar77 = 0;
                  do {
                    *(undefined4 *)(lVar81 + uVar77 * 4) =
                         *(undefined4 *)((long)pvVar61 + uVar77 * 4);
                    uVar77 = uVar77 + 1;
                  } while (uVar40 != uVar77);
                }
                uVar50 = uVar50 + 1;
                lVar81 = lVar81 + sVar6;
                pvVar61 = (void *)((long)pvVar61 + sVar4);
              } while (uVar50 != uVar38);
            }
            uVar52 = uVar52 + 1;
            lVar95 = lVar95 + (int)uVar40;
          } while (uVar52 != (uVar63 & 0xffffffff));
        }
        local_3e0 = local_3e0 + 1;
        uVar70 = uVar70 + uVar38;
      } while (local_3e0 != (uVar99 & 0xffffffff));
      return;
    }
    if ((GGML_TYPE_F16 < gVar44) && (gVar44 != GGML_TYPE_COUNT)) {
      return;
    }
    ggml_compute_forward_cold_138();
switchD_001271cd_caseD_21:
    pgVar66 = tensor->opt[1];
    uVar38 = ggml_get_i32_1d(pgVar66,0);
    if (1 < uVar38) goto LAB_0012f21d;
    pgVar98 = tensor->src0;
    if (GGML_TYPE_COUNT < pgVar98->type) {
      return;
    }
    pgVar78 = tensor->src1;
    pgVar75 = tensor->opt[0];
    switch(pgVar98->type) {
    default:
switchD_001275d0_caseD_0:
      ggml_compute_forward_cold_31();
      params = (ggml_compute_params *)pgVar66;
switchD_001283c4_caseD_0:
      ggml_compute_forward_cold_19();
switchD_00128610_caseD_0:
      ggml_compute_forward_cold_1();
      pgVar66 = (ggml_tensor *)params;
LAB_0012f1e6:
      ggml_compute_forward_cold_123();
LAB_0012f1eb:
      ggml_compute_forward_cold_79();
LAB_0012f1f0:
      ggml_compute_forward_cold_80();
LAB_0012f1f5:
      ggml_compute_forward_cold_82();
LAB_0012f1fa:
      ggml_compute_forward_cold_120();
      goto LAB_0012f1ff;
    case GGML_TYPE_F16:
      uVar40 = pgVar98->ne[0];
      uVar99 = (ulong)(int)uVar40;
      if (tensor->ne[0] != uVar40) goto LAB_0012f2a9;
      iVar41 = pgVar98->ne[1];
      if (tensor->ne[1] != iVar41) goto LAB_0012f2ae;
      uVar70 = pgVar78->ne[1];
      lVar95 = (long)(int)uVar70;
      local_f0 = (ulong)(uVar70 - iVar41);
      if ((int)(uVar70 - iVar41) < 0) goto LAB_0012f2b3;
      if ((int)pgVar98->nb[0] != 2) goto LAB_0012f2b8;
      if ((int)pgVar78->nb[0] != 2) goto LAB_0012f2bd;
      if ((int)pgVar75->nb[0] != 2) goto LAB_0012f2c2;
      if (pgVar78->ne[0] != uVar40) goto LAB_0012f2c7;
      if (pgVar75->ne[1] != uVar40) goto LAB_0012f2cc;
      if ((int)tensor->nb[0] != 4) goto LAB_0012f2d1;
      iVar71 = (int)tensor->nb[1];
      if (iVar71 < 4) goto LAB_0012f2d6;
      uVar83 = (uint)tensor->nb[2];
      pgVar66 = (ggml_tensor *)(ulong)uVar83;
      if ((int)uVar83 < iVar71) goto LAB_0012f2db;
      local_20c = (int)tensor->nb[3];
      local_208 = uVar83;
      local_204 = iVar71;
      if ((int)uVar83 <= local_20c) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        sVar6 = pgVar78->nb[1];
        local_210 = (int)pgVar78->nb[2];
        local_214 = (int)pgVar78->nb[3];
        local_218 = (int)pgVar98->nb[1];
        local_21c = (int)pgVar98->nb[2];
        local_220 = (int)pgVar98->nb[3];
        sVar4 = pgVar75->nb[1];
        local_224 = (int)pgVar75->nb[2];
        iVar53 = pgVar98->ne[2] * iVar41;
        iVar39 = pgVar98->ne[3] * iVar53;
        local_228 = (int)pgVar75->nb[3];
        iVar71 = params->ith;
        iVar48 = (iVar39 + params->nth + -1) / params->nth;
        iVar54 = iVar48 * iVar71;
        iVar48 = iVar48 + iVar54;
        if (iVar39 <= iVar48) {
          iVar48 = iVar39;
        }
        auVar103._0_8_ = (double)(int)uVar40;
        auVar103._8_8_ = in_XMM0_Qa;
        if (auVar103._0_8_ < 0.0) {
          dVar194 = sqrt(auVar103._0_8_);
        }
        else {
          auVar107 = vsqrtsd_avx(auVar103,auVar103);
          dVar194 = auVar107._0_8_;
        }
        if (iVar48 <= iVar54) {
          return;
        }
        uVar43 = uVar70 + 3 & 0xfffffffc;
        local_f8 = &local_180;
        local_a0._0_8_ = local_160;
        local_100 = ((long)(int)(uVar43 * 2) + 0x10) * (long)iVar71;
        uVar83 = uVar40 & 0xffffffe0;
        uVar52 = (ulong)uVar70;
        uVar56 = uVar70 & 0xffffffe0;
        uVar63 = (ulong)uVar56;
        lVar93 = (long)(int)uVar56;
        lVar81 = lVar93 + 1;
        if (lVar93 + 1 <= lVar95) {
          lVar81 = lVar95;
        }
        uVar76 = (uVar70 - iVar41) + 1;
        if ((int)uVar76 < (int)uVar70) {
          uVar76 = uVar70;
        }
        uVar76 = ~uVar70 + iVar41 + uVar76;
        local_b0 = (long)(int)uVar43;
        lVar97 = (local_b0 - lVar95) + -1;
        lVar88 = (lVar81 - lVar93) + -1;
        auVar111._0_4_ = (float)(1.0 / dVar194);
        auVar111._4_4_ = auVar111._0_4_;
        auVar111._8_4_ = auVar111._0_4_;
        auVar111._12_4_ = auVar111._0_4_;
        local_b8 = (local_b0 - lVar95) + 7U & 0xfffffffffffffff8;
        auVar187._8_8_ = lVar97;
        auVar187._0_8_ = lVar97;
        auVar187._16_8_ = lVar97;
        auVar187._24_8_ = lVar97;
        auVar226._8_8_ = lVar88;
        auVar226._0_8_ = lVar88;
        auVar226._16_8_ = lVar88;
        auVar226._24_8_ = lVar88;
        uVar91 = (undefined4)local_f0;
        auVar140._4_4_ = uVar91;
        auVar140._0_4_ = uVar91;
        auVar140._8_4_ = uVar91;
        auVar140._12_4_ = uVar91;
        auVar140._16_4_ = uVar91;
        auVar140._20_4_ = uVar91;
        auVar140._24_4_ = uVar91;
        auVar140._28_4_ = uVar91;
        local_80 = vpaddd_avx2(auVar140,_DAT_00135260);
        local_c0 = CONCAT44(0,uVar76) + 8 & 0xfffffffffffffff8;
        auVar203._8_4_ = uVar76;
        auVar203._0_8_ = CONCAT44(0,uVar76);
        auVar203._12_4_ = 0;
        auVar203._16_4_ = uVar76;
        auVar203._20_4_ = 0;
        auVar203._24_4_ = uVar76;
        auVar203._28_4_ = 0;
        local_c8 = lVar95 * 4 + local_100 * 4;
        local_e8 = lVar93 * 4 + local_100 * 4;
        local_a8 = (lVar81 - lVar93) + 7U & 0xfffffffffffffff8;
        local_d0 = (local_f0 & 0xffffffff) * 4 + local_100 * 4;
        local_238 = local_b0 * 4 + local_100 * 4;
        auVar135 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar177._8_8_ = 0x8000000000000000;
        auVar177._0_8_ = 0x8000000000000000;
        auVar177._16_8_ = 0x8000000000000000;
        auVar177._24_8_ = 0x8000000000000000;
        auVar165 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar193._8_4_ = 0xff800000;
        auVar193._0_8_ = 0xff800000ff800000;
        auVar193._12_4_ = 0xff800000;
        auVar193._16_4_ = 0xff800000;
        auVar193._20_4_ = 0xff800000;
        auVar193._24_4_ = 0xff800000;
        auVar193._28_4_ = 0xff800000;
        auVar163 = vpcmpeqd_avx2(auVar164,auVar164);
        auVar107 = ZEXT816(0) << 0x40;
        auVar164 = vpor_avx2(auVar203,auVar177);
        auVar226 = auVar226 ^ auVar177;
        local_280 = (int)sVar6;
        local_380._0_4_ = (int)sVar4;
        local_368 = params->wdata;
        local_d8 = (long)local_280;
        local_e0 = (long)(int)local_380;
        do {
          lVar81 = local_e0;
          uVar50 = 0;
          iVar39 = iVar54 / iVar53;
          uVar77 = (ulong)(uint)((int)((long)iVar54 % (long)iVar53) >> 0x1f) << 0x20 |
                   (long)iVar54 % (long)iVar53 & 0xffffffffU;
          iVar71 = (int)((long)uVar77 / (long)iVar41);
          if ((int)uVar70 < (int)uVar43) {
            uVar62 = 0;
            do {
              auVar214._8_8_ = uVar62;
              auVar214._0_8_ = uVar62;
              auVar214._16_8_ = uVar62;
              auVar214._24_8_ = uVar62;
              auVar192 = vpor_avx2(auVar214,auVar135);
              auVar200 = vpor_avx2(auVar214,auVar165);
              auVar200 = vpcmpgtq_avx2(auVar200 ^ auVar177,auVar187 ^ auVar177);
              auVar192 = vpcmpgtq_avx2(auVar192 ^ auVar177,auVar187 ^ auVar177);
              auVar200 = vpackssdw_avx2(auVar192,auVar200);
              auVar202 = vpackssdw_avx(SUB3216(auVar200 ^ auVar163,0),
                                       SUB3216(auVar200 ^ auVar163,0x10));
              auVar202 = vpshufd_avx(auVar202,0xd8);
              auVar200 = vpmovzxwd_avx2(auVar202);
              auVar200 = vpslld_avx2(auVar200,0x1f);
              in_ZMM11 = ZEXT3264(auVar200);
              auVar200 = vmaskmovps_avx(auVar200,auVar193);
              *(undefined1 (*) [32])((long)local_368 + uVar62 * 4 + local_c8) = auVar200;
              uVar62 = uVar62 + 8;
            } while (local_b8 != uVar62);
          }
          pvVar61 = (void *)((long)local_368 + local_100 * 4);
          auVar200 = ZEXT1632(auVar107);
          iVar55 = (int)((long)uVar77 % (long)iVar41);
          if ((uVar70 & 1) == 0) {
            if (0 < (int)uVar70) {
              pvVar74 = pgVar78->data;
              iVar69 = iVar39 * local_214 + iVar71 * local_210;
              lVar97 = (long)(iVar39 * local_220 + iVar55 * local_218 + iVar71 * local_21c) +
                       (long)pgVar98->data;
              lVar88 = 0;
              do {
                uVar50 = (long)pvVar74 + iVar69 + local_d8;
                lVar51 = (long)iVar69 + (long)pvVar74;
                local_240 = 0.0;
                local_230 = 0.0;
                local_120 = ZEXT1632(auVar107);
                local_140 = ZEXT1632(auVar107);
                local_160 = ZEXT1632(auVar107);
                local_180 = local_160;
                _local_1a0 = local_160;
                _local_1c0 = local_160;
                _local_1e0 = auVar200;
                _local_200 = auVar200;
                if (0 < (int)uVar83) {
                  uVar62 = 0;
                  lVar60 = lVar97;
                  lVar92 = lVar51;
                  uVar77 = uVar50;
                  do {
                    lVar45 = 0;
                    do {
                      auVar192 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar60 + lVar45));
                      auVar220 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar92 + lVar45));
                      auVar202 = vfmadd213ps_fma(auVar220,auVar192,
                                                 *(undefined1 (*) [32])(local_200 + lVar45 * 2));
                      *(undefined1 (*) [32])(local_200 + lVar45 * 2) = ZEXT1632(auVar202);
                      auVar220 = vcvtph2ps_f16c(*(undefined1 (*) [16])(uVar77 + lVar45));
                      auVar202 = vfmadd213ps_fma(auVar220,auVar192,
                                                 *(undefined1 (*) [32])(local_180 + lVar45 * 2));
                      *(undefined1 (*) [32])(local_180 + lVar45 * 2) = ZEXT1632(auVar202);
                      lVar45 = lVar45 + 0x10;
                    } while (lVar45 != 0x40);
                    uVar62 = uVar62 + 0x20;
                    uVar77 = uVar77 + 0x40;
                    lVar92 = lVar92 + 0x40;
                    lVar60 = lVar60 + 0x40;
                  } while (uVar62 < uVar83);
                }
                pdVar68 = &local_240;
                pauVar79 = (undefined1 (*) [32])local_200;
                pfVar86 = (float *)local_1e0;
                pfVar90 = (float *)local_1a0;
                pfVar94 = (float *)local_1c0;
                bVar36 = true;
                do {
                  bVar37 = bVar36;
                  fVar101 = *(float *)*pauVar79;
                  fVar234 = *(float *)(*pauVar79 + 4);
                  fVar235 = *(float *)(*pauVar79 + 8);
                  fVar236 = *(float *)(*pauVar79 + 0xc);
                  fVar237 = *(float *)(*pauVar79 + 0x10);
                  fVar238 = *(float *)(*pauVar79 + 0x14);
                  fVar239 = *(float *)(*pauVar79 + 0x18);
                  fVar240 = *(float *)(*pauVar79 + 0x1c);
                  fVar17 = *pfVar86;
                  fVar18 = pfVar86[1];
                  fVar19 = pfVar86[2];
                  fVar20 = pfVar86[3];
                  fVar21 = pfVar86[4];
                  fVar22 = pfVar86[5];
                  fVar23 = pfVar86[6];
                  fVar24 = pfVar86[7];
                  fVar25 = pfVar90[1];
                  fVar26 = pfVar90[2];
                  fVar27 = pfVar90[3];
                  fVar28 = pfVar90[4];
                  fVar29 = pfVar90[5];
                  fVar30 = pfVar90[6];
                  fVar31 = pfVar90[7];
                  *pfVar94 = *pfVar94 + *pfVar90;
                  pfVar94[1] = pfVar94[1] + fVar25;
                  pfVar94[2] = pfVar94[2] + fVar26;
                  pfVar94[3] = pfVar94[3] + fVar27;
                  pfVar94[4] = pfVar94[4] + fVar28;
                  pfVar94[5] = pfVar94[5] + fVar29;
                  pfVar94[6] = pfVar94[6] + fVar30;
                  pfVar94[7] = pfVar94[7] + fVar31;
                  auVar215._0_4_ = fVar101 + fVar17 + *(float *)pauVar79[2];
                  auVar215._4_4_ = fVar234 + fVar18 + *(float *)(pauVar79[2] + 4);
                  auVar215._8_4_ = fVar235 + fVar19 + *(float *)(pauVar79[2] + 8);
                  auVar215._12_4_ = fVar236 + fVar20 + *(float *)(pauVar79[2] + 0xc);
                  auVar215._16_4_ = fVar237 + fVar21 + *(float *)(pauVar79[2] + 0x10);
                  auVar215._20_4_ = fVar238 + fVar22 + *(float *)(pauVar79[2] + 0x14);
                  auVar215._24_4_ = fVar239 + fVar23 + *(float *)(pauVar79[2] + 0x18);
                  auVar215._28_4_ = fVar240 + fVar24 + *(float *)(pauVar79[2] + 0x1c);
                  *pauVar79 = auVar215;
                  auVar209._0_4_ = auVar215._0_4_ + auVar215._16_4_;
                  auVar209._4_4_ = auVar215._4_4_ + auVar215._20_4_;
                  auVar209._8_4_ = auVar215._8_4_ + auVar215._24_4_;
                  auVar209._12_4_ = auVar215._12_4_ + auVar215._28_4_;
                  auVar202 = vhaddps_avx(auVar209,auVar209);
                  auVar202 = vhaddps_avx(auVar202,auVar202);
                  *pdVar68 = (double)auVar202._0_4_;
                  pdVar68 = &local_230;
                  pauVar79 = local_f8;
                  pfVar86 = (float *)local_a0._0_8_;
                  pfVar90 = (float *)local_120;
                  pfVar94 = (float *)local_140;
                  bVar36 = false;
                } while (bVar37);
                auVar210._8_8_ = 0;
                auVar210._0_8_ = local_240;
                auVar228 = vmovhpd_avx(auVar210,local_230);
                lVar60 = (long)(int)uVar83;
                auVar202 = auVar228;
                if (uVar83 != uVar40) {
                  do {
                    auVar161 = vinsertps_avx(ZEXT416((uint)table_f32_f16
                                                           [*(ushort *)(lVar51 + lVar60 * 2)]),
                                             ZEXT416((uint)table_f32_f16
                                                           [*(ushort *)(uVar50 + lVar60 * 2)]),0x10)
                    ;
                    fVar101 = table_f32_f16[*(ushort *)(lVar97 + lVar60 * 2)];
                    auVar211._0_4_ = fVar101 * auVar161._0_4_;
                    auVar211._4_4_ = fVar101 * auVar161._4_4_;
                    auVar211._8_4_ = fVar101 * auVar161._8_4_;
                    auVar211._12_4_ = fVar101 * auVar161._12_4_;
                    auVar161 = vcvtps2pd_avx(auVar211);
                    auVar228._0_8_ = auVar202._0_8_ + auVar161._0_8_;
                    auVar228._8_8_ = auVar202._8_8_ + auVar161._8_8_;
                    lVar60 = lVar60 + 1;
                    auVar202 = auVar228;
                  } while (lVar60 < (long)uVar99);
                }
                auVar202 = vcvtpd2ps_avx(auVar228);
                in_ZMM11 = ZEXT1664(auVar202);
                uVar225 = vmovlpd_avx(auVar202);
                *(undefined8 *)((long)pvVar61 + lVar88 * 4) = uVar225;
                lVar88 = lVar88 + 2;
                iVar69 = iVar69 + local_280 * 2;
              } while (lVar88 < lVar95);
            }
          }
          else if (0 < (int)uVar70) {
            pvVar74 = pgVar78->data;
            iVar69 = iVar39 * local_214 + iVar71 * local_210;
            uVar50 = 0;
            uVar77 = (long)(iVar39 * local_220 + iVar55 * local_218 + iVar71 * local_21c) +
                     (long)pgVar98->data;
            uVar62 = 0;
            do {
              lVar88 = (long)iVar69 + (long)pvVar74;
              _local_1a0 = auVar200;
              _local_1c0 = auVar200;
              _local_1e0 = auVar200;
              _local_200 = auVar200;
              if ((int)uVar83 < 1) {
                auVar230 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              }
              else {
                uVar82 = 0;
                lVar97 = lVar88;
                uVar50 = uVar77;
                do {
                  lVar51 = 0;
                  do {
                    auVar192 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar97 + lVar51));
                    auVar220 = vcvtph2ps_f16c(*(undefined1 (*) [16])(uVar50 + lVar51));
                    auVar202 = vfmadd213ps_fma(auVar220,auVar192,
                                               *(undefined1 (*) [32])(local_200 + lVar51 * 2));
                    *(undefined1 (*) [32])(local_200 + lVar51 * 2) = ZEXT1632(auVar202);
                    lVar51 = lVar51 + 0x10;
                  } while (lVar51 != 0x40);
                  uVar82 = uVar82 + 0x20;
                  uVar50 = uVar50 + 0x40;
                  lVar97 = lVar97 + 0x40;
                } while (uVar82 < uVar83);
                auVar230._0_4_ =
                     (float)local_200._0_4_ + (float)local_1e0._0_4_ +
                     (float)local_1c0._0_4_ + (float)local_1a0._0_4_;
                auVar230._4_4_ =
                     (float)local_200._4_4_ + (float)local_1e0._4_4_ +
                     (float)local_1c0._4_4_ + (float)local_1a0._4_4_;
                auVar230._8_4_ = fStack_1f8 + fStack_1d8 + fStack_1b8 + fStack_198;
                auVar230._12_4_ = fStack_1f4 + fStack_1d4 + fStack_1b4 + fStack_194;
                auVar230._16_4_ = fStack_1f0 + fStack_1d0 + fStack_1b0 + fStack_190;
                auVar230._20_4_ = fStack_1ec + fStack_1cc + fStack_1ac + fStack_18c;
                auVar230._24_4_ = fStack_1e8 + fStack_1c8 + fStack_1a8 + fStack_188;
                auVar230._28_4_ = fStack_1e4 + fStack_1c4 + fStack_1a4 + fStack_184;
              }
              auVar212._0_4_ = auVar230._0_4_ + auVar230._16_4_;
              auVar212._4_4_ = auVar230._4_4_ + auVar230._20_4_;
              auVar212._8_4_ = auVar230._8_4_ + auVar230._24_4_;
              auVar212._12_4_ = auVar230._12_4_ + auVar230._28_4_;
              auVar213 = vhaddps_avx(auVar212,auVar212);
              auVar202 = vhaddps_avx(auVar213,auVar213);
              fVar101 = auVar202._0_4_;
              if (uVar83 != uVar40) {
                dVar194 = (double)fVar101;
                lVar97 = (long)(int)uVar83;
                do {
                  uVar50 = (ulong)*(ushort *)(uVar77 + lVar97 * 2);
                  auVar213._0_8_ =
                       (double)(table_f32_f16[*(ushort *)(lVar88 + lVar97 * 2)] *
                               table_f32_f16[uVar50]);
                  auVar213._8_8_ = 0;
                  dVar194 = dVar194 + auVar213._0_8_;
                  lVar97 = lVar97 + 1;
                } while (lVar97 < (long)uVar99);
                fVar101 = (float)dVar194;
              }
              in_ZMM11 = ZEXT1664(auVar213);
              *(float *)((long)pvVar61 + uVar62 * 4) = fVar101;
              uVar62 = uVar62 + 1;
              iVar69 = iVar69 + local_280;
            } while (uVar62 != uVar52);
          }
          if (0 < (int)uVar56) {
            uVar77 = 0;
            pvVar74 = pvVar61;
            do {
              lVar88 = 0;
              do {
                pfVar86 = (float *)((long)pvVar74 + lVar88);
                auVar222._0_4_ = auVar111._0_4_ * *pfVar86;
                auVar222._4_4_ = auVar111._0_4_ * pfVar86[1];
                auVar222._8_4_ = auVar111._0_4_ * pfVar86[2];
                auVar222._12_4_ = auVar111._0_4_ * pfVar86[3];
                auVar222._16_4_ = auVar111._0_4_ * pfVar86[4];
                auVar222._20_4_ = auVar111._0_4_ * pfVar86[5];
                auVar222._28_36_ = in_ZMM11._28_36_;
                auVar222._24_4_ = auVar111._0_4_ * pfVar86[6];
                in_ZMM11 = ZEXT3264(auVar222._0_32_);
                *(undefined1 (*) [32])((long)pvVar74 + lVar88) = auVar222._0_32_;
                lVar88 = lVar88 + 0x20;
              } while (lVar88 != 0x80);
              uVar77 = uVar77 + 0x20;
              pvVar74 = (void *)((long)pvVar74 + 0x80);
            } while (uVar77 < uVar63);
          }
          if (uVar56 != uVar70) {
            uVar77 = 0;
            do {
              auVar216._8_8_ = uVar77;
              auVar216._0_8_ = uVar77;
              auVar216._16_8_ = uVar77;
              auVar216._24_8_ = uVar77;
              auVar220 = vpor_avx2(auVar216,auVar135);
              auVar192 = vpor_avx2(auVar216,auVar165);
              auVar192 = vpcmpgtq_avx2(auVar192 ^ auVar177,auVar226);
              auVar220 = vpcmpgtq_avx2(auVar220 ^ auVar177,auVar226);
              auVar192 = vpackssdw_avx2(auVar220,auVar192);
              auVar202 = vpackssdw_avx(SUB3216(auVar192 ^ auVar163,0),
                                       SUB3216(auVar192 ^ auVar163,0x10));
              auVar202 = vpshufd_avx(auVar202,0xd8);
              auVar192 = vpmovzxwd_avx2(auVar202);
              auVar220 = vpslld_avx2(auVar192,0x1f);
              in_ZMM11 = ZEXT3264(auVar220);
              auVar192 = vmaskmovps_avx(auVar220,*(undefined1 (*) [32])
                                                  ((long)local_368 + uVar77 * 4 + local_e8));
              auVar13._4_4_ = auVar192._4_4_ * auVar111._0_4_;
              auVar13._0_4_ = auVar192._0_4_ * auVar111._0_4_;
              auVar13._8_4_ = auVar192._8_4_ * auVar111._0_4_;
              auVar13._12_4_ = auVar192._12_4_ * auVar111._0_4_;
              auVar13._16_4_ = auVar192._16_4_ * auVar111._0_4_;
              auVar13._20_4_ = auVar192._20_4_ * auVar111._0_4_;
              auVar13._24_4_ = auVar192._24_4_ * auVar111._0_4_;
              auVar13._28_4_ = auVar192._28_4_;
              auVar192 = vmaskmovps_avx(auVar220,auVar13);
              *(undefined1 (*) [32])((long)local_368 + uVar77 * 4 + local_e8) = auVar192;
              uVar77 = uVar77 + 8;
            } while (local_a8 != uVar77);
          }
          if (0 < iVar41 && uVar38 != 0) {
            iVar69 = (int)local_f0 + iVar55;
            auVar231._4_4_ = iVar69;
            auVar231._0_4_ = iVar69;
            auVar231._8_4_ = iVar69;
            auVar231._12_4_ = iVar69;
            auVar231._16_4_ = iVar69;
            auVar231._20_4_ = iVar69;
            auVar231._24_4_ = iVar69;
            auVar231._28_4_ = iVar69;
            uVar77 = 0;
            auVar192 = local_80;
            do {
              auVar217._8_8_ = uVar77;
              auVar217._0_8_ = uVar77;
              auVar217._16_8_ = uVar77;
              auVar217._24_8_ = uVar77;
              auVar190 = vpor_avx2(auVar217,auVar135);
              auVar220 = vpor_avx2(auVar217,auVar165);
              auVar220 = vpcmpgtq_avx2(auVar220 ^ auVar177,auVar164);
              auVar190 = vpcmpgtq_avx2(auVar190 ^ auVar177,auVar164);
              auVar220 = vpackssdw_avx2(auVar190,auVar220);
              auVar202 = vpackssdw_avx(SUB3216(auVar220 ^ auVar163,0),
                                       SUB3216(auVar220 ^ auVar163,0x10));
              auVar161 = vpshufd_avx(auVar202,0xd8);
              in_ZMM11 = ZEXT1664(auVar161);
              auVar220 = vpcmpgtd_avx2(auVar192,auVar231);
              auVar202 = vpackssdw_avx(auVar220._0_16_,auVar220._16_16_);
              auVar202 = vpand_avx(auVar161,auVar202);
              auVar220 = vpmovzxwd_avx2(auVar202);
              auVar220 = vpslld_avx2(auVar220,0x1f);
              auVar220 = vmaskmovps_avx(auVar220,auVar193);
              *(undefined1 (*) [32])((long)local_368 + uVar77 * 4 + local_d0) = auVar220;
              uVar77 = uVar77 + 8;
              auVar141._8_4_ = 8;
              auVar141._0_8_ = 0x800000008;
              auVar141._12_4_ = 8;
              auVar141._16_4_ = 8;
              auVar141._20_4_ = 8;
              auVar141._24_4_ = 8;
              auVar141._28_4_ = 8;
              auVar192 = vpaddd_avx2(auVar192,auVar141);
            } while (local_c0 != uVar77);
          }
          fVar101 = -INFINITY;
          if (0 < (int)uVar70) {
            uVar77 = 0;
            auVar202 = ZEXT816(0xfff0000000000000);
            do {
              auVar122._0_8_ = (double)*(float *)((long)pvVar61 + uVar77 * 4);
              auVar122._8_8_ = auVar111._8_8_;
              auVar202 = vmaxsd_avx(auVar202,auVar122);
              uVar77 = uVar77 + 1;
            } while (uVar52 != uVar77);
            fVar101 = (float)auVar202._0_8_;
          }
          _local_200 = auVar200;
          if (0 < (int)uVar43) {
            lVar88 = 0;
            pvVar74 = pvVar61;
            do {
              lVar97 = 0;
              do {
                fVar234 = *(float *)((long)pvVar74 + lVar97 * 4);
                in_ZMM11 = ZEXT464((uint)fVar234);
                fVar235 = 0.0;
                if (-INFINITY < fVar234) {
                  auVar202 = vcvtps2ph_f16c(ZEXT416((uint)(fVar234 - fVar101)),0);
                  uVar91 = vpextrw_avx(auVar202,0);
                  uVar50 = (ulong)table_exp_f16[CONCAT44((int)(uVar50 >> 0x20),uVar91)];
                  fVar235 = table_f32_f16[uVar50];
                  *(double *)(local_200 + lVar97 * 8) =
                       (double)fVar235 + *(double *)(local_200 + lVar97 * 8);
                }
                *(float *)((long)pvVar74 + lVar97 * 4) = fVar235;
                lVar97 = lVar97 + 1;
              } while (lVar97 != 4);
              lVar88 = lVar88 + 4;
              pvVar74 = (void *)((long)pvVar74 + 0x10);
            } while (lVar88 < local_b0);
          }
          fVar101 = 0.0;
          lVar88 = 0;
          do {
            fVar101 = (float)((double)fVar101 + *(double *)(local_200 + lVar88 * 8));
            lVar88 = lVar88 + 1;
          } while (lVar88 != 4);
          fVar101 = 1.0 / fVar101;
          auVar152 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar101));
          if (0 < (int)uVar56) {
            uVar50 = 0;
            pvVar74 = pvVar61;
            do {
              lVar88 = 0;
              do {
                pfVar86 = (float *)((long)pvVar74 + lVar88);
                auVar153._0_4_ = fVar101 * *pfVar86;
                auVar153._4_4_ = fVar101 * pfVar86[1];
                auVar153._8_4_ = fVar101 * pfVar86[2];
                auVar153._12_4_ = fVar101 * pfVar86[3];
                auVar153._16_4_ = fVar101 * pfVar86[4];
                auVar153._20_4_ = fVar101 * pfVar86[5];
                auVar153._28_36_ = auVar152._28_36_;
                auVar153._24_4_ = fVar101 * pfVar86[6];
                auVar152 = ZEXT3264(auVar153._0_32_);
                *(undefined1 (*) [32])((long)pvVar74 + lVar88) = auVar153._0_32_;
                lVar88 = lVar88 + 0x20;
              } while (lVar88 != 0x80);
              uVar50 = uVar50 + 0x20;
              pvVar74 = (void *)((long)pvVar74 + 0x80);
            } while (uVar50 < uVar63);
          }
          if (uVar56 != uVar70) {
            uVar50 = 0;
            do {
              auVar142._8_8_ = uVar50;
              auVar142._0_8_ = uVar50;
              auVar142._16_8_ = uVar50;
              auVar142._24_8_ = uVar50;
              auVar220 = vpor_avx2(auVar142,auVar135);
              auVar192 = vpor_avx2(auVar142,auVar165);
              auVar192 = vpcmpgtq_avx2(auVar192 ^ auVar177,auVar226);
              auVar220 = vpcmpgtq_avx2(auVar220 ^ auVar177,auVar226);
              auVar192 = vpackssdw_avx2(auVar220,auVar192);
              auVar202 = vpackssdw_avx(SUB3216(auVar192 ^ auVar163,0),
                                       SUB3216(auVar192 ^ auVar163,0x10));
              auVar202 = vpshufd_avx(auVar202,0xd8);
              auVar192 = vpmovzxwd_avx2(auVar202);
              auVar220 = vpslld_avx2(auVar192,0x1f);
              auVar192 = vmaskmovps_avx(auVar220,*(undefined1 (*) [32])
                                                  ((long)local_368 + uVar50 * 4 + local_e8));
              auVar14._4_4_ = fVar101 * auVar192._4_4_;
              auVar14._0_4_ = fVar101 * auVar192._0_4_;
              auVar14._8_4_ = fVar101 * auVar192._8_4_;
              auVar14._12_4_ = fVar101 * auVar192._12_4_;
              auVar14._16_4_ = fVar101 * auVar192._16_4_;
              auVar14._20_4_ = fVar101 * auVar192._20_4_;
              auVar14._24_4_ = fVar101 * auVar192._24_4_;
              auVar14._28_4_ = auVar192._28_4_;
              in_ZMM11 = ZEXT3264(auVar14);
              auVar192 = vmaskmovps_avx(auVar220,auVar14);
              *(undefined1 (*) [32])((long)local_368 + uVar50 * 4 + local_e8) = auVar192;
              uVar50 = uVar50 + 8;
            } while (local_a8 != uVar50);
          }
          local_368 = params->wdata;
          if (0 < (int)uVar70) {
            uVar50 = 0;
            do {
              auVar202 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar61 + uVar50 * 4)),0);
              vpextrw_avx(auVar202,0);
              uVar50 = uVar50 + 1;
            } while (uVar52 != uVar50);
          }
          if ((uVar99 & 1) == 0) {
            if (0 < (int)uVar40) {
              pvVar61 = tensor->data;
              pvVar74 = pgVar75->data;
              iVar69 = iVar39 * local_228 + iVar71 * local_224;
              lVar88 = (long)local_368 + local_238;
              lVar97 = 0;
              do {
                lVar51 = (long)pvVar74 + iVar69 + lVar81;
                lVar60 = (long)iVar69 + (long)pvVar74;
                local_240 = 0.0;
                local_230 = 0.0;
                local_120 = auVar200;
                local_140 = auVar200;
                local_160 = auVar200;
                local_180 = auVar200;
                _local_1a0 = auVar200;
                _local_1c0 = auVar200;
                _local_1e0 = auVar200;
                if (0 < (int)uVar56) {
                  uVar50 = 0;
                  lVar92 = lVar60;
                  lVar45 = lVar51;
                  lVar59 = lVar88;
                  do {
                    lVar58 = 0;
                    do {
                      auVar192 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar59 + lVar58));
                      auVar220 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar92 + lVar58));
                      auVar202 = vfmadd213ps_fma(auVar220,auVar192,
                                                 *(undefined1 (*) [32])(local_200 + lVar58 * 2));
                      *(undefined1 (*) [32])(local_200 + lVar58 * 2) = ZEXT1632(auVar202);
                      auVar220 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar45 + lVar58));
                      auVar202 = vfmadd213ps_fma(auVar220,auVar192,
                                                 *(undefined1 (*) [32])(local_180 + lVar58 * 2));
                      *(undefined1 (*) [32])(local_180 + lVar58 * 2) = ZEXT1632(auVar202);
                      lVar58 = lVar58 + 0x10;
                    } while (lVar58 != 0x40);
                    uVar50 = uVar50 + 0x20;
                    lVar45 = lVar45 + 0x40;
                    lVar92 = lVar92 + 0x40;
                    lVar59 = lVar59 + 0x40;
                  } while (uVar50 < uVar63);
                }
                pdVar68 = &local_240;
                pauVar79 = (undefined1 (*) [32])local_200;
                pfVar86 = (float *)local_1e0;
                pfVar90 = (float *)local_1a0;
                pfVar94 = (float *)local_1c0;
                bVar36 = true;
                do {
                  bVar37 = bVar36;
                  fVar101 = *(float *)*pauVar79;
                  fVar234 = *(float *)(*pauVar79 + 4);
                  fVar235 = *(float *)(*pauVar79 + 8);
                  fVar236 = *(float *)(*pauVar79 + 0xc);
                  fVar237 = *(float *)(*pauVar79 + 0x10);
                  fVar238 = *(float *)(*pauVar79 + 0x14);
                  fVar239 = *(float *)(*pauVar79 + 0x18);
                  fVar240 = *(float *)(*pauVar79 + 0x1c);
                  fVar17 = *pfVar86;
                  fVar18 = pfVar86[1];
                  fVar19 = pfVar86[2];
                  fVar20 = pfVar86[3];
                  fVar21 = pfVar86[4];
                  fVar22 = pfVar86[5];
                  fVar23 = pfVar86[6];
                  fVar24 = pfVar86[7];
                  fVar25 = pfVar90[1];
                  fVar26 = pfVar90[2];
                  fVar27 = pfVar90[3];
                  fVar28 = pfVar90[4];
                  fVar29 = pfVar90[5];
                  fVar30 = pfVar90[6];
                  fVar31 = pfVar90[7];
                  *pfVar94 = *pfVar94 + *pfVar90;
                  pfVar94[1] = pfVar94[1] + fVar25;
                  pfVar94[2] = pfVar94[2] + fVar26;
                  pfVar94[3] = pfVar94[3] + fVar27;
                  pfVar94[4] = pfVar94[4] + fVar28;
                  pfVar94[5] = pfVar94[5] + fVar29;
                  pfVar94[6] = pfVar94[6] + fVar30;
                  pfVar94[7] = pfVar94[7] + fVar31;
                  auVar143._0_4_ = fVar101 + fVar17 + *(float *)pauVar79[2];
                  auVar143._4_4_ = fVar234 + fVar18 + *(float *)(pauVar79[2] + 4);
                  auVar143._8_4_ = fVar235 + fVar19 + *(float *)(pauVar79[2] + 8);
                  auVar143._12_4_ = fVar236 + fVar20 + *(float *)(pauVar79[2] + 0xc);
                  auVar143._16_4_ = fVar237 + fVar21 + *(float *)(pauVar79[2] + 0x10);
                  auVar143._20_4_ = fVar238 + fVar22 + *(float *)(pauVar79[2] + 0x14);
                  auVar143._24_4_ = fVar239 + fVar23 + *(float *)(pauVar79[2] + 0x18);
                  auVar143._28_4_ = fVar240 + fVar24 + *(float *)(pauVar79[2] + 0x1c);
                  *pauVar79 = auVar143;
                  auVar155 = auVar143._16_16_;
                  auVar123._0_4_ = auVar143._16_4_ + auVar143._0_4_;
                  auVar123._4_4_ = auVar143._20_4_ + auVar143._4_4_;
                  auVar123._8_4_ = auVar143._24_4_ + auVar143._8_4_;
                  auVar123._12_4_ = auVar143._28_4_ + auVar143._12_4_;
                  auVar202 = vhaddps_avx(auVar123,auVar123);
                  auVar202 = vhaddps_avx(auVar202,auVar202);
                  *pdVar68 = (double)auVar202._0_4_;
                  pdVar68 = &local_230;
                  pauVar79 = &local_180;
                  pfVar86 = (float *)local_160;
                  pfVar90 = (float *)local_120;
                  pfVar94 = (float *)local_140;
                  bVar36 = false;
                } while (bVar37);
                auVar124._8_8_ = 0;
                auVar124._0_8_ = local_240;
                auVar229 = vmovhpd_avx(auVar124,local_230);
                lVar92 = lVar93;
                auVar202 = auVar229;
                if (uVar56 != uVar70) {
                  do {
                    auVar161 = vinsertps_avx(ZEXT416((uint)table_f32_f16
                                                           [*(ushort *)(lVar60 + lVar92 * 2)]),
                                             ZEXT416((uint)table_f32_f16
                                                           [*(ushort *)(lVar51 + lVar92 * 2)]),0x10)
                    ;
                    fVar101 = table_f32_f16[*(ushort *)(lVar88 + lVar92 * 2)];
                    auVar155._4_4_ = fVar101;
                    auVar155._0_4_ = fVar101;
                    auVar155._8_4_ = fVar101;
                    auVar155._12_4_ = fVar101;
                    auVar125._0_4_ = fVar101 * auVar161._0_4_;
                    auVar125._4_4_ = fVar101 * auVar161._4_4_;
                    auVar125._8_4_ = fVar101 * auVar161._8_4_;
                    auVar125._12_4_ = fVar101 * auVar161._12_4_;
                    auVar161 = vcvtps2pd_avx(auVar125);
                    auVar229._0_8_ = auVar202._0_8_ + auVar161._0_8_;
                    auVar229._8_8_ = auVar202._8_8_ + auVar161._8_8_;
                    lVar92 = lVar92 + 1;
                    auVar202 = auVar229;
                  } while (lVar92 < lVar95);
                }
                in_ZMM11 = ZEXT1664(auVar155);
                auVar202 = vcvtpd2ps_avx(auVar229);
                uVar225 = vmovlpd_avx(auVar202);
                *(undefined8 *)
                 ((long)pvVar61 +
                 (long)(int)(iVar39 * local_20c + iVar71 * local_208 + iVar55 * local_204 +
                            (int)lVar97 * 4)) = uVar225;
                lVar97 = lVar97 + 2;
                iVar69 = iVar69 + (int)local_380 * 2;
              } while (lVar97 < (long)uVar99);
            }
          }
          else if (0 < (int)uVar40) {
            pvVar61 = tensor->data;
            pvVar74 = pgVar75->data;
            iVar69 = iVar39 * local_228 + iVar71 * local_224;
            uVar50 = 0;
            do {
              lVar81 = (long)iVar69 + (long)pvVar74;
              _local_1a0 = auVar200;
              _local_1c0 = auVar200;
              _local_1e0 = auVar200;
              _local_200 = auVar200;
              if ((int)uVar56 < 1) {
                fVar101 = 0.0;
                fVar234 = 0.0;
                fVar235 = 0.0;
                fVar236 = 0.0;
                fVar237 = 0.0;
                fVar238 = 0.0;
                fVar239 = 0.0;
                fVar240 = 0.0;
              }
              else {
                uVar77 = 0;
                lVar88 = lVar81;
                lVar97 = (long)local_368 + local_238;
                do {
                  lVar51 = 0;
                  do {
                    auVar192 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar88 + lVar51));
                    auVar220 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar97 + lVar51));
                    auVar202 = vfmadd213ps_fma(auVar220,auVar192,
                                               *(undefined1 (*) [32])(local_200 + lVar51 * 2));
                    *(undefined1 (*) [32])(local_200 + lVar51 * 2) = ZEXT1632(auVar202);
                    lVar51 = lVar51 + 0x10;
                  } while (lVar51 != 0x40);
                  uVar77 = uVar77 + 0x20;
                  lVar97 = lVar97 + 0x40;
                  lVar88 = lVar88 + 0x40;
                } while (uVar77 < uVar63);
                in_ZMM11 = ZEXT3264(CONCAT428(fStack_1a4 + fStack_184,
                                              CONCAT424(fStack_1a8 + fStack_188,
                                                        CONCAT420(fStack_1ac + fStack_18c,
                                                                  CONCAT416(fStack_1b0 + fStack_190,
                                                                            CONCAT412(fStack_1b4 +
                                                                                      fStack_194,
                                                                                      CONCAT48(
                                                  fStack_1b8 + fStack_198,
                                                  CONCAT44((float)local_1c0._4_4_ +
                                                           (float)local_1a0._4_4_,
                                                           (float)local_1c0._0_4_ +
                                                           (float)local_1a0._0_4_))))))));
                fVar101 = (float)local_1c0._0_4_ + (float)local_1a0._0_4_ +
                          (float)local_200._0_4_ + (float)local_1e0._0_4_;
                fVar234 = (float)local_1c0._4_4_ + (float)local_1a0._4_4_ +
                          (float)local_200._4_4_ + (float)local_1e0._4_4_;
                fVar235 = fStack_1b8 + fStack_198 + fStack_1f8 + fStack_1d8;
                fVar236 = fStack_1b4 + fStack_194 + fStack_1f4 + fStack_1d4;
                fVar237 = fStack_1b0 + fStack_190 + fStack_1f0 + fStack_1d0;
                fVar238 = fStack_1ac + fStack_18c + fStack_1ec + fStack_1cc;
                fVar239 = fStack_1a8 + fStack_188 + fStack_1e8 + fStack_1c8;
                fVar240 = fStack_1a4 + fStack_184 + fStack_1e4 + fStack_1c4;
              }
              auVar126._0_4_ = fVar101 + fVar237;
              auVar126._4_4_ = fVar234 + fVar238;
              auVar126._8_4_ = fVar235 + fVar239;
              auVar126._12_4_ = fVar236 + fVar240;
              auVar202 = vhaddps_avx(auVar126,auVar126);
              auVar202 = vhaddps_avx(auVar202,auVar202);
              fVar101 = auVar202._0_4_;
              lVar88 = lVar93;
              if (uVar56 != uVar70) {
                do {
                  fVar101 = fVar101 + table_f32_f16[*(ushort *)(lVar81 + lVar88 * 2)] *
                                      table_f32_f16
                                      [*(ushort *)((long)local_368 + local_238 + lVar88 * 2)];
                  lVar88 = lVar88 + 1;
                } while (lVar88 < lVar95);
              }
              *(float *)((long)pvVar61 +
                        (long)(int)(iVar39 * local_20c + iVar71 * local_208 + iVar55 * local_204 +
                                   (int)uVar50 * 4)) = fVar101;
              uVar50 = uVar50 + 1;
              iVar69 = iVar69 + (int)local_380;
            } while (uVar50 != uVar40);
          }
          iVar54 = iVar54 + 1;
        } while (iVar54 != iVar48);
        return;
      }
      goto LAB_0012f2e0;
    case GGML_TYPE_F32:
      uVar40 = pgVar98->ne[0];
      if (tensor->ne[0] != uVar40) goto LAB_0012f349;
      iVar41 = pgVar98->ne[1];
      if (tensor->ne[1] != iVar41) goto LAB_0012f34e;
      uVar70 = pgVar78->ne[1];
      lVar95 = (long)(int)uVar70;
      uVar83 = uVar70 - iVar41;
      if ((int)uVar83 < 0) goto LAB_0012f353;
      if ((int)pgVar98->nb[0] != 4) goto LAB_0012f358;
      if ((int)pgVar78->nb[0] != 4) goto LAB_0012f35d;
      if ((int)pgVar75->nb[0] != 4) goto LAB_0012f362;
      if (pgVar78->ne[0] != uVar40) goto LAB_0012f367;
      if (pgVar75->ne[1] != uVar40) goto LAB_0012f36c;
      if ((int)tensor->nb[0] != 4) goto LAB_0012f371;
      iVar71 = (int)tensor->nb[1];
      if (iVar71 < 4) goto LAB_0012f376;
      uVar56 = (uint)tensor->nb[2];
      pgVar66 = (ggml_tensor *)(ulong)uVar56;
      if ((int)uVar56 < iVar71) goto LAB_0012f37b;
      iVar48 = (int)tensor->nb[3];
      if ((int)uVar56 <= iVar48) {
        if ((params->type & ~GGML_TASK_FINALIZE) == GGML_TASK_INIT) {
          return;
        }
        sVar6 = pgVar78->nb[1];
        sVar5 = pgVar78->nb[2];
        sVar1 = pgVar78->nb[3];
        sVar2 = pgVar98->nb[1];
        local_238 = CONCAT44(local_238._4_4_,(int)pgVar98->nb[2]);
        sVar3 = pgVar98->nb[3];
        sVar4 = pgVar75->nb[1];
        sVar33 = pgVar75->nb[2];
        iVar54 = pgVar98->ne[2] * iVar41;
        iVar55 = pgVar98->ne[3] * iVar54;
        local_f8 = (undefined1 (*) [32])CONCAT44(local_f8._4_4_,(int)pgVar75->nb[3]);
        iVar53 = params->ith;
        iVar39 = (iVar55 + params->nth + -1) / params->nth;
        iVar69 = iVar39 * iVar53;
        iVar39 = iVar39 + iVar69;
        if (iVar55 <= iVar39) {
          iVar39 = iVar55;
        }
        auVar108._0_8_ = (double)(int)uVar40;
        auVar108._8_8_ = in_XMM0_Qa;
        if (auVar108._0_8_ < 0.0) {
          dVar194 = sqrt(auVar108._0_8_);
        }
        else {
          auVar107 = vsqrtsd_avx(auVar108,auVar108);
          dVar194 = auVar107._0_8_;
        }
        if (iVar39 <= iVar69) {
          return;
        }
        uVar43 = uVar70 + 3 & 0xfffffffc;
        auVar112._0_4_ = (float)(1.0 / dVar194);
        lVar88 = (long)(int)uVar43;
        lVar97 = (lVar88 + 0x10) * (long)iVar53;
        uVar76 = uVar40 & 0xffffffe0;
        uVar80 = uVar70 & 0xffffffe0;
        uVar99 = (ulong)uVar80;
        auVar112._4_4_ = auVar112._0_4_;
        auVar112._8_4_ = auVar112._0_4_;
        auVar112._12_4_ = auVar112._0_4_;
        lVar93 = (long)(int)uVar80;
        lVar81 = lVar93 + 1;
        if (lVar93 + 1 <= lVar95) {
          lVar81 = lVar95;
        }
        uVar49 = (uVar70 - iVar41) + 1;
        if ((int)uVar49 < (int)uVar70) {
          uVar49 = uVar70;
        }
        uVar49 = ~uVar70 + iVar41 + uVar49;
        uVar50 = (lVar88 - lVar95) + 7U & 0xfffffffffffffff8;
        lVar51 = (lVar88 - lVar95) + -1;
        auVar188._8_8_ = lVar51;
        auVar188._0_8_ = lVar51;
        auVar188._16_8_ = lVar51;
        auVar188._24_8_ = lVar51;
        lVar51 = (lVar81 - lVar93) + -1;
        auVar227._8_8_ = lVar51;
        auVar227._0_8_ = lVar51;
        auVar227._16_8_ = lVar51;
        auVar227._24_8_ = lVar51;
        auVar144._4_4_ = uVar83;
        auVar144._0_4_ = uVar83;
        auVar144._8_4_ = uVar83;
        auVar144._12_4_ = uVar83;
        auVar144._16_4_ = uVar83;
        auVar144._20_4_ = uVar83;
        auVar144._24_4_ = uVar83;
        auVar144._28_4_ = uVar83;
        local_a0 = vpaddd_avx2(auVar144,_DAT_00135260);
        auVar204._8_4_ = uVar49;
        auVar204._0_8_ = CONCAT44(0,uVar49);
        auVar204._12_4_ = 0;
        auVar204._16_4_ = uVar49;
        auVar204._20_4_ = 0;
        auVar204._24_4_ = uVar49;
        auVar204._28_4_ = 0;
        lVar51 = lVar93 * 4 + lVar97 * 4;
        uVar52 = (lVar81 - lVar93) + 7U & 0xfffffffffffffff8;
        local_100 = (ulong)uVar83 * 4 + lVar97 * 4;
        auVar164 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar165 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar182._8_8_ = 0x8000000000000000;
        auVar182._0_8_ = 0x8000000000000000;
        auVar182._16_8_ = 0x8000000000000000;
        auVar182._24_8_ = 0x8000000000000000;
        auVar163 = vpcmpeqd_avx2(auVar135,auVar135);
        auVar196._8_4_ = 0xff800000;
        auVar196._0_8_ = 0xff800000ff800000;
        auVar196._12_4_ = 0xff800000;
        auVar196._16_4_ = 0xff800000;
        auVar196._20_4_ = 0xff800000;
        auVar196._24_4_ = 0xff800000;
        auVar196._28_4_ = 0xff800000;
        auVar107 = ZEXT816(0) << 0x40;
        auVar135 = vpor_avx2(auVar204,auVar182);
        auVar227 = auVar227 ^ auVar182;
        uVar63 = uVar50;
        do {
          iVar55 = iVar69 / iVar54;
          uVar77 = (ulong)(uint)((int)((long)iVar69 % (long)iVar54) >> 0x1f) << 0x20 |
                   (long)iVar69 % (long)iVar54 & 0xffffffffU;
          iVar53 = (int)((long)uVar77 % (long)iVar41);
          iVar65 = (int)((long)uVar77 / (long)iVar41);
          pvVar74 = params->wdata;
          pvVar61 = (void *)((long)pvVar74 + lVar97 * 4);
          if ((int)uVar70 < (int)uVar43) {
            uVar77 = 0;
            do {
              auVar218._8_8_ = uVar77;
              auVar218._0_8_ = uVar77;
              auVar218._16_8_ = uVar77;
              auVar218._24_8_ = uVar77;
              auVar192 = vpor_avx2(auVar218,auVar164);
              auVar200 = vpor_avx2(auVar218,auVar165);
              auVar200 = vpcmpgtq_avx2(auVar200 ^ auVar182,auVar188 ^ auVar182);
              auVar192 = vpcmpgtq_avx2(auVar192 ^ auVar182,auVar188 ^ auVar182);
              auVar200 = vpackssdw_avx2(auVar192,auVar200);
              auVar202 = vpackssdw_avx(SUB3216(auVar200 ^ auVar163,0),
                                       SUB3216(auVar200 ^ auVar163,0x10));
              auVar202 = vpshufd_avx(auVar202,0xd8);
              auVar200 = vpmovzxwd_avx2(auVar202);
              auVar200 = vpslld_avx2(auVar200,0x1f);
              in_ZMM11 = ZEXT3264(auVar200);
              auVar200 = vmaskmovps_avx(auVar200,auVar196);
              *(undefined1 (*) [32])((long)pvVar61 + uVar77 * 4 + lVar95 * 4) = auVar200;
              uVar77 = uVar77 + 8;
            } while (uVar50 != uVar77);
          }
          auVar200 = ZEXT1632(auVar107);
          if (0 < (int)uVar70) {
            pvVar73 = pgVar78->data;
            iVar96 = iVar55 * (int)sVar1 + iVar65 * (int)sVar5;
            lVar81 = (long)(iVar55 * (int)sVar3 + iVar53 * (int)sVar2 + iVar65 * (int)local_238) +
                     (long)pgVar98->data;
            uVar77 = 0;
            do {
              lVar60 = (long)iVar96 + (long)pvVar73;
              _local_1a0 = ZEXT1632(auVar107);
              _local_1c0 = ZEXT1632(auVar107);
              _local_1e0 = auVar200;
              _local_200 = auVar200;
              if ((int)uVar76 < 1) {
                auVar232 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
              }
              else {
                uVar63 = 0;
                lVar92 = lVar60;
                lVar45 = lVar81;
                do {
                  lVar59 = 0;
                  do {
                    auVar202 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar45 + lVar59),
                                               *(undefined1 (*) [32])(lVar92 + lVar59),
                                               *(undefined1 (*) [32])(local_200 + lVar59));
                    *(undefined1 (*) [32])(local_200 + lVar59) = ZEXT1632(auVar202);
                    lVar59 = lVar59 + 0x20;
                  } while (lVar59 != 0x80);
                  uVar63 = uVar63 + 0x20;
                  lVar45 = lVar45 + 0x80;
                  lVar92 = lVar92 + 0x80;
                } while (uVar63 < uVar76);
                in_ZMM11 = ZEXT3264(CONCAT428(fStack_1a4 + fStack_184,
                                              CONCAT424(fStack_1a8 + fStack_188,
                                                        CONCAT420(fStack_1ac + fStack_18c,
                                                                  CONCAT416(fStack_1b0 + fStack_190,
                                                                            CONCAT412(fStack_1b4 +
                                                                                      fStack_194,
                                                                                      CONCAT48(
                                                  fStack_1b8 + fStack_198,
                                                  CONCAT44((float)local_1c0._4_4_ +
                                                           (float)local_1a0._4_4_,
                                                           (float)local_1c0._0_4_ +
                                                           (float)local_1a0._0_4_))))))));
                auVar232._0_4_ =
                     (float)local_1c0._0_4_ + (float)local_1a0._0_4_ +
                     (float)local_200._0_4_ + (float)local_1e0._0_4_;
                auVar232._4_4_ =
                     (float)local_1c0._4_4_ + (float)local_1a0._4_4_ +
                     (float)local_200._4_4_ + (float)local_1e0._4_4_;
                auVar232._8_4_ = fStack_1b8 + fStack_198 + fStack_1f8 + fStack_1d8;
                auVar232._12_4_ = fStack_1b4 + fStack_194 + fStack_1f4 + fStack_1d4;
                auVar232._16_4_ = fStack_1b0 + fStack_190 + fStack_1f0 + fStack_1d0;
                auVar232._20_4_ = fStack_1ac + fStack_18c + fStack_1ec + fStack_1cc;
                auVar232._24_4_ = fStack_1a8 + fStack_188 + fStack_1e8 + fStack_1c8;
                auVar232._28_4_ = fStack_1a4 + fStack_184 + fStack_1e4 + fStack_1c4;
              }
              uVar63 = 0;
              auVar127._0_4_ = auVar232._0_4_ + auVar232._16_4_;
              auVar127._4_4_ = auVar232._4_4_ + auVar232._20_4_;
              auVar127._8_4_ = auVar232._8_4_ + auVar232._24_4_;
              auVar127._12_4_ = auVar232._12_4_ + auVar232._28_4_;
              auVar202 = vhaddps_avx(auVar127,auVar127);
              auVar202 = vhaddps_avx(auVar202,auVar202);
              fVar101 = auVar202._0_4_;
              lVar92 = (long)(int)uVar76;
              if (uVar76 != uVar40) {
                do {
                  fVar101 = fVar101 + *(float *)(lVar60 + lVar92 * 4) *
                                      *(float *)(lVar81 + lVar92 * 4);
                  lVar92 = lVar92 + 1;
                } while (lVar92 < (int)uVar40);
              }
              *(float *)((long)pvVar61 + uVar77 * 4) = fVar101;
              uVar77 = uVar77 + 1;
              local_3b0._0_4_ = (int)sVar6;
              iVar96 = iVar96 + (int)local_3b0;
            } while (uVar77 != uVar70);
          }
          if (0 < (int)uVar80) {
            uVar77 = 0;
            pvVar73 = pvVar61;
            do {
              lVar81 = 0;
              do {
                pfVar86 = (float *)((long)pvVar73 + lVar81);
                auVar223._0_4_ = auVar112._0_4_ * *pfVar86;
                auVar223._4_4_ = auVar112._0_4_ * pfVar86[1];
                auVar223._8_4_ = auVar112._0_4_ * pfVar86[2];
                auVar223._12_4_ = auVar112._0_4_ * pfVar86[3];
                auVar223._16_4_ = auVar112._0_4_ * pfVar86[4];
                auVar223._20_4_ = auVar112._0_4_ * pfVar86[5];
                auVar223._28_36_ = in_ZMM11._28_36_;
                auVar223._24_4_ = auVar112._0_4_ * pfVar86[6];
                in_ZMM11 = ZEXT3264(auVar223._0_32_);
                *(undefined1 (*) [32])((long)pvVar73 + lVar81) = auVar223._0_32_;
                lVar81 = lVar81 + 0x20;
              } while (lVar81 != 0x80);
              uVar77 = uVar77 + 0x20;
              pvVar73 = (void *)((long)pvVar73 + 0x80);
            } while (uVar77 < uVar99);
          }
          if (uVar80 != uVar70) {
            uVar77 = 0;
            do {
              auVar219._8_8_ = uVar77;
              auVar219._0_8_ = uVar77;
              auVar219._16_8_ = uVar77;
              auVar219._24_8_ = uVar77;
              auVar220 = vpor_avx2(auVar219,auVar164);
              auVar192 = vpor_avx2(auVar219,auVar165);
              auVar192 = vpcmpgtq_avx2(auVar192 ^ auVar182,auVar227);
              auVar220 = vpcmpgtq_avx2(auVar220 ^ auVar182,auVar227);
              auVar192 = vpackssdw_avx2(auVar220,auVar192);
              auVar202 = vpackssdw_avx(SUB3216(auVar192 ^ auVar163,0),
                                       SUB3216(auVar192 ^ auVar163,0x10));
              auVar202 = vpshufd_avx(auVar202,0xd8);
              auVar192 = vpmovzxwd_avx2(auVar202);
              auVar220 = vpslld_avx2(auVar192,0x1f);
              in_ZMM11 = ZEXT3264(auVar220);
              auVar192 = vmaskmovps_avx(auVar220,*(undefined1 (*) [32])
                                                  ((long)pvVar74 + uVar77 * 4 + lVar51));
              auVar15._4_4_ = auVar192._4_4_ * auVar112._0_4_;
              auVar15._0_4_ = auVar192._0_4_ * auVar112._0_4_;
              auVar15._8_4_ = auVar192._8_4_ * auVar112._0_4_;
              auVar15._12_4_ = auVar192._12_4_ * auVar112._0_4_;
              auVar15._16_4_ = auVar192._16_4_ * auVar112._0_4_;
              auVar15._20_4_ = auVar192._20_4_ * auVar112._0_4_;
              auVar15._24_4_ = auVar192._24_4_ * auVar112._0_4_;
              auVar15._28_4_ = auVar192._28_4_;
              auVar192 = vmaskmovps_avx(auVar220,auVar15);
              *(undefined1 (*) [32])((long)pvVar74 + uVar77 * 4 + lVar51) = auVar192;
              uVar77 = uVar77 + 8;
            } while (uVar52 != uVar77);
          }
          if (0 < iVar41 && uVar38 != 0) {
            iVar96 = uVar83 + iVar53;
            auVar233._4_4_ = iVar96;
            auVar233._0_4_ = iVar96;
            auVar233._8_4_ = iVar96;
            auVar233._12_4_ = iVar96;
            auVar233._16_4_ = iVar96;
            auVar233._20_4_ = iVar96;
            auVar233._24_4_ = iVar96;
            auVar233._28_4_ = iVar96;
            uVar77 = 0;
            auVar192 = local_a0;
            do {
              auVar221._8_8_ = uVar77;
              auVar221._0_8_ = uVar77;
              auVar221._16_8_ = uVar77;
              auVar221._24_8_ = uVar77;
              auVar190 = vpor_avx2(auVar221,auVar164);
              auVar220 = vpor_avx2(auVar221,auVar165);
              auVar220 = vpcmpgtq_avx2(auVar220 ^ auVar182,auVar135);
              auVar190 = vpcmpgtq_avx2(auVar190 ^ auVar182,auVar135);
              auVar220 = vpackssdw_avx2(auVar190,auVar220);
              auVar202 = vpackssdw_avx(SUB3216(auVar220 ^ auVar163,0),
                                       SUB3216(auVar220 ^ auVar163,0x10));
              auVar161 = vpshufd_avx(auVar202,0xd8);
              auVar220 = vpcmpgtd_avx2(auVar192,auVar233);
              auVar202 = vpackssdw_avx(auVar220._0_16_,auVar220._16_16_);
              in_ZMM11 = ZEXT1664(auVar202);
              auVar202 = vpand_avx(auVar202,auVar161);
              auVar220 = vpmovzxwd_avx2(auVar202);
              auVar220 = vpslld_avx2(auVar220,0x1f);
              auVar220 = vmaskmovps_avx(auVar220,auVar196);
              *(undefined1 (*) [32])((long)pvVar74 + uVar77 * 4 + local_100) = auVar220;
              uVar77 = uVar77 + 8;
              auVar145._8_4_ = 8;
              auVar145._0_8_ = 0x800000008;
              auVar145._12_4_ = 8;
              auVar145._16_4_ = 8;
              auVar145._20_4_ = 8;
              auVar145._24_4_ = 8;
              auVar145._28_4_ = 8;
              auVar192 = vpaddd_avx2(auVar192,auVar145);
            } while ((CONCAT44(0,uVar49) + 8 & 0xfffffffffffffff8) != uVar77);
          }
          fVar101 = -INFINITY;
          if (0 < (int)uVar70) {
            uVar77 = 0;
            auVar202 = ZEXT816(0xfff0000000000000);
            do {
              auVar128._0_8_ = (double)*(float *)((long)pvVar61 + uVar77 * 4);
              auVar128._8_8_ = auVar112._8_8_;
              auVar202 = vmaxsd_avx(auVar202,auVar128);
              uVar77 = uVar77 + 1;
            } while (uVar70 != uVar77);
            fVar101 = (float)auVar202._0_8_;
          }
          _local_200 = auVar200;
          if (0 < (int)uVar43) {
            lVar81 = 0;
            pvVar73 = pvVar61;
            do {
              lVar60 = 0;
              do {
                fVar234 = *(float *)((long)pvVar73 + lVar60 * 4);
                in_ZMM11 = ZEXT464((uint)fVar234);
                fVar235 = 0.0;
                if (-INFINITY < fVar234) {
                  auVar202 = vcvtps2ph_f16c(ZEXT416((uint)(fVar234 - fVar101)),0);
                  uVar91 = vpextrw_avx(auVar202,0);
                  uVar63 = (ulong)table_exp_f16[CONCAT44((int)(uVar63 >> 0x20),uVar91)];
                  fVar235 = table_f32_f16[uVar63];
                  *(double *)(local_200 + lVar60 * 8) =
                       (double)fVar235 + *(double *)(local_200 + lVar60 * 8);
                }
                *(float *)((long)pvVar73 + lVar60 * 4) = fVar235;
                lVar60 = lVar60 + 1;
              } while (lVar60 != 4);
              lVar81 = lVar81 + 4;
              pvVar73 = (void *)((long)pvVar73 + 0x10);
            } while (lVar81 < lVar88);
          }
          fVar101 = 0.0;
          lVar81 = 0;
          do {
            fVar101 = (float)((double)fVar101 + *(double *)(local_200 + lVar81 * 8));
            lVar81 = lVar81 + 1;
          } while (lVar81 != 4);
          fVar101 = 1.0 / fVar101;
          auVar152 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar101));
          if (0 < (int)uVar80) {
            uVar77 = 0;
            pvVar73 = pvVar61;
            do {
              lVar81 = 0;
              do {
                pfVar86 = (float *)((long)pvVar73 + lVar81);
                auVar154._0_4_ = fVar101 * *pfVar86;
                auVar154._4_4_ = fVar101 * pfVar86[1];
                auVar154._8_4_ = fVar101 * pfVar86[2];
                auVar154._12_4_ = fVar101 * pfVar86[3];
                auVar154._16_4_ = fVar101 * pfVar86[4];
                auVar154._20_4_ = fVar101 * pfVar86[5];
                auVar154._28_36_ = auVar152._28_36_;
                auVar154._24_4_ = fVar101 * pfVar86[6];
                auVar152 = ZEXT3264(auVar154._0_32_);
                *(undefined1 (*) [32])((long)pvVar73 + lVar81) = auVar154._0_32_;
                lVar81 = lVar81 + 0x20;
              } while (lVar81 != 0x80);
              uVar77 = uVar77 + 0x20;
              pvVar73 = (void *)((long)pvVar73 + 0x80);
            } while (uVar77 < uVar99);
          }
          if (uVar80 != uVar70) {
            uVar77 = 0;
            do {
              auVar146._8_8_ = uVar77;
              auVar146._0_8_ = uVar77;
              auVar146._16_8_ = uVar77;
              auVar146._24_8_ = uVar77;
              auVar220 = vpor_avx2(auVar146,auVar164);
              auVar192 = vpor_avx2(auVar146,auVar165);
              auVar192 = vpcmpgtq_avx2(auVar192 ^ auVar182,auVar227);
              auVar220 = vpcmpgtq_avx2(auVar220 ^ auVar182,auVar227);
              auVar192 = vpackssdw_avx2(auVar220,auVar192);
              auVar202 = vpackssdw_avx(SUB3216(auVar192 ^ auVar163,0),
                                       SUB3216(auVar192 ^ auVar163,0x10));
              auVar202 = vpshufd_avx(auVar202,0xd8);
              auVar192 = vpmovzxwd_avx2(auVar202);
              auVar220 = vpslld_avx2(auVar192,0x1f);
              auVar192 = vmaskmovps_avx(auVar220,*(undefined1 (*) [32])
                                                  ((long)pvVar74 + uVar77 * 4 + lVar51));
              auVar16._4_4_ = fVar101 * auVar192._4_4_;
              auVar16._0_4_ = fVar101 * auVar192._0_4_;
              auVar16._8_4_ = fVar101 * auVar192._8_4_;
              auVar16._12_4_ = fVar101 * auVar192._12_4_;
              auVar16._16_4_ = fVar101 * auVar192._16_4_;
              auVar16._20_4_ = fVar101 * auVar192._20_4_;
              auVar16._24_4_ = fVar101 * auVar192._24_4_;
              auVar16._28_4_ = auVar192._28_4_;
              in_ZMM11 = ZEXT3264(auVar16);
              auVar192 = vmaskmovps_avx(auVar220,auVar16);
              *(undefined1 (*) [32])((long)pvVar74 + uVar77 * 4 + lVar51) = auVar192;
              uVar77 = uVar77 + 8;
            } while (uVar52 != uVar77);
          }
          if (0 < (int)uVar40) {
            pvVar74 = tensor->data;
            pvVar73 = pgVar75->data;
            iVar96 = iVar55 * (int)local_f8 + iVar65 * (int)sVar33;
            uVar77 = 0;
            do {
              lVar81 = (long)iVar96 + (long)pvVar73;
              _local_1a0 = auVar200;
              _local_1c0 = auVar200;
              _local_1e0 = auVar200;
              _local_200 = auVar200;
              if ((int)uVar80 < 1) {
                fVar101 = 0.0;
                fVar234 = 0.0;
                fVar235 = 0.0;
                fVar236 = 0.0;
                fVar237 = 0.0;
                fVar238 = 0.0;
                fVar239 = 0.0;
                fVar240 = 0.0;
              }
              else {
                uVar63 = 0;
                lVar60 = lVar81;
                pvVar87 = pvVar61;
                do {
                  lVar92 = 0;
                  do {
                    auVar202 = vfmadd213ps_fma(*(undefined1 (*) [32])((long)pvVar87 + lVar92),
                                               *(undefined1 (*) [32])(lVar60 + lVar92),
                                               *(undefined1 (*) [32])(local_200 + lVar92));
                    *(undefined1 (*) [32])(local_200 + lVar92) = ZEXT1632(auVar202);
                    lVar92 = lVar92 + 0x20;
                  } while (lVar92 != 0x80);
                  uVar63 = uVar63 + 0x20;
                  pvVar87 = (void *)((long)pvVar87 + 0x80);
                  lVar60 = lVar60 + 0x80;
                } while (uVar63 < uVar99);
                in_ZMM11 = ZEXT3264(CONCAT428(fStack_1a4 + fStack_184,
                                              CONCAT424(fStack_1a8 + fStack_188,
                                                        CONCAT420(fStack_1ac + fStack_18c,
                                                                  CONCAT416(fStack_1b0 + fStack_190,
                                                                            CONCAT412(fStack_1b4 +
                                                                                      fStack_194,
                                                                                      CONCAT48(
                                                  fStack_1b8 + fStack_198,
                                                  CONCAT44((float)local_1c0._4_4_ +
                                                           (float)local_1a0._4_4_,
                                                           (float)local_1c0._0_4_ +
                                                           (float)local_1a0._0_4_))))))));
                fVar101 = (float)local_1c0._0_4_ + (float)local_1a0._0_4_ +
                          (float)local_200._0_4_ + (float)local_1e0._0_4_;
                fVar234 = (float)local_1c0._4_4_ + (float)local_1a0._4_4_ +
                          (float)local_200._4_4_ + (float)local_1e0._4_4_;
                fVar235 = fStack_1b8 + fStack_198 + fStack_1f8 + fStack_1d8;
                fVar236 = fStack_1b4 + fStack_194 + fStack_1f4 + fStack_1d4;
                fVar237 = fStack_1b0 + fStack_190 + fStack_1f0 + fStack_1d0;
                fVar238 = fStack_1ac + fStack_18c + fStack_1ec + fStack_1cc;
                fVar239 = fStack_1a8 + fStack_188 + fStack_1e8 + fStack_1c8;
                fVar240 = fStack_1a4 + fStack_184 + fStack_1e4 + fStack_1c4;
              }
              auVar129._0_4_ = fVar101 + fVar237;
              auVar129._4_4_ = fVar234 + fVar238;
              auVar129._8_4_ = fVar235 + fVar239;
              auVar129._12_4_ = fVar236 + fVar240;
              auVar202 = vhaddps_avx(auVar129,auVar129);
              auVar202 = vhaddps_avx(auVar202,auVar202);
              fVar101 = auVar202._0_4_;
              lVar60 = lVar93;
              if (uVar80 != uVar70) {
                do {
                  fVar101 = fVar101 + *(float *)(lVar81 + lVar60 * 4) *
                                      *(float *)((long)pvVar61 + lVar60 * 4);
                  lVar60 = lVar60 + 1;
                } while (lVar60 < lVar95);
              }
              uVar63 = (ulong)(int)(iVar55 * iVar48 + iVar65 * uVar56 + iVar53 * iVar71 +
                                   (int)uVar77 * 4);
              *(float *)((long)pvVar74 + uVar63) = fVar101;
              uVar77 = uVar77 + 1;
              local_3b8._0_4_ = (int)sVar4;
              iVar96 = iVar96 + (int)local_3b8;
            } while (uVar77 != uVar40);
          }
          iVar69 = iVar69 + 1;
        } while (iVar69 != iVar39);
        return;
      }
    }
    goto LAB_0012f380;
  case GGML_OP_SOFT_MAX:
    goto switchD_001271cd_caseD_1d;
  case GGML_OP_CONV_1D_1S:
    pgVar66 = tensor->src0;
    if (GGML_TYPE_COUNT < pgVar66->type) {
      return;
    }
    pgVar98 = tensor->src1;
    switch(pgVar66->type) {
    default:
      goto switchD_00128610_caseD_0;
    case GGML_TYPE_F16:
      if (pgVar98->type != GGML_TYPE_F32) goto LAB_0012f2fe;
      if (tensor->type != GGML_TYPE_F32) goto LAB_0012f303;
      uVar38 = pgVar66->ne[0];
      if ((uVar38 & 0x80000001) != 1) goto LAB_0012f308;
      if ((int)pgVar66->nb[0] != 2) goto LAB_0012f30d;
      if ((int)pgVar98->nb[0] == 4) {
        if (params->type == GGML_TASK_FINALIZE) {
          return;
        }
        uVar40 = pgVar66->ne[1];
        uVar70 = pgVar66->ne[2];
        uVar83 = pgVar98->ne[0];
        uVar76 = (int)uVar38 / 2;
        uVar43 = uVar40 + 0x1f;
        uVar56 = uVar43 & 0xffffffe0;
        if (params->type == GGML_TASK_INIT) {
          uVar56 = pgVar98->ne[1];
          sVar6 = pgVar66->nb[1];
          sVar4 = pgVar66->nb[2];
          sVar5 = pgVar98->nb[1];
          iVar41 = 0;
          memset(params->wdata,0,params->wsize);
          pvVar61 = params->wdata;
          if (0 < (int)uVar70) {
            local_3b0._0_4_ = (int)sVar6;
            local_3f0._0_4_ = (int)sVar4;
            lVar95 = 0;
            uVar99 = 0;
            do {
              if (0 < (int)uVar40) {
                puVar57 = (undefined2 *)((long)pvVar61 + (long)iVar41 * 2);
                lVar81 = (long)pgVar66->data + lVar95;
                uVar63 = 0;
                do {
                  uVar52 = 0;
                  puVar72 = puVar57;
                  do {
                    *puVar72 = *(undefined2 *)(lVar81 + uVar52 * 2);
                    uVar52 = uVar52 + 1;
                    puVar72 = puVar72 + (uVar43 & 0xffffffe0);
                  } while (uVar38 != uVar52);
                  uVar63 = uVar63 + 1;
                  puVar57 = puVar57 + 1;
                  lVar81 = lVar81 + (int)local_3b0;
                } while (uVar63 != uVar40);
              }
              uVar99 = uVar99 + 1;
              iVar41 = iVar41 + (uVar43 >> 5) * uVar38 * 0x20;
              lVar95 = lVar95 + (int)local_3f0;
            } while (uVar99 != uVar70);
          }
          if ((int)uVar56 < 1) {
            return;
          }
          pvVar61 = pgVar98->data;
          local_3a8._0_4_ = (int)sVar5;
          uVar99 = 0;
          do {
            if (0 < (int)uVar83) {
              uVar63 = 0;
              do {
                auVar107 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar61 + uVar63 * 4)),0);
                vpextrw_avx(auVar107,0);
                uVar63 = uVar63 + 1;
              } while (uVar83 != uVar63);
            }
            uVar99 = uVar99 + 1;
            pvVar61 = (void *)((long)pvVar61 + (long)(int)local_3a8);
          } while (uVar99 != uVar56);
          return;
        }
        iVar41 = (int)(uVar70 + params->nth + -1) / params->nth;
        iVar71 = iVar41 * params->ith;
        uVar40 = iVar71 + iVar41;
        if ((int)uVar70 <= iVar71 + iVar41) {
          uVar40 = uVar70;
        }
        if ((int)uVar40 <= iVar71) {
          return;
        }
        sVar6 = tensor->nb[1];
        pvVar61 = tensor->data;
        local_3d8 = (long)iVar71;
        lVar81 = ((ulong)uVar76 - (long)(int)uVar76) * (long)(int)uVar56;
        lVar95 = (long)(int)uVar56 * 2;
        iVar41 = params->ith * uVar38 * (uVar43 >> 5) * iVar41 * 0x20;
        do {
          if (0 < (int)uVar83) {
            lVar88 = local_3d8 * (int)sVar6;
            pvVar74 = params->wdata;
            lVar93 = (long)pvVar74 + (long)(int)(uVar70 * uVar38 * uVar56) * 2 + lVar81 * 2;
            uVar99 = 0;
            do {
              *(undefined4 *)((long)pvVar61 + uVar99 * 4 + lVar88) = 0;
              auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
              lVar97 = (long)iVar41 * 2 + lVar81 * 2 + (long)pvVar74;
              lVar51 = lVar93;
              iVar71 = -uVar76;
              do {
                _local_1a0 = ZEXT816(0);
                _local_1a0 = ZEXT1632(_local_1a0);
                _local_1c0 = ZEXT816(0);
                _local_1c0 = ZEXT1632(_local_1c0);
                _local_1e0 = ZEXT816(0);
                _local_1e0 = ZEXT1632(_local_1e0);
                _local_200 = ZEXT816(0);
                _local_200 = ZEXT1632(_local_200);
                if ((int)uVar56 < 1) {
                  auVar165 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  uVar63 = 0;
                  lVar60 = lVar51;
                  lVar92 = lVar97;
                  do {
                    lVar45 = 0;
                    do {
                      auVar163 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar92 + lVar45));
                      auVar135 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar60 + lVar45));
                      auVar107 = vfmadd213ps_fma(auVar135,auVar163,
                                                 *(undefined1 (*) [32])(local_200 + lVar45 * 2));
                      *(undefined1 (*) [32])(local_200 + lVar45 * 2) = ZEXT1632(auVar107);
                      lVar45 = lVar45 + 0x10;
                    } while (lVar45 != 0x40);
                    uVar63 = uVar63 + 0x20;
                    lVar60 = lVar60 + 0x40;
                    lVar92 = lVar92 + 0x40;
                  } while (uVar63 < uVar56);
                  auVar165._0_4_ =
                       (float)local_200._0_4_ + (float)local_1e0._0_4_ +
                       (float)local_1c0._0_4_ + (float)local_1a0._0_4_;
                  auVar165._4_4_ =
                       (float)local_200._4_4_ + (float)local_1e0._4_4_ +
                       (float)local_1c0._4_4_ + (float)local_1a0._4_4_;
                  auVar165._8_4_ = fStack_1f8 + fStack_1d8 + fStack_1b8 + fStack_198;
                  auVar165._12_4_ = fStack_1f4 + fStack_1d4 + fStack_1b4 + fStack_194;
                  auVar165._16_4_ = fStack_1f0 + fStack_1d0 + fStack_1b0 + fStack_190;
                  auVar165._20_4_ = fStack_1ec + fStack_1cc + fStack_1ac + fStack_18c;
                  auVar165._24_4_ = fStack_1e8 + fStack_1c8 + fStack_1a8 + fStack_188;
                  auVar165._28_4_ = fStack_1e4 + fStack_1c4 + fStack_1a4 + fStack_184;
                }
                auVar162._0_4_ = auVar165._0_4_ + auVar165._16_4_;
                auVar162._4_4_ = auVar165._4_4_ + auVar165._20_4_;
                auVar162._8_4_ = auVar165._8_4_ + auVar165._24_4_;
                auVar162._12_4_ = auVar165._12_4_ + auVar165._28_4_;
                auVar107 = vhaddps_avx(auVar162,auVar162);
                auVar107 = vhaddps_avx(auVar107,auVar107);
                fVar101 = auVar152._0_4_ + auVar107._0_4_;
                auVar152 = ZEXT464((uint)fVar101);
                *(float *)((long)pvVar61 + uVar99 * 4 + lVar88) = fVar101;
                iVar71 = iVar71 + 1;
                lVar51 = lVar51 + lVar95;
                lVar97 = lVar97 + lVar95;
              } while (uVar76 + 1 != iVar71);
              uVar99 = uVar99 + 1;
              lVar93 = lVar93 + lVar95;
            } while (uVar99 != uVar83);
          }
          local_3d8 = local_3d8 + 1;
          iVar41 = iVar41 + (uVar43 >> 5) * uVar38 * 0x20;
        } while (local_3d8 != (int)uVar40);
        return;
      }
      goto LAB_0012f312;
    case GGML_TYPE_F32:
      if (pgVar98->type != GGML_TYPE_F32) goto LAB_0012f330;
      if (tensor->type != GGML_TYPE_F32) goto LAB_0012f335;
      uVar38 = pgVar66->ne[0];
      if ((uVar38 & 0x80000001) != 1) goto LAB_0012f33a;
      if ((int)pgVar66->nb[0] != 4) goto LAB_0012f33f;
      if ((int)pgVar98->nb[0] == 4) {
        if (params->type == GGML_TASK_FINALIZE) {
          return;
        }
        uVar40 = pgVar66->ne[1];
        uVar70 = pgVar66->ne[2];
        uVar83 = pgVar98->ne[0];
        uVar56 = (int)uVar38 / 2;
        uVar43 = uVar40 + 0x1f;
        local_3e0._0_4_ = uVar43 & 0xffffffe0;
        if (params->type == GGML_TASK_INIT) {
          uVar76 = pgVar98->ne[1];
          sVar6 = pgVar66->nb[1];
          sVar4 = pgVar66->nb[2];
          sVar5 = pgVar98->nb[1];
          iVar41 = 0;
          memset(params->wdata,0,params->wsize);
          pvVar61 = params->wdata;
          if (0 < (int)uVar70) {
            local_3a8._0_4_ = (int)sVar6;
            local_3f0._0_4_ = (int)sVar4;
            lVar95 = 0;
            uVar99 = 0;
            do {
              if (0 < (int)uVar40) {
                puVar46 = (undefined4 *)((long)pvVar61 + (long)iVar41 * 4);
                lVar81 = (long)pgVar66->data + lVar95;
                uVar63 = 0;
                do {
                  uVar52 = 0;
                  puVar67 = puVar46;
                  do {
                    *puVar67 = *(undefined4 *)(lVar81 + uVar52 * 4);
                    uVar52 = uVar52 + 1;
                    puVar67 = puVar67 + (uVar43 & 0xffffffe0);
                  } while (uVar38 != uVar52);
                  uVar63 = uVar63 + 1;
                  puVar46 = puVar46 + 1;
                  lVar81 = lVar81 + (int)local_3a8;
                } while (uVar63 != uVar40);
              }
              uVar99 = uVar99 + 1;
              iVar41 = iVar41 + (uVar43 >> 5) * uVar38 * 0x20;
              lVar95 = lVar95 + (int)local_3f0;
            } while (uVar99 != uVar70);
          }
          if ((int)uVar76 < 1) {
            return;
          }
          pvVar74 = pgVar98->data;
          local_3c0._0_4_ = (int)sVar5;
          puVar46 = (undefined4 *)
                    ((long)pvVar61 +
                    (long)(int)(uVar70 * uVar38 * (uint)local_3e0) * 4 +
                    (ulong)uVar56 * (long)(int)(uint)local_3e0 * 4);
          uVar99 = 0;
          do {
            if (0 < (int)uVar83) {
              uVar63 = 0;
              puVar67 = puVar46;
              do {
                *puVar67 = *(undefined4 *)((long)pvVar74 + uVar63 * 4);
                uVar63 = uVar63 + 1;
                puVar67 = puVar67 + (int)(uint)local_3e0;
              } while (uVar83 != uVar63);
            }
            uVar99 = uVar99 + 1;
            puVar46 = puVar46 + 1;
            pvVar74 = (void *)((long)pvVar74 + (long)(int)local_3c0);
          } while (uVar99 != uVar76);
          return;
        }
        iVar41 = (int)(uVar70 + params->nth + -1) / params->nth;
        iVar71 = iVar41 * params->ith;
        uVar40 = iVar71 + iVar41;
        if ((int)uVar70 <= iVar71 + iVar41) {
          uVar40 = uVar70;
        }
        if ((int)uVar40 <= iVar71) {
          return;
        }
        sVar6 = tensor->nb[1];
        pvVar61 = tensor->data;
        local_3b0 = (long)iVar71;
        lVar81 = ((ulong)uVar56 - (long)(int)uVar56) * (long)(int)(uint)local_3e0;
        lVar95 = (long)(int)(uint)local_3e0 * 4;
        iVar41 = params->ith * uVar38 * (uVar43 >> 5) * iVar41 * 0x20;
        do {
          if (0 < (int)uVar83) {
            lVar88 = local_3b0 * (int)sVar6;
            pvVar74 = params->wdata;
            lVar93 = (long)(int)(uVar70 * uVar38 * (uint)local_3e0) * 4 + lVar81 * 4 + (long)pvVar74
            ;
            uVar99 = 0;
            do {
              *(undefined4 *)((long)pvVar61 + uVar99 * 4 + lVar88) = 0;
              auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
              lVar97 = lVar93;
              lVar51 = (long)iVar41 * 4 + lVar81 * 4 + (long)pvVar74;
              iVar71 = -uVar56;
              do {
                _local_1a0 = ZEXT816(0);
                _local_1a0 = ZEXT1632(_local_1a0);
                _local_1c0 = ZEXT816(0);
                _local_1c0 = ZEXT1632(_local_1c0);
                _local_1e0 = ZEXT816(0);
                _local_1e0 = ZEXT1632(_local_1e0);
                _local_200 = ZEXT816(0);
                _local_200 = ZEXT1632(_local_200);
                if ((int)(uint)local_3e0 < 1) {
                  auVar164 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  uVar63 = 0;
                  lVar60 = lVar51;
                  lVar92 = lVar97;
                  do {
                    lVar45 = 0;
                    do {
                      auVar107 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar92 + lVar45),
                                                 *(undefined1 (*) [32])(lVar60 + lVar45),
                                                 *(undefined1 (*) [32])(local_200 + lVar45));
                      *(undefined1 (*) [32])(local_200 + lVar45) = ZEXT1632(auVar107);
                      lVar45 = lVar45 + 0x20;
                    } while (lVar45 != 0x80);
                    uVar63 = uVar63 + 0x20;
                    lVar92 = lVar92 + 0x80;
                    lVar60 = lVar60 + 0x80;
                  } while (uVar63 < ((ulong)uVar43 & 0xffffffe0));
                  auVar164._0_4_ =
                       (float)local_200._0_4_ + (float)local_1e0._0_4_ +
                       (float)local_1c0._0_4_ + (float)local_1a0._0_4_;
                  auVar164._4_4_ =
                       (float)local_200._4_4_ + (float)local_1e0._4_4_ +
                       (float)local_1c0._4_4_ + (float)local_1a0._4_4_;
                  auVar164._8_4_ = fStack_1f8 + fStack_1d8 + fStack_1b8 + fStack_198;
                  auVar164._12_4_ = fStack_1f4 + fStack_1d4 + fStack_1b4 + fStack_194;
                  auVar164._16_4_ = fStack_1f0 + fStack_1d0 + fStack_1b0 + fStack_190;
                  auVar164._20_4_ = fStack_1ec + fStack_1cc + fStack_1ac + fStack_18c;
                  auVar164._24_4_ = fStack_1e8 + fStack_1c8 + fStack_1a8 + fStack_188;
                  auVar164._28_4_ = fStack_1e4 + fStack_1c4 + fStack_1a4 + fStack_184;
                }
                auVar161._0_4_ = auVar164._0_4_ + auVar164._16_4_;
                auVar161._4_4_ = auVar164._4_4_ + auVar164._20_4_;
                auVar161._8_4_ = auVar164._8_4_ + auVar164._24_4_;
                auVar161._12_4_ = auVar164._12_4_ + auVar164._28_4_;
                auVar107 = vhaddps_avx(auVar161,auVar161);
                auVar107 = vhaddps_avx(auVar107,auVar107);
                fVar101 = auVar152._0_4_ + auVar107._0_4_;
                auVar152 = ZEXT464((uint)fVar101);
                *(float *)((long)pvVar61 + uVar99 * 4 + lVar88) = fVar101;
                iVar71 = iVar71 + 1;
                lVar97 = lVar97 + lVar95;
                lVar51 = lVar51 + lVar95;
              } while (uVar56 + 1 != iVar71);
              uVar99 = uVar99 + 1;
              lVar93 = lVar93 + lVar95;
            } while (uVar99 != uVar83);
          }
          local_3b0 = local_3b0 + 1;
          iVar41 = iVar41 + (uVar43 >> 5) * uVar38 * 0x20;
        } while (local_3b0 != (int)uVar40);
        return;
      }
    }
    goto LAB_0012f344;
  case GGML_OP_CONV_1D_2S:
    pgVar66 = tensor->src0;
    if (GGML_TYPE_COUNT < pgVar66->type) {
      return;
    }
    pgVar98 = tensor->src1;
    switch(pgVar66->type) {
    default:
      goto switchD_001283c4_caseD_0;
    case GGML_TYPE_F16:
      if (pgVar98->type != GGML_TYPE_F32) goto LAB_0012f2e5;
      if (tensor->type != GGML_TYPE_F32) goto LAB_0012f2ea;
      uVar38 = pgVar66->ne[0];
      if ((uVar38 & 0x80000001) != 1) goto LAB_0012f2ef;
      if ((int)pgVar66->nb[0] != 2) goto LAB_0012f2f4;
      if ((int)pgVar98->nb[0] == 4) {
        if (params->type == GGML_TASK_FINALIZE) {
          return;
        }
        uVar40 = pgVar66->ne[1];
        uVar70 = pgVar66->ne[2];
        uVar83 = pgVar98->ne[0];
        uVar76 = (int)uVar38 / 2;
        uVar43 = uVar40 + 0x1f;
        uVar56 = uVar43 & 0xffffffe0;
        if (params->type == GGML_TASK_INIT) {
          uVar56 = pgVar98->ne[1];
          sVar6 = pgVar66->nb[1];
          sVar4 = pgVar66->nb[2];
          sVar5 = pgVar98->nb[1];
          iVar41 = 0;
          memset(params->wdata,0,params->wsize);
          pvVar61 = params->wdata;
          if (0 < (int)uVar70) {
            local_3d8._0_4_ = (int)sVar6;
            local_3f0._0_4_ = (int)sVar4;
            lVar95 = 0;
            uVar99 = 0;
            do {
              if (0 < (int)uVar40) {
                puVar57 = (undefined2 *)((long)pvVar61 + (long)iVar41 * 2);
                lVar81 = (long)pgVar66->data + lVar95;
                uVar63 = 0;
                do {
                  uVar52 = 0;
                  puVar72 = puVar57;
                  do {
                    *puVar72 = *(undefined2 *)(lVar81 + uVar52 * 2);
                    uVar52 = uVar52 + 1;
                    puVar72 = puVar72 + (uVar43 & 0xffffffe0);
                  } while (uVar38 != uVar52);
                  uVar63 = uVar63 + 1;
                  puVar57 = puVar57 + 1;
                  lVar81 = lVar81 + (int)local_3d8;
                } while (uVar63 != uVar40);
              }
              uVar99 = uVar99 + 1;
              iVar41 = iVar41 + (uVar43 >> 5) * uVar38 * 0x20;
              lVar95 = lVar95 + (int)local_3f0;
            } while (uVar99 != uVar70);
          }
          if ((int)uVar56 < 1) {
            return;
          }
          pvVar61 = pgVar98->data;
          local_3a8._0_4_ = (int)sVar5;
          uVar99 = 0;
          do {
            if (0 < (int)uVar83) {
              uVar63 = 0;
              do {
                auVar107 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)pvVar61 + uVar63 * 4)),0);
                vpextrw_avx(auVar107,0);
                uVar63 = uVar63 + 1;
              } while (uVar83 != uVar63);
            }
            uVar99 = uVar99 + 1;
            pvVar61 = (void *)((long)pvVar61 + (long)(int)local_3a8);
          } while (uVar99 != uVar56);
          return;
        }
        iVar41 = (int)(uVar70 + params->nth + -1) / params->nth;
        iVar71 = iVar41 * params->ith;
        uVar40 = iVar71 + iVar41;
        if ((int)uVar70 <= iVar71 + iVar41) {
          uVar40 = uVar70;
        }
        if ((int)uVar40 <= iVar71) {
          return;
        }
        sVar6 = tensor->nb[1];
        pvVar61 = tensor->data;
        lVar95 = (long)(int)uVar56;
        local_3b8 = (ulong)iVar71;
        lVar81 = ((ulong)uVar76 - (long)(int)uVar76) * lVar95;
        iVar41 = params->ith * uVar38 * (uVar43 >> 5) * iVar41 * 0x20;
        do {
          if (0 < (int)uVar83) {
            lVar88 = local_3b8 * (long)(int)sVar6;
            pvVar74 = params->wdata;
            lVar93 = (long)(int)(uVar70 * uVar38 * uVar56) * 2 + lVar81 * 2 + (long)pvVar74;
            uVar99 = 0;
            do {
              *(undefined4 *)((long)pvVar61 + uVar99 * 2 + lVar88) = 0;
              auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
              lVar97 = lVar93;
              lVar51 = (long)iVar41 * 2 + lVar81 * 2 + (long)pvVar74;
              iVar71 = -uVar76;
              do {
                _local_1a0 = ZEXT816(0);
                _local_1a0 = ZEXT1632(_local_1a0);
                _local_1c0 = ZEXT816(0);
                _local_1c0 = ZEXT1632(_local_1c0);
                _local_1e0 = ZEXT816(0);
                _local_1e0 = ZEXT1632(_local_1e0);
                _local_200 = ZEXT816(0);
                _local_200 = ZEXT1632(_local_200);
                if ((int)uVar56 < 1) {
                  auVar135 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  uVar63 = 0;
                  lVar60 = lVar97;
                  lVar92 = lVar51;
                  do {
                    lVar45 = 0;
                    do {
                      auVar163 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar92 + lVar45));
                      auVar135 = vcvtph2ps_f16c(*(undefined1 (*) [16])(lVar60 + lVar45));
                      auVar107 = vfmadd213ps_fma(auVar135,auVar163,
                                                 *(undefined1 (*) [32])(local_200 + lVar45 * 2));
                      *(undefined1 (*) [32])(local_200 + lVar45 * 2) = ZEXT1632(auVar107);
                      lVar45 = lVar45 + 0x10;
                    } while (lVar45 != 0x40);
                    uVar63 = uVar63 + 0x20;
                    lVar60 = lVar60 + 0x40;
                    lVar92 = lVar92 + 0x40;
                  } while (uVar63 < uVar56);
                  auVar135._0_4_ =
                       (float)local_200._0_4_ + (float)local_1e0._0_4_ +
                       (float)local_1c0._0_4_ + (float)local_1a0._0_4_;
                  auVar135._4_4_ =
                       (float)local_200._4_4_ + (float)local_1e0._4_4_ +
                       (float)local_1c0._4_4_ + (float)local_1a0._4_4_;
                  auVar135._8_4_ = fStack_1f8 + fStack_1d8 + fStack_1b8 + fStack_198;
                  auVar135._12_4_ = fStack_1f4 + fStack_1d4 + fStack_1b4 + fStack_194;
                  auVar135._16_4_ = fStack_1f0 + fStack_1d0 + fStack_1b0 + fStack_190;
                  auVar135._20_4_ = fStack_1ec + fStack_1cc + fStack_1ac + fStack_18c;
                  auVar135._24_4_ = fStack_1e8 + fStack_1c8 + fStack_1a8 + fStack_188;
                  auVar135._28_4_ = fStack_1e4 + fStack_1c4 + fStack_1a4 + fStack_184;
                }
                auVar202._0_4_ = auVar135._0_4_ + auVar135._16_4_;
                auVar202._4_4_ = auVar135._4_4_ + auVar135._20_4_;
                auVar202._8_4_ = auVar135._8_4_ + auVar135._24_4_;
                auVar202._12_4_ = auVar135._12_4_ + auVar135._28_4_;
                auVar107 = vhaddps_avx(auVar202,auVar202);
                auVar107 = vhaddps_avx(auVar107,auVar107);
                fVar101 = auVar152._0_4_ + auVar107._0_4_;
                auVar152 = ZEXT464((uint)fVar101);
                *(float *)((long)pvVar61 + (uVar99 >> 1) * 4 + lVar88) = fVar101;
                iVar71 = iVar71 + 1;
                lVar97 = lVar97 + lVar95 * 2;
                lVar51 = lVar51 + lVar95 * 2;
              } while (uVar76 + 1 != iVar71);
              uVar99 = uVar99 + 2;
              lVar93 = lVar93 + lVar95 * 4;
            } while ((long)uVar99 < (long)(int)uVar83);
          }
          local_3b8 = local_3b8 + 1;
          iVar41 = iVar41 + (uVar43 >> 5) * uVar38 * 0x20;
        } while (local_3b8 != (long)(int)uVar40);
        return;
      }
      goto LAB_0012f2f9;
    case GGML_TYPE_F32:
      if (pgVar98->type != GGML_TYPE_F32) goto LAB_0012f317;
      if (tensor->type != GGML_TYPE_F32) goto LAB_0012f31c;
      uVar38 = pgVar66->ne[0];
      if ((uVar38 & 0x80000001) != 1) goto LAB_0012f321;
      if ((int)pgVar66->nb[0] != 4) goto LAB_0012f326;
      if ((int)pgVar98->nb[0] == 4) {
        if (params->type == GGML_TASK_FINALIZE) {
          return;
        }
        uVar40 = pgVar66->ne[1];
        uVar70 = pgVar66->ne[2];
        uVar83 = pgVar98->ne[0];
        uVar56 = (int)uVar38 / 2;
        uVar43 = uVar40 + 0x1f;
        local_3e0._0_4_ = uVar43 & 0xffffffe0;
        if (params->type == GGML_TASK_INIT) {
          uVar76 = pgVar98->ne[1];
          sVar6 = pgVar66->nb[1];
          sVar4 = pgVar66->nb[2];
          sVar5 = pgVar98->nb[1];
          iVar41 = 0;
          memset(params->wdata,0,params->wsize);
          pvVar61 = params->wdata;
          if (0 < (int)uVar70) {
            local_3f0._0_4_ = (int)sVar6;
            local_3c8._0_4_ = (int)sVar4;
            lVar95 = 0;
            uVar99 = 0;
            do {
              if (0 < (int)uVar40) {
                puVar46 = (undefined4 *)((long)pvVar61 + (long)iVar41 * 4);
                lVar81 = (long)pgVar66->data + lVar95;
                uVar63 = 0;
                do {
                  uVar52 = 0;
                  puVar67 = puVar46;
                  do {
                    *puVar67 = *(undefined4 *)(lVar81 + uVar52 * 4);
                    uVar52 = uVar52 + 1;
                    puVar67 = puVar67 + (uVar43 & 0xffffffe0);
                  } while (uVar38 != uVar52);
                  uVar63 = uVar63 + 1;
                  puVar46 = puVar46 + 1;
                  lVar81 = lVar81 + (int)local_3f0;
                } while (uVar63 != uVar40);
              }
              uVar99 = uVar99 + 1;
              iVar41 = iVar41 + (uVar43 >> 5) * uVar38 * 0x20;
              lVar95 = lVar95 + (int)local_3c8;
            } while (uVar99 != uVar70);
          }
          if ((int)uVar76 < 1) {
            return;
          }
          pvVar74 = pgVar98->data;
          local_3b0._0_4_ = (int)sVar5;
          puVar46 = (undefined4 *)
                    ((long)pvVar61 +
                    (long)(int)(uVar70 * uVar38 * (uint)local_3e0) * 4 +
                    (ulong)uVar56 * (long)(int)(uint)local_3e0 * 4);
          uVar99 = 0;
          do {
            if (0 < (int)uVar83) {
              uVar63 = 0;
              puVar67 = puVar46;
              do {
                *puVar67 = *(undefined4 *)((long)pvVar74 + uVar63 * 4);
                uVar63 = uVar63 + 1;
                puVar67 = puVar67 + (int)(uint)local_3e0;
              } while (uVar83 != uVar63);
            }
            uVar99 = uVar99 + 1;
            puVar46 = puVar46 + 1;
            pvVar74 = (void *)((long)pvVar74 + (long)(int)local_3b0);
          } while (uVar99 != uVar76);
          return;
        }
        iVar41 = (int)(uVar70 + params->nth + -1) / params->nth;
        iVar71 = iVar41 * params->ith;
        uVar40 = iVar71 + iVar41;
        if ((int)uVar70 <= iVar71 + iVar41) {
          uVar40 = uVar70;
        }
        if ((int)uVar40 <= iVar71) {
          return;
        }
        sVar6 = tensor->nb[1];
        pvVar61 = tensor->data;
        lVar95 = (long)(int)(uint)local_3e0;
        local_3c8 = (long)iVar71;
        lVar81 = ((ulong)uVar56 - (long)(int)uVar56) * lVar95;
        iVar41 = params->ith * uVar38 * (uVar43 >> 5) * iVar41 * 0x20;
        do {
          if (0 < (int)uVar83) {
            lVar88 = local_3c8 * (int)sVar6;
            pvVar74 = params->wdata;
            lVar93 = (long)pvVar74 + (long)(int)(uVar70 * uVar38 * (uint)local_3e0) * 4 + lVar81 * 4
            ;
            uVar99 = 0;
            do {
              *(undefined4 *)((long)pvVar61 + uVar99 * 2 + lVar88) = 0;
              auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
              lVar97 = (long)iVar41 * 4 + lVar81 * 4 + (long)pvVar74;
              lVar51 = lVar93;
              iVar71 = -uVar56;
              do {
                _local_1a0 = ZEXT816(0);
                _local_1a0 = ZEXT1632(_local_1a0);
                _local_1c0 = ZEXT816(0);
                _local_1c0 = ZEXT1632(_local_1c0);
                _local_1e0 = ZEXT816(0);
                _local_1e0 = ZEXT1632(_local_1e0);
                _local_200 = ZEXT816(0);
                _local_200 = ZEXT1632(_local_200);
                if ((int)(uint)local_3e0 < 1) {
                  auVar163 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  uVar63 = 0;
                  lVar60 = lVar97;
                  lVar92 = lVar51;
                  do {
                    lVar45 = 0;
                    do {
                      auVar107 = vfmadd213ps_fma(*(undefined1 (*) [32])(lVar92 + lVar45),
                                                 *(undefined1 (*) [32])(lVar60 + lVar45),
                                                 *(undefined1 (*) [32])(local_200 + lVar45));
                      *(undefined1 (*) [32])(local_200 + lVar45) = ZEXT1632(auVar107);
                      lVar45 = lVar45 + 0x20;
                    } while (lVar45 != 0x80);
                    uVar63 = uVar63 + 0x20;
                    lVar92 = lVar92 + 0x80;
                    lVar60 = lVar60 + 0x80;
                  } while (uVar63 < ((ulong)uVar43 & 0xffffffe0));
                  auVar163._0_4_ =
                       (float)local_200._0_4_ + (float)local_1e0._0_4_ +
                       (float)local_1c0._0_4_ + (float)local_1a0._0_4_;
                  auVar163._4_4_ =
                       (float)local_200._4_4_ + (float)local_1e0._4_4_ +
                       (float)local_1c0._4_4_ + (float)local_1a0._4_4_;
                  auVar163._8_4_ = fStack_1f8 + fStack_1d8 + fStack_1b8 + fStack_198;
                  auVar163._12_4_ = fStack_1f4 + fStack_1d4 + fStack_1b4 + fStack_194;
                  auVar163._16_4_ = fStack_1f0 + fStack_1d0 + fStack_1b0 + fStack_190;
                  auVar163._20_4_ = fStack_1ec + fStack_1cc + fStack_1ac + fStack_18c;
                  auVar163._24_4_ = fStack_1e8 + fStack_1c8 + fStack_1a8 + fStack_188;
                  auVar163._28_4_ = fStack_1e4 + fStack_1c4 + fStack_1a4 + fStack_184;
                }
                auVar107._0_4_ = auVar163._0_4_ + auVar163._16_4_;
                auVar107._4_4_ = auVar163._4_4_ + auVar163._20_4_;
                auVar107._8_4_ = auVar163._8_4_ + auVar163._24_4_;
                auVar107._12_4_ = auVar163._12_4_ + auVar163._28_4_;
                auVar107 = vhaddps_avx(auVar107,auVar107);
                auVar107 = vhaddps_avx(auVar107,auVar107);
                fVar101 = auVar152._0_4_ + auVar107._0_4_;
                auVar152 = ZEXT464((uint)fVar101);
                *(float *)((long)pvVar61 + (uVar99 >> 1) * 4 + lVar88) = fVar101;
                iVar71 = iVar71 + 1;
                lVar51 = lVar51 + lVar95 * 4;
                lVar97 = lVar97 + lVar95 * 4;
              } while (uVar56 + 1 != iVar71);
              uVar99 = uVar99 + 2;
              lVar93 = lVar93 + lVar95 * 8;
            } while ((long)uVar99 < (long)(int)uVar83);
          }
          local_3c8 = local_3c8 + 1;
          iVar41 = iVar41 + (uVar43 >> 5) * uVar38 * 0x20;
        } while (local_3c8 != (int)uVar40);
        return;
      }
    }
    goto LAB_0012f32b;
  case GGML_OP_FLASH_ATTN:
    goto switchD_001271cd_caseD_21;
  case GGML_OP_FLASH_FF:
    goto switchD_001271cd_caseD_22;
  case GGML_OP_COUNT:
    goto switchD_001271cd_caseD_23;
  }
switchD_001271cd_caseD_17:
  return;
switchD_00128152_caseD_1:
  uVar38 = local_3e8->ne[2];
  if (uVar38 != pgVar98->ne[2]) goto LAB_0012f3f3;
  uVar40 = local_3e8->ne[3];
  if (uVar40 != pgVar98->ne[3]) goto LAB_0012f3f8;
  uVar70 = tensor->ne[2];
  pgVar66 = (ggml_tensor *)(ulong)uVar70;
  if (uVar70 != uVar38) goto LAB_0012f3fd;
  if (tensor->ne[3] != uVar40) goto LAB_0012f402;
  iVar41 = (int)local_3e8->nb[1];
  iVar71 = (int)local_3e8->nb[0];
  if (iVar41 != 0x18 && iVar71 != 0x18) goto LAB_0012f407;
  if ((int)tensor->nb[0] != 4) goto LAB_0012f40c;
  iVar48 = (int)tensor->nb[1];
  if (iVar48 < 4) goto LAB_0012f411;
  iVar53 = (int)tensor->nb[2];
  if (iVar53 < iVar48) goto LAB_0012f416;
  iVar48 = (int)tensor->nb[3];
  if (iVar48 < iVar53) goto LAB_0012f41b;
  iVar39 = local_3e8->ne[1];
  if (tensor->ne[0] != iVar39) goto LAB_0012f420;
  uVar83 = pgVar98->ne[1];
  uVar99 = (ulong)uVar83;
  if (tensor->ne[1] == uVar83) {
    iVar55 = uVar70 * tensor->ne[3] * tensor->ne[1] * tensor->ne[0];
    iVar54 = params->ith;
    uVar70 = params->nth;
    if (params->type == GGML_TASK_FINALIZE) {
      if (iVar71 <= iVar41) {
        return;
      }
      pvVar61 = params->wdata;
      iVar41 = (int)(uVar70 + iVar55 + -1) / (int)uVar70;
      iVar54 = iVar54 * iVar41;
      iVar41 = iVar41 + iVar54;
      if (iVar55 <= iVar41) {
        iVar41 = iVar55;
      }
      lVar95 = (long)iVar54 * 4;
      pvVar74 = tensor->data;
      uVar38 = iVar41 - iVar54;
      if (uVar38 != 0 && iVar54 <= iVar41) {
        uVar99 = 0;
        do {
          *(undefined4 *)((long)pvVar74 + uVar99 * 4 + lVar95) =
               *(undefined4 *)((long)pvVar61 + uVar99 * 4 + (long)iVar54 * 4);
          uVar99 = uVar99 + 1;
        } while (uVar38 != uVar99);
      }
      if ((int)uVar70 < 2) {
        return;
      }
      lVar81 = (long)pvVar61 + lVar95 + (long)iVar55 * 4 + 0x40;
      uVar99 = 1;
      do {
        if (0 < (int)uVar38) {
          uVar63 = 0;
          do {
            *(float *)((long)pvVar74 + uVar63 * 4 + lVar95) =
                 *(float *)(lVar81 + uVar63 * 4) + *(float *)((long)pvVar74 + uVar63 * 4 + lVar95);
            uVar63 = uVar63 + 1;
          } while (uVar38 != uVar63);
        }
        uVar99 = uVar99 + 1;
        lVar81 = lVar81 + (long)iVar55 * 4 + 0x40;
      } while (uVar99 != uVar70);
      return;
    }
    iVar69 = pgVar98->ne[0];
    iVar65 = (int)pgVar98->nb[1];
    local_308._0_4_ = (int)pgVar98->nb[2];
    local_2b0 = (int)pgVar98->nb[3];
    if (params->type != GGML_TASK_INIT) {
      local_348._0_4_ = (int)local_3e8->nb[2];
      local_2f8._0_4_ = (int)local_3e8->nb[3];
      if (iVar41 < iVar71) {
        if ((int)uVar40 < 1) {
          return;
        }
        sVar6 = pgVar98->nb[0];
        iVar41 = (int)(uVar70 + iVar69 + -1) / (int)uVar70;
        iVar48 = iVar41 * iVar54;
        iVar41 = iVar41 + iVar48;
        if (iVar69 <= iVar41) {
          iVar41 = iVar69;
        }
        iVar53 = iVar39 + 0x1f;
        if (-1 < iVar39) {
          iVar53 = iVar39;
        }
        uVar70 = iVar53 >> 5;
        iVar53 = iVar48 * iVar71;
        pvVar61 = params->wdata;
        auVar110[8] = 0xf;
        auVar110._0_8_ = 0xf0f0f0f0f0f0f0f;
        auVar110[9] = 0xf;
        auVar110[10] = 0xf;
        auVar110[0xb] = 0xf;
        auVar110[0xc] = 0xf;
        auVar110[0xd] = 0xf;
        auVar110[0xe] = 0xf;
        auVar110[0xf] = 0xf;
        iVar69 = 0;
        local_300 = 0;
        do {
          if (0 < (int)uVar38) {
            auVar32._24_8_ = 0;
            auVar32._0_24_ = local_2a0._8_24_;
            local_2a0 = auVar32 << 0x40;
            local_2e0._0_4_ = iVar53;
            do {
              auVar163 = local_2a0;
              if (0 < (int)uVar83) {
                lVar95 = (long)pvVar61 +
                         (long)(int)local_2a0._0_4_ * 4 +
                         (long)iVar69 * 4 + (long)((iVar55 + 0x10) * iVar54) * 4;
                local_3b0._0_4_ = (int)params * (int)local_348 + (int)local_300 * (int)local_2f8;
                local_3c0 = 0;
                do {
                  if (iVar48 < iVar41) {
                    pvVar74 = local_3e8->data;
                    pvVar73 = pgVar98->data;
                    lVar81 = (long)iVar48;
                    iVar96 = (int)local_2e0;
                    do {
                      if (0x1f < iVar39) {
                        lVar88 = (long)pvVar74 + (long)iVar96 + (long)(int)uVar70 * 8;
                        iVar64 = (int)lVar81 * iVar71 + (int)local_3b0;
                        local_3b8._0_4_ = (int)sVar6;
                        uVar91 = *(undefined4 *)
                                  ((long)pvVar73 +
                                  (long)((int)lVar81 * (int)local_3b8 +
                                        (int)local_3c0 * iVar65 +
                                        (int)params * (int)local_308 + (int)local_300 * local_2b0));
                        auVar139._4_4_ = uVar91;
                        auVar139._0_4_ = uVar91;
                        auVar139._8_4_ = uVar91;
                        auVar139._12_4_ = uVar91;
                        auVar139._16_4_ = uVar91;
                        auVar139._20_4_ = uVar91;
                        auVar139._24_4_ = uVar91;
                        auVar139._28_4_ = uVar91;
                        uVar63 = 0;
                        lVar93 = lVar95;
                        do {
                          uVar91 = *(undefined4 *)
                                    ((long)pvVar74 +
                                    uVar63 * 4 + (long)(int)uVar70 * 4 + (long)iVar64);
                          auVar168._4_4_ = uVar91;
                          auVar168._0_4_ = uVar91;
                          auVar168._8_4_ = uVar91;
                          auVar168._12_4_ = uVar91;
                          auVar168._16_4_ = uVar91;
                          auVar168._20_4_ = uVar91;
                          auVar168._24_4_ = uVar91;
                          auVar168._28_4_ = uVar91;
                          uVar91 = *(undefined4 *)((long)pvVar74 + uVar63 * 4 + (long)iVar64);
                          auVar176._4_4_ = uVar91;
                          auVar176._0_4_ = uVar91;
                          auVar176._8_4_ = uVar91;
                          auVar176._12_4_ = uVar91;
                          auVar176._16_4_ = uVar91;
                          auVar176._20_4_ = uVar91;
                          auVar176._24_4_ = uVar91;
                          auVar176._28_4_ = uVar91;
                          lVar97 = 0;
                          do {
                            auVar181._8_8_ = 0;
                            auVar181._0_8_ = *(ulong *)(lVar88 + lVar97);
                            auVar107 = vpand_avx(auVar181,auVar110);
                            auVar202 = vpsrlw_avx(auVar181,4);
                            auVar202 = vpand_avx(auVar202,auVar110);
                            auVar135 = vpmovzxbd_avx2(auVar107);
                            auVar135 = vcvtdq2ps_avx(auVar135);
                            auVar107 = vfmadd213ps_fma(auVar135,auVar168,auVar176);
                            auVar135 = vpmovzxbd_avx2(auVar202);
                            auVar135 = vcvtdq2ps_avx(auVar135);
                            auVar202 = vfmadd213ps_fma(auVar135,auVar168,auVar176);
                            auVar135 = *(undefined1 (*) [32])(lVar93 + lVar97 * 8);
                            auVar164 = *(undefined1 (*) [32])(lVar93 + lVar97 * 8 + 0x20);
                            auVar165 = vshufps_avx(auVar135,auVar164,0x88);
                            auVar165 = vpermpd_avx2(auVar165,0xd8);
                            auVar135 = vshufps_avx(auVar135,auVar164,0xdd);
                            auVar135 = vpermpd_avx2(auVar135,0xd8);
                            auVar107 = vfmadd231ps_fma(auVar165,auVar139,ZEXT1632(auVar107));
                            auVar202 = vfmadd231ps_fma(auVar135,auVar139,ZEXT1632(auVar202));
                            auVar135 = vunpckhps_avx(ZEXT1632(auVar107),ZEXT1632(auVar202));
                            auVar164 = vunpcklps_avx(ZEXT1632(auVar107),ZEXT1632(auVar202));
                            auVar165 = vperm2f128_avx(auVar164,auVar135,0x31);
                            auVar135 = vperm2f128_avx(auVar164,auVar135,0x20);
                            *(undefined1 (*) [32])(lVar93 + lVar97 * 8) = auVar135;
                            *(undefined1 (*) [32])(lVar93 + lVar97 * 8 + 0x20) = auVar165;
                            lVar97 = lVar97 + 8;
                          } while (lVar97 != 0x10);
                          uVar63 = uVar63 + 1;
                          lVar88 = lVar88 + 0x10;
                          lVar93 = lVar93 + 0x80;
                        } while (uVar63 != uVar70);
                      }
                      lVar81 = lVar81 + 1;
                      iVar96 = iVar96 + iVar71;
                    } while (lVar81 != iVar41);
                  }
                  local_3c0 = local_3c0 + 1;
                  lVar95 = lVar95 + (long)iVar39 * 4;
                } while (local_3c0 != uVar99);
              }
              params = (ggml_compute_params *)((long)&params->type + 1);
              local_2e0._0_4_ = (int)local_2e0 + (int)local_348;
              local_2a0._4_4_ = 0;
              local_2a0._0_4_ = local_2a0._0_4_ + uVar83 * iVar39;
              local_2a0._8_24_ = auVar163._8_24_;
            } while (params != (ggml_compute_params *)(ulong)uVar38);
          }
          local_300 = local_300 + 1;
          iVar53 = iVar53 + (int)local_2f8;
          iVar69 = iVar69 + uVar83 * iVar39 * uVar38;
        } while (local_300 != uVar40);
        return;
      }
      iVar55 = uVar38 * iVar39;
      iVar69 = uVar40 * iVar55;
      iVar71 = (int)(iVar69 + uVar70 + -1) / (int)uVar70;
      iVar54 = iVar54 * iVar71;
      iVar71 = iVar71 + iVar54;
      if (iVar69 <= iVar71) {
        iVar71 = iVar69;
      }
      if (iVar71 <= iVar54) {
        return;
      }
      iVar69 = local_3e8->ne[0];
      pvVar61 = params->wdata;
      pvVar74 = local_3e8->data;
      pvVar73 = tensor->data;
      iVar65 = iVar69 + 0x1f;
      if (-1 < iVar69) {
        iVar65 = iVar69;
      }
      lVar95 = (long)(iVar65 >> 5);
      do {
        iVar96 = iVar54 / iVar55;
        uVar63 = (long)iVar54 % (long)iVar55;
        uVar40 = (int)uVar63 >> 0x1f;
        if (0 < (int)uVar83) {
          iVar64 = (int)((long)((ulong)uVar40 << 0x20 | uVar63 & 0xffffffff) % (long)iVar39);
          iVar42 = (int)((long)((ulong)uVar40 << 0x20 | uVar63 & 0xffffffff) / (long)iVar39);
          lVar81 = (long)(iVar96 * (int)local_2f8 + iVar64 * iVar41 + iVar42 * (int)local_348);
          uVar63 = (ulong)((long)(int)((uVar38 * iVar96 + iVar42) * uVar83 * iVar69) * 0x18) >> 5;
          uVar50 = 0;
          uVar52 = 0;
          do {
            auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
            fVar101 = 0.0;
            if (0x1f < iVar69) {
              lVar97 = (long)pvVar61 + (uVar50 >> 5) + uVar63 + lVar95 * 8;
              lVar93 = ((long)iVar69 * 0x18 * uVar52 >> 5) + uVar63;
              uVar77 = 0;
              lVar88 = (long)pvVar74 + lVar81 + lVar95 * 8;
              do {
                lVar51 = 0;
                do {
                  auVar184._0_4_ = (float)(*(byte *)(lVar88 + lVar51) & 0xf);
                  auVar184._4_12_ = auVar206;
                  auVar202 = ZEXT416(*(uint *)((long)pvVar74 + uVar77 * 4 + lVar81));
                  auVar161 = ZEXT416(*(uint *)((long)pvVar74 + uVar77 * 4 + lVar95 * 4 + lVar81));
                  auVar107 = vfmadd213ss_fma(auVar184,auVar161,auVar202);
                  auVar189._0_4_ = (float)(*(byte *)(lVar88 + lVar51) >> 4);
                  auVar189._4_12_ = auVar206;
                  auVar195._0_4_ = (float)(*(byte *)(lVar97 + lVar51) & 0xf);
                  auVar195._4_12_ = auVar206;
                  auVar198._0_4_ = (float)(*(byte *)(lVar97 + lVar51) >> 4);
                  auVar198._4_12_ = auVar206;
                  auVar202 = vfmadd213ss_fma(auVar189,auVar161,auVar202);
                  auVar162 = ZEXT416(*(uint *)((long)pvVar61 + uVar77 * 4 + lVar93));
                  auVar158 = ZEXT416(*(uint *)((long)pvVar61 + uVar77 * 4 + lVar95 * 4 + lVar93));
                  auVar161 = vfmadd213ss_fma(auVar195,auVar158,auVar162);
                  auVar162 = vfmadd213ss_fma(auVar198,auVar158,auVar162);
                  auVar107 = vfmadd231ss_fma(ZEXT416((uint)(auVar162._0_4_ * auVar202._0_4_)),
                                             auVar107,auVar161);
                  fVar101 = auVar152._0_4_ + auVar107._0_4_;
                  auVar152 = ZEXT464((uint)fVar101);
                  lVar51 = lVar51 + 1;
                } while (lVar51 != 0x10);
                uVar77 = uVar77 + 1;
                lVar97 = lVar97 + 0x10;
                lVar88 = lVar88 + 0x10;
              } while (uVar77 != (uint)(iVar65 >> 5));
            }
            *(float *)((long)pvVar73 +
                      uVar52 * (long)iVar39 * 4 +
                      (long)(iVar96 * iVar48 + iVar64 * 4 + iVar42 * iVar53)) = fVar101;
            uVar52 = uVar52 + 1;
            uVar50 = uVar50 + (long)iVar69 * 0x18;
          } while (uVar52 != uVar99);
        }
        iVar54 = iVar54 + 1;
      } while (iVar54 != iVar71);
      return;
    }
    if (iVar71 <= iVar41) {
      if ((int)uVar40 < 1) {
        return;
      }
      pvVar61 = params->wdata;
      local_3c8 = 0;
      local_3c0 = 0;
      do {
        if (0 < (int)uVar38) {
          pgVar47 = (ggml_compute_params *)0x0;
          lVar95 = local_3c8;
          do {
            lVar81 = lVar95;
            uVar63 = uVar99;
            if (0 < (int)uVar83) {
              do {
                quantize_row_q4_1((float *)((long)pgVar98->data + lVar81),pvVar61,iVar69);
                pvVar61 = (void *)((long)pvVar61 + ((ulong)((long)iVar69 * 0x18) >> 5));
                lVar81 = lVar81 + iVar65;
                uVar63 = uVar63 - 1;
              } while (uVar63 != 0);
            }
            pgVar47 = (ggml_compute_params *)((long)&pgVar47->type + 1);
            lVar95 = lVar95 + (int)local_308;
          } while (pgVar47 != (ggml_compute_params *)(ulong)uVar38);
        }
        local_3c0 = local_3c0 + 1;
        local_3c8 = local_3c8 + local_2b0;
      } while (local_3c0 != uVar40);
      return;
    }
    goto LAB_0012b283;
  }
LAB_0012f425:
  ggml_compute_forward_cold_104();
LAB_0012f42a:
  ggml_compute_forward_cold_124();
LAB_0012f42f:
  ggml_compute_forward_cold_121();
LAB_0012f434:
  ggml_compute_forward_cold_148();
LAB_0012f439:
  ggml_compute_forward_cold_149();
  gVar44 = pgVar66->type;
  if (0 < (int)gVar44) {
    lVar95 = 0;
    do {
      puVar89 = *(uint **)(pgVar66[0xcd].ne + lVar95 * 2 + -2);
      if (puVar89 != (uint *)0x0) {
        memset(*(void **)(puVar89 + 0x24),0,
               ((long)(int)puVar89[5] * (long)(int)puVar89[4] *
                (long)(int)puVar89[3] * (long)(int)puVar89[2] * GGML_TYPE_SIZE[*puVar89]) /
               (ulong)(long)GGML_BLCK_SIZE[*puVar89]);
        gVar44 = pgVar66->type;
      }
      lVar95 = lVar95 + 1;
    } while (lVar95 < (int)gVar44);
  }
  return;
}

Assistant:

static void ggml_compute_forward(struct ggml_compute_params * params, struct ggml_tensor * tensor) {
    GGML_ASSERT(params);

    switch (tensor->op) {
        case GGML_OP_DUP:
            {
                ggml_compute_forward_dup(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ADD:
            {
                ggml_compute_forward_add(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SUB:
            {
                ggml_compute_forward_sub(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_MUL:
            {
                ggml_compute_forward_mul(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_DIV:
            {
                ggml_compute_forward_div(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SQR:
            {
                ggml_compute_forward_sqr(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SQRT:
            {
                ggml_compute_forward_sqrt(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SUM:
            {
                ggml_compute_forward_sum(params, tensor->src0, tensor);
            } break;
        case GGML_OP_MEAN:
            {
                ggml_compute_forward_mean(params, tensor->src0, tensor);
            } break;
        case GGML_OP_REPEAT:
            {
                ggml_compute_forward_repeat(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ABS:
            {
                ggml_compute_forward_abs(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SGN:
            {
                ggml_compute_forward_sgn(params, tensor->src0, tensor);
            } break;
        case GGML_OP_NEG:
            {
                ggml_compute_forward_neg(params, tensor->src0, tensor);
            } break;
        case GGML_OP_STEP:
            {
                ggml_compute_forward_step(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RELU:
            {
                ggml_compute_forward_relu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_GELU:
            {
                ggml_compute_forward_gelu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_SILU:
            {
                ggml_compute_forward_silu(params, tensor->src0, tensor);
            } break;
        case GGML_OP_NORM:
            {
                ggml_compute_forward_norm(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RMS_NORM:
            {
                ggml_compute_forward_rms_norm(params, tensor->src0, tensor);
            } break;
        case GGML_OP_MUL_MAT:
            {
                ggml_compute_forward_mul_mat(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SCALE:
            {
                ggml_compute_forward_scale(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CPY:
            {
                ggml_compute_forward_cpy(params, tensor->src0, tensor);
            } break;
        case GGML_OP_RESHAPE:
            {
                ggml_compute_forward_reshape(params, tensor->src0, tensor);
            } break;
        case GGML_OP_VIEW:
            {
                ggml_compute_forward_view(params, tensor->src0);
            } break;
        case GGML_OP_PERMUTE:
            {
                ggml_compute_forward_permute(params, tensor->src0);
            } break;
        case GGML_OP_TRANSPOSE:
            {
                ggml_compute_forward_transpose(params, tensor->src0);
            } break;
        case GGML_OP_GET_ROWS:
            {
                ggml_compute_forward_get_rows(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_DIAG_MASK_INF:
            {
                ggml_compute_forward_diag_mask_inf(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_SOFT_MAX:
            {
                ggml_compute_forward_soft_max(params, tensor->src0, tensor);
            } break;
        case GGML_OP_ROPE:
            {
                ggml_compute_forward_rope(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CONV_1D_1S:
            {
                ggml_compute_forward_conv_1d_1s(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_CONV_1D_2S:
            {
                ggml_compute_forward_conv_1d_2s(params, tensor->src0, tensor->src1, tensor);
            } break;
        case GGML_OP_FLASH_ATTN:
            {
                int32_t t = ggml_get_i32_1d(tensor->opt[1], 0);
                GGML_ASSERT(t == 0 || t == 1);
                bool masked = t != 0;
                ggml_compute_forward_flash_attn(params, tensor->src0, tensor->src1, tensor->opt[0], masked, tensor);
            } break;
        case GGML_OP_FLASH_FF:
            {
                ggml_compute_forward_flash_ff(params, tensor->src0, tensor->src1, tensor->opt[0], tensor->opt[1], tensor->opt[2], tensor);
            } break;
        case GGML_OP_NONE:
            {
                // nop
            } break;
        case GGML_OP_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}